

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx512::CurveNiMBIntersectorK<4,16>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BezierCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  float *pfVar9;
  Primitive PVar10;
  uint uVar11;
  Geometry *pGVar12;
  __int_type_conflict _Var13;
  long lVar14;
  long lVar15;
  RTCRayQueryContext *pRVar16;
  RTCFilterFunctionN p_Var17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  float fVar32;
  undefined1 auVar33 [16];
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [60];
  undefined1 auVar65 [60];
  undefined1 auVar66 [12];
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  byte bVar78;
  byte bVar79;
  ulong uVar80;
  byte bVar81;
  uint uVar82;
  byte bVar83;
  uint uVar84;
  byte bVar85;
  byte bVar86;
  long lVar87;
  ulong uVar88;
  long lVar89;
  bool bVar90;
  ulong uVar91;
  uint uVar158;
  uint uVar159;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  uint uVar160;
  uint uVar161;
  uint uVar162;
  uint uVar163;
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  uint uVar164;
  undefined1 auVar151 [64];
  undefined1 auVar152 [64];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  undefined1 auVar157 [64];
  float fVar165;
  vint4 bi_2;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  float fVar192;
  float fVar193;
  vint4 bi_1;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  vint4 bi;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [64];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [32];
  undefined1 auVar241 [64];
  vint4 ai_2;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [64];
  vint4 ai_1;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [32];
  float fVar259;
  float fVar267;
  float fVar268;
  vint4 ai;
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  float fVar269;
  float fVar271;
  undefined1 auVar265 [16];
  float fVar270;
  float fVar272;
  float fVar273;
  float fVar274;
  undefined1 auVar266 [32];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  float fVar282;
  undefined1 auVar281 [64];
  undefined4 uVar283;
  undefined1 auVar284 [16];
  undefined1 auVar285 [32];
  undefined1 auVar286 [16];
  undefined1 auVar287 [64];
  undefined1 in_ZMM31 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vint<16> mask;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  undefined1 local_be0 [16];
  RTCFilterFunctionNArguments local_b20;
  undefined1 local_af0 [16];
  undefined1 (*local_ad8) [32];
  Primitive *local_ad0;
  ulong local_ac8;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [16];
  undefined1 local_a50 [16];
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float fStack_a28;
  float fStack_a24;
  undefined1 local_a10 [16];
  undefined1 local_a00 [16];
  float local_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [16];
  ulong local_9a8;
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [64];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  float local_860;
  float fStack_85c;
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_7f0 [16];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined4 local_620;
  undefined4 uStack_61c;
  undefined4 uStack_618;
  undefined4 uStack_614;
  undefined4 uStack_610;
  undefined4 uStack_60c;
  undefined4 uStack_608;
  undefined4 uStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined4 local_520;
  undefined4 uStack_51c;
  undefined4 uStack_518;
  undefined4 uStack_514;
  undefined4 uStack_510;
  undefined4 uStack_50c;
  undefined4 uStack_508;
  undefined4 uStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  undefined1 auStack_180 [32];
  float afStack_160 [2];
  uint auStack_158 [74];
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined1 auVar153 [64];
  undefined1 auVar156 [64];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  
  PVar10 = prim[1];
  uVar91 = (ulong)(byte)PVar10;
  lVar89 = uVar91 * 0x25;
  fVar165 = *(float *)(prim + lVar89 + 0x12);
  auVar96 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar96 = vinsertps_avx(auVar96,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar95 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar95 = vinsertps_avx(auVar95,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar96 = vsubps_avx(auVar96,*(undefined1 (*) [16])(prim + lVar89 + 6));
  auVar235._0_4_ = fVar165 * auVar96._0_4_;
  auVar235._4_4_ = fVar165 * auVar96._4_4_;
  auVar235._8_4_ = fVar165 * auVar96._8_4_;
  auVar235._12_4_ = fVar165 * auVar96._12_4_;
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 4 + 6)));
  auVar166._0_4_ = fVar165 * auVar95._0_4_;
  auVar166._4_4_ = fVar165 * auVar95._4_4_;
  auVar166._8_4_ = fVar165 * auVar95._8_4_;
  auVar166._12_4_ = fVar165 * auVar95._12_4_;
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar95 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 5 + 6)));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar99 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 6 + 6)));
  auVar100 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0xf + 6)));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar10 * 0x10 + 6)));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar102 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar10 * 0x10 + uVar91 + 6)));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0x1a + 6)));
  auVar33 = vcvtdq2ps_avx(auVar33);
  auVar97 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0x1b + 6)));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar103 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0x1c + 6)));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar252._4_4_ = auVar166._0_4_;
  auVar252._0_4_ = auVar166._0_4_;
  auVar252._8_4_ = auVar166._0_4_;
  auVar252._12_4_ = auVar166._0_4_;
  auVar104 = vshufps_avx(auVar166,auVar166,0x55);
  auVar105 = vshufps_avx(auVar166,auVar166,0xaa);
  fVar165 = auVar105._0_4_;
  auVar215._0_4_ = fVar165 * auVar99._0_4_;
  fVar259 = auVar105._4_4_;
  auVar215._4_4_ = fVar259 * auVar99._4_4_;
  fVar267 = auVar105._8_4_;
  auVar215._8_4_ = fVar267 * auVar99._8_4_;
  fVar268 = auVar105._12_4_;
  auVar215._12_4_ = fVar268 * auVar99._12_4_;
  auVar194._0_4_ = auVar102._0_4_ * fVar165;
  auVar194._4_4_ = auVar102._4_4_ * fVar259;
  auVar194._8_4_ = auVar102._8_4_ * fVar267;
  auVar194._12_4_ = auVar102._12_4_ * fVar268;
  auVar167._0_4_ = auVar103._0_4_ * fVar165;
  auVar167._4_4_ = auVar103._4_4_ * fVar259;
  auVar167._8_4_ = auVar103._8_4_ * fVar267;
  auVar167._12_4_ = auVar103._12_4_ * fVar268;
  auVar105 = vfmadd231ps_fma(auVar215,auVar104,auVar95);
  auVar98 = vfmadd231ps_fma(auVar194,auVar104,auVar101);
  auVar104 = vfmadd231ps_fma(auVar167,auVar97,auVar104);
  auVar106 = vfmadd231ps_fma(auVar105,auVar252,auVar96);
  auVar98 = vfmadd231ps_fma(auVar98,auVar252,auVar100);
  auVar38 = vfmadd231ps_fma(auVar104,auVar33,auVar252);
  auVar286._4_4_ = auVar235._0_4_;
  auVar286._0_4_ = auVar235._0_4_;
  auVar286._8_4_ = auVar235._0_4_;
  auVar286._12_4_ = auVar235._0_4_;
  auVar104 = vshufps_avx(auVar235,auVar235,0x55);
  auVar105 = vshufps_avx(auVar235,auVar235,0xaa);
  fVar165 = auVar105._0_4_;
  auVar253._0_4_ = fVar165 * auVar99._0_4_;
  fVar259 = auVar105._4_4_;
  auVar253._4_4_ = fVar259 * auVar99._4_4_;
  fVar267 = auVar105._8_4_;
  auVar253._8_4_ = fVar267 * auVar99._8_4_;
  fVar268 = auVar105._12_4_;
  auVar253._12_4_ = fVar268 * auVar99._12_4_;
  auVar242._0_4_ = auVar102._0_4_ * fVar165;
  auVar242._4_4_ = auVar102._4_4_ * fVar259;
  auVar242._8_4_ = auVar102._8_4_ * fVar267;
  auVar242._12_4_ = auVar102._12_4_ * fVar268;
  auVar236._0_4_ = auVar103._0_4_ * fVar165;
  auVar236._4_4_ = auVar103._4_4_ * fVar259;
  auVar236._8_4_ = auVar103._8_4_ * fVar267;
  auVar236._12_4_ = auVar103._12_4_ * fVar268;
  auVar95 = vfmadd231ps_fma(auVar253,auVar104,auVar95);
  auVar99 = vfmadd231ps_fma(auVar242,auVar104,auVar101);
  auVar101 = vfmadd231ps_fma(auVar236,auVar104,auVar97);
  auVar39 = vfmadd231ps_fma(auVar95,auVar286,auVar96);
  auVar166 = vfmadd231ps_fma(auVar99,auVar286,auVar100);
  auVar279._8_4_ = 0x7fffffff;
  auVar279._0_8_ = 0x7fffffff7fffffff;
  auVar279._12_4_ = 0x7fffffff;
  auVar167 = vfmadd231ps_fma(auVar101,auVar286,auVar33);
  auVar96 = vandps_avx(auVar279,auVar106);
  auVar275._8_4_ = 0x219392ef;
  auVar275._0_8_ = 0x219392ef219392ef;
  auVar275._12_4_ = 0x219392ef;
  uVar80 = vcmpps_avx512vl(auVar96,auVar275,1);
  bVar18 = (bool)((byte)uVar80 & 1);
  auVar92._0_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar106._0_4_;
  bVar18 = (bool)((byte)(uVar80 >> 1) & 1);
  auVar92._4_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar106._4_4_;
  bVar18 = (bool)((byte)(uVar80 >> 2) & 1);
  auVar92._8_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar106._8_4_;
  bVar18 = (bool)((byte)(uVar80 >> 3) & 1);
  auVar92._12_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar106._12_4_;
  auVar96 = vandps_avx(auVar279,auVar98);
  uVar80 = vcmpps_avx512vl(auVar96,auVar275,1);
  bVar18 = (bool)((byte)uVar80 & 1);
  auVar93._0_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar98._0_4_;
  bVar18 = (bool)((byte)(uVar80 >> 1) & 1);
  auVar93._4_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar98._4_4_;
  bVar18 = (bool)((byte)(uVar80 >> 2) & 1);
  auVar93._8_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar98._8_4_;
  bVar18 = (bool)((byte)(uVar80 >> 3) & 1);
  auVar93._12_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar98._12_4_;
  auVar96 = vandps_avx(auVar279,auVar38);
  uVar80 = vcmpps_avx512vl(auVar96,auVar275,1);
  bVar18 = (bool)((byte)uVar80 & 1);
  auVar94._0_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar38._0_4_;
  bVar18 = (bool)((byte)(uVar80 >> 1) & 1);
  auVar94._4_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar38._4_4_;
  bVar18 = (bool)((byte)(uVar80 >> 2) & 1);
  auVar94._8_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar38._8_4_;
  bVar18 = (bool)((byte)(uVar80 >> 3) & 1);
  auVar94._12_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar38._12_4_;
  auVar95 = vrcp14ps_avx512vl(auVar92);
  auVar276._8_4_ = 0x3f800000;
  auVar276._0_8_ = &DAT_3f8000003f800000;
  auVar276._12_4_ = 0x3f800000;
  auVar96 = vfnmadd213ps_fma(auVar92,auVar95,auVar276);
  auVar106 = vfmadd132ps_fma(auVar96,auVar95,auVar95);
  auVar95 = vrcp14ps_avx512vl(auVar93);
  auVar96 = vfnmadd213ps_fma(auVar93,auVar95,auVar276);
  auVar38 = vfmadd132ps_fma(auVar96,auVar95,auVar95);
  auVar95 = vrcp14ps_avx512vl(auVar94);
  auVar96 = vfnmadd213ps_fma(auVar94,auVar95,auVar276);
  auVar37 = vfmadd132ps_fma(auVar96,auVar95,auVar95);
  fVar165 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar89 + 0x16)) *
            *(float *)(prim + lVar89 + 0x1a);
  auVar260._4_4_ = fVar165;
  auVar260._0_4_ = fVar165;
  auVar260._8_4_ = fVar165;
  auVar260._12_4_ = fVar165;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar91 * 7 + 6);
  auVar96 = vpmovsxwd_avx(auVar96);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + uVar91 * 0xb + 6);
  auVar95 = vpmovsxwd_avx(auVar95);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar100 = vsubps_avx(auVar95,auVar96);
  auVar99._8_8_ = 0;
  auVar99._0_8_ = *(ulong *)(prim + uVar91 * 9 + 6);
  auVar95 = vpmovsxwd_avx(auVar99);
  auVar99 = vfmadd213ps_fma(auVar100,auVar260,auVar96);
  auVar96 = vcvtdq2ps_avx(auVar95);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = *(ulong *)(prim + uVar91 * 0xd + 6);
  auVar95 = vpmovsxwd_avx(auVar100);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,auVar96);
  auVar100 = vfmadd213ps_fma(auVar95,auVar260,auVar96);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + uVar91 * 0x12 + 6);
  auVar96 = vpmovsxwd_avx(auVar101);
  auVar96 = vcvtdq2ps_avx(auVar96);
  uVar80 = (ulong)(uint)((int)(uVar91 * 5) << 2);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *(ulong *)(prim + uVar91 * 2 + uVar80 + 6);
  auVar95 = vpmovsxwd_avx(auVar102);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,auVar96);
  auVar101 = vfmadd213ps_fma(auVar95,auVar260,auVar96);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + uVar80 + 6);
  auVar96 = vpmovsxwd_avx(auVar33);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *(ulong *)(prim + uVar91 * 0x18 + 6);
  auVar95 = vpmovsxwd_avx(auVar97);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,auVar96);
  auVar102 = vfmadd213ps_fma(auVar95,auVar260,auVar96);
  auVar103._8_8_ = 0;
  auVar103._0_8_ = *(ulong *)(prim + uVar91 * 0x1d + 6);
  auVar96 = vpmovsxwd_avx(auVar103);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = *(ulong *)(prim + uVar91 + (ulong)(byte)PVar10 * 0x20 + 6);
  auVar95 = vpmovsxwd_avx(auVar104);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,auVar96);
  auVar33 = vfmadd213ps_fma(auVar95,auVar260,auVar96);
  auVar105._8_8_ = 0;
  auVar105._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar10 * 0x20 - uVar91) + 6);
  auVar96 = vpmovsxwd_avx(auVar105);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar98._8_8_ = 0;
  auVar98._0_8_ = *(ulong *)(prim + uVar91 * 0x23 + 6);
  auVar95 = vpmovsxwd_avx(auVar98);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar95 = vsubps_avx(auVar95,auVar96);
  auVar95 = vfmadd213ps_fma(auVar95,auVar260,auVar96);
  auVar96 = vsubps_avx(auVar99,auVar39);
  auVar261._0_4_ = auVar106._0_4_ * auVar96._0_4_;
  auVar261._4_4_ = auVar106._4_4_ * auVar96._4_4_;
  auVar261._8_4_ = auVar106._8_4_ * auVar96._8_4_;
  auVar261._12_4_ = auVar106._12_4_ * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar100,auVar39);
  auVar216._0_4_ = auVar106._0_4_ * auVar96._0_4_;
  auVar216._4_4_ = auVar106._4_4_ * auVar96._4_4_;
  auVar216._8_4_ = auVar106._8_4_ * auVar96._8_4_;
  auVar216._12_4_ = auVar106._12_4_ * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar101,auVar166);
  auVar254._0_4_ = auVar38._0_4_ * auVar96._0_4_;
  auVar254._4_4_ = auVar38._4_4_ * auVar96._4_4_;
  auVar254._8_4_ = auVar38._8_4_ * auVar96._8_4_;
  auVar254._12_4_ = auVar38._12_4_ * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar102,auVar166);
  auVar195._0_4_ = auVar38._0_4_ * auVar96._0_4_;
  auVar195._4_4_ = auVar38._4_4_ * auVar96._4_4_;
  auVar195._8_4_ = auVar38._8_4_ * auVar96._8_4_;
  auVar195._12_4_ = auVar38._12_4_ * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar33,auVar167);
  auVar243._0_4_ = auVar37._0_4_ * auVar96._0_4_;
  auVar243._4_4_ = auVar37._4_4_ * auVar96._4_4_;
  auVar243._8_4_ = auVar37._8_4_ * auVar96._8_4_;
  auVar243._12_4_ = auVar37._12_4_ * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar95,auVar167);
  auVar168._0_4_ = auVar37._0_4_ * auVar96._0_4_;
  auVar168._4_4_ = auVar37._4_4_ * auVar96._4_4_;
  auVar168._8_4_ = auVar37._8_4_ * auVar96._8_4_;
  auVar168._12_4_ = auVar37._12_4_ * auVar96._12_4_;
  auVar96 = vpminsd_avx(auVar261,auVar216);
  auVar95 = vpminsd_avx(auVar254,auVar195);
  auVar96 = vmaxps_avx(auVar96,auVar95);
  auVar95 = vpminsd_avx(auVar243,auVar168);
  uVar283 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar106._4_4_ = uVar283;
  auVar106._0_4_ = uVar283;
  auVar106._8_4_ = uVar283;
  auVar106._12_4_ = uVar283;
  auVar95 = vmaxps_avx512vl(auVar95,auVar106);
  auVar96 = vmaxps_avx(auVar96,auVar95);
  auVar38._8_4_ = 0x3f7ffffa;
  auVar38._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar38._12_4_ = 0x3f7ffffa;
  local_7f0 = vmulps_avx512vl(auVar96,auVar38);
  auVar96 = vpmaxsd_avx(auVar261,auVar216);
  auVar95 = vpmaxsd_avx(auVar254,auVar195);
  auVar96 = vminps_avx(auVar96,auVar95);
  auVar95 = vpmaxsd_avx(auVar243,auVar168);
  uVar283 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar37._4_4_ = uVar283;
  auVar37._0_4_ = uVar283;
  auVar37._8_4_ = uVar283;
  auVar37._12_4_ = uVar283;
  auVar95 = vminps_avx512vl(auVar95,auVar37);
  auVar96 = vminps_avx(auVar96,auVar95);
  auVar39._8_4_ = 0x3f800003;
  auVar39._0_8_ = 0x3f8000033f800003;
  auVar39._12_4_ = 0x3f800003;
  auVar96 = vmulps_avx512vl(auVar96,auVar39);
  auVar95 = vpbroadcastd_avx512vl();
  uVar34 = vcmpps_avx512vl(local_7f0,auVar96,2);
  local_9a8 = vpcmpgtd_avx512vl(auVar95,_DAT_01ff0cf0);
  local_9a8 = ((byte)uVar34 & 0xf) & local_9a8;
  if ((char)local_9a8 == '\0') {
    return;
  }
  local_ad8 = (undefined1 (*) [32])local_240;
  auVar189 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_4c0 = vmovdqa64_avx512f(auVar189);
  auVar189 = ZEXT3264(CONCAT428(0x7fffffff,
                                CONCAT424(0x7fffffff,
                                          CONCAT420(0x7fffffff,
                                                    CONCAT416(0x7fffffff,
                                                              CONCAT412(0x7fffffff,
                                                                        CONCAT48(0x7fffffff,
                                                                                 0x7fffffff7fffffff)
                                                                       ))))));
  auVar281 = ZEXT3264(_DAT_02020f20);
  local_ad0 = prim;
LAB_01c05058:
  lVar89 = 0;
  for (uVar80 = local_9a8; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000) {
    lVar89 = lVar89 + 1;
  }
  uVar82 = *(uint *)(prim + 2);
  uVar11 = *(uint *)(prim + lVar89 * 4 + 6);
  pGVar12 = (context->scene->geometries).items[uVar82].ptr;
  uVar80 = (ulong)*(uint *)(*(long *)&pGVar12->field_0x58 +
                           (ulong)uVar11 *
                           pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar165 = (pGVar12->time_range).lower;
  fVar165 = pGVar12->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x1c0) - fVar165) / ((pGVar12->time_range).upper - fVar165));
  auVar96 = vroundss_avx(ZEXT416((uint)fVar165),ZEXT416((uint)fVar165),9);
  auVar96 = vminss_avx(auVar96,ZEXT416((uint)(pGVar12->fnumTimeSegments + -1.0)));
  auVar96 = vmaxss_avx(ZEXT816(0) << 0x20,auVar96);
  fVar165 = fVar165 - auVar96._0_4_;
  _Var13 = pGVar12[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar87 = (long)(int)auVar96._0_4_ * 0x38;
  lVar89 = *(long *)(_Var13 + 0x10 + lVar87);
  lVar14 = *(long *)(_Var13 + 0x38 + lVar87);
  lVar15 = *(long *)(_Var13 + 0x48 + lVar87);
  pfVar9 = (float *)(lVar14 + uVar80 * lVar15);
  auVar217._0_4_ = fVar165 * *pfVar9;
  auVar217._4_4_ = fVar165 * pfVar9[1];
  auVar217._8_4_ = fVar165 * pfVar9[2];
  auVar217._12_4_ = fVar165 * pfVar9[3];
  pfVar9 = (float *)(lVar14 + (uVar80 + 1) * lVar15);
  auVar237._0_4_ = fVar165 * *pfVar9;
  auVar237._4_4_ = fVar165 * pfVar9[1];
  auVar237._8_4_ = fVar165 * pfVar9[2];
  auVar237._12_4_ = fVar165 * pfVar9[3];
  pfVar9 = (float *)(lVar14 + (uVar80 + 2) * lVar15);
  auVar244._0_4_ = fVar165 * *pfVar9;
  auVar244._4_4_ = fVar165 * pfVar9[1];
  auVar244._8_4_ = fVar165 * pfVar9[2];
  auVar244._12_4_ = fVar165 * pfVar9[3];
  pfVar9 = (float *)(lVar14 + lVar15 * (uVar80 + 3));
  auVar196._0_4_ = fVar165 * *pfVar9;
  auVar196._4_4_ = fVar165 * pfVar9[1];
  auVar196._8_4_ = fVar165 * pfVar9[2];
  auVar196._12_4_ = fVar165 * pfVar9[3];
  lVar14 = *(long *)(_Var13 + lVar87);
  fVar165 = 1.0 - fVar165;
  auVar169._4_4_ = fVar165;
  auVar169._0_4_ = fVar165;
  auVar169._8_4_ = fVar165;
  auVar169._12_4_ = fVar165;
  auVar99 = vfmadd231ps_fma(auVar217,auVar169,*(undefined1 (*) [16])(lVar14 + lVar89 * uVar80));
  auVar100 = vfmadd231ps_fma(auVar237,auVar169,
                             *(undefined1 (*) [16])(lVar14 + lVar89 * (uVar80 + 1)));
  auVar101 = vfmadd231ps_fma(auVar244,auVar169,
                             *(undefined1 (*) [16])(lVar14 + lVar89 * (uVar80 + 2)));
  auVar102 = vfmadd231ps_fma(auVar196,auVar169,
                             *(undefined1 (*) [16])(lVar14 + lVar89 * (uVar80 + 3)));
  auVar96 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar95 = vinsertps_avx(auVar96,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  auVar107 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x100)));
  auVar108 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x140)));
  auVar96 = vunpcklps_avx512vl(auVar107._0_16_,auVar108._0_16_);
  auVar157._0_32_ = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x180)));
  auVar287 = ZEXT3264(auVar157._0_32_);
  auVar103 = auVar157._0_16_;
  local_a50 = vinsertps_avx512f(auVar96,auVar103,0x28);
  auVar255._0_4_ = auVar99._0_4_ + auVar100._0_4_ + auVar101._0_4_ + auVar102._0_4_;
  auVar255._4_4_ = auVar99._4_4_ + auVar100._4_4_ + auVar101._4_4_ + auVar102._4_4_;
  auVar255._8_4_ = auVar99._8_4_ + auVar100._8_4_ + auVar101._8_4_ + auVar102._8_4_;
  auVar255._12_4_ = auVar99._12_4_ + auVar100._12_4_ + auVar101._12_4_ + auVar102._12_4_;
  auVar40._8_4_ = 0x3e800000;
  auVar40._0_8_ = 0x3e8000003e800000;
  auVar40._12_4_ = 0x3e800000;
  auVar96 = vmulps_avx512vl(auVar255,auVar40);
  auVar96 = vsubps_avx(auVar96,auVar95);
  auVar96 = vdpps_avx(auVar96,local_a50,0x7f);
  fVar165 = *(float *)(ray + k * 4 + 0xc0);
  local_a60 = vdpps_avx(local_a50,local_a50,0x7f);
  auVar262._4_12_ = ZEXT812(0) << 0x20;
  auVar262._0_4_ = local_a60._0_4_;
  auVar97 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar262);
  auVar33 = vfnmadd213ss_fma(auVar97,local_a60,ZEXT416(0x40000000));
  local_740 = auVar96._0_4_ * auVar97._0_4_ * auVar33._0_4_;
  auVar263._4_4_ = local_740;
  auVar263._0_4_ = local_740;
  auVar263._8_4_ = local_740;
  auVar263._12_4_ = local_740;
  fStack_a30 = local_740;
  _local_a40 = auVar263;
  fStack_a2c = local_740;
  fStack_a28 = local_740;
  fStack_a24 = local_740;
  auVar96 = vfmadd231ps_fma(auVar95,local_a50,auVar263);
  auVar96 = vblendps_avx(auVar96,ZEXT816(0) << 0x40,8);
  auVar95 = vsubps_avx(auVar99,auVar96);
  auVar99 = vsubps_avx(auVar101,auVar96);
  auVar251 = ZEXT1664(auVar99);
  auVar100 = vsubps_avx(auVar100,auVar96);
  auVar96 = vsubps_avx(auVar102,auVar96);
  local_520 = auVar95._0_4_;
  uStack_51c = local_520;
  uStack_518 = local_520;
  uStack_514 = local_520;
  uStack_510 = local_520;
  uStack_50c = local_520;
  uStack_508 = local_520;
  uStack_504 = local_520;
  auVar120._8_4_ = 1;
  auVar120._0_8_ = 0x100000001;
  auVar120._12_4_ = 1;
  auVar120._16_4_ = 1;
  auVar120._20_4_ = 1;
  auVar120._24_4_ = 1;
  auVar120._28_4_ = 1;
  local_940 = ZEXT1632(auVar95);
  local_540 = vpermps_avx2(auVar120,local_940);
  auVar109._8_4_ = 2;
  auVar109._0_8_ = 0x200000002;
  auVar109._12_4_ = 2;
  auVar109._16_4_ = 2;
  auVar109._20_4_ = 2;
  auVar109._24_4_ = 2;
  auVar109._28_4_ = 2;
  local_560 = vpermps_avx2(auVar109,local_940);
  auVar110._8_4_ = 3;
  auVar110._0_8_ = 0x300000003;
  auVar110._12_4_ = 3;
  auVar110._16_4_ = 3;
  auVar110._20_4_ = 3;
  auVar110._24_4_ = 3;
  auVar110._28_4_ = 3;
  local_580 = vpermps_avx2(auVar110,local_940);
  local_5a0 = auVar100._0_4_;
  fStack_59c = local_5a0;
  fStack_598 = local_5a0;
  fStack_594 = local_5a0;
  fStack_590 = local_5a0;
  fStack_58c = local_5a0;
  fStack_588 = local_5a0;
  fStack_584 = local_5a0;
  local_980 = ZEXT1632(auVar100);
  local_5c0 = vpermps_avx2(auVar120,local_980);
  local_5e0 = vpermps_avx2(auVar109,local_980);
  local_600 = vpermps_avx2(auVar110,local_980);
  local_620 = auVar99._0_4_;
  uStack_61c = local_620;
  uStack_618 = local_620;
  uStack_614 = local_620;
  uStack_610 = local_620;
  uStack_60c = local_620;
  uStack_608 = local_620;
  uStack_604 = local_620;
  local_960 = ZEXT1632(auVar99);
  local_640 = vpermps_avx2(auVar120,local_960);
  local_660 = vpermps_avx2(auVar109,local_960);
  local_680 = vpermps_avx2(auVar110,local_960);
  uVar283 = auVar96._0_4_;
  local_6a0._4_4_ = uVar283;
  local_6a0._0_4_ = uVar283;
  fStack_698 = (float)uVar283;
  fStack_694 = (float)uVar283;
  fStack_690 = (float)uVar283;
  fStack_68c = (float)uVar283;
  fStack_688 = (float)uVar283;
  register0x000012dc = uVar283;
  auVar241 = ZEXT3264(_local_6a0);
  _local_9a0 = ZEXT1632(auVar96);
  _local_6c0 = vpermps_avx2(auVar120,_local_9a0);
  _local_6e0 = vpermps_avx2(auVar109,_local_9a0);
  _local_700 = vpermps_avx2(auVar110,_local_9a0);
  auVar96 = vmulss_avx512f(auVar103,auVar103);
  auVar157._32_32_ = vfmadd231ps_avx512vl(ZEXT1632(auVar96),auVar108,auVar108);
  auVar157._32_32_ = vfmadd231ps_avx512vl(auVar157._32_32_,auVar107,auVar107);
  local_720._0_4_ = auVar157._32_4_;
  local_720._4_4_ = local_720._0_4_;
  local_720._8_4_ = local_720._0_4_;
  local_720._12_4_ = local_720._0_4_;
  local_720._16_4_ = local_720._0_4_;
  local_720._20_4_ = local_720._0_4_;
  local_720._24_4_ = local_720._0_4_;
  local_720._28_4_ = local_720._0_4_;
  local_7c0 = vandps_avx(auVar189._0_32_,local_720);
  local_a00 = ZEXT416((uint)local_740);
  local_740 = fVar165 - local_740;
  fStack_73c = local_740;
  fStack_738 = local_740;
  fStack_734 = local_740;
  fStack_730 = local_740;
  fStack_72c = local_740;
  fStack_728 = local_740;
  fStack_724 = local_740;
  auVar189 = vpbroadcastd_avx512f();
  local_440 = vmovdqa64_avx512f(auVar189);
  uVar80 = 0;
  local_ac8 = 1;
  auVar189 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar189);
  auVar96 = vsqrtss_avx(local_a60,local_a60);
  auVar95 = vsqrtss_avx(local_a60,local_a60);
  auVar234 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar157._32_32_ = auVar189._32_32_;
  local_ac0 = auVar157._0_32_;
  do {
    local_af0 = auVar234._0_16_;
    auVar99 = vmovshdup_avx(local_af0);
    auVar98 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    fVar259 = auVar234._0_4_;
    fVar193 = auVar99._0_4_ - fVar259;
    fVar282 = fVar193 * 0.04761905;
    auVar258._4_4_ = fVar259;
    auVar258._0_4_ = fVar259;
    auVar258._8_4_ = fVar259;
    auVar258._12_4_ = fVar259;
    auVar258._16_4_ = fVar259;
    auVar258._20_4_ = fVar259;
    auVar258._24_4_ = fVar259;
    auVar258._28_4_ = fVar259;
    local_a80._4_4_ = fVar193;
    local_a80._0_4_ = fVar193;
    local_a80._8_4_ = fVar193;
    local_a80._12_4_ = fVar193;
    local_a80._16_4_ = fVar193;
    local_a80._20_4_ = fVar193;
    local_a80._24_4_ = fVar193;
    local_a80._28_4_ = fVar193;
    auVar99 = vfmadd231ps_fma(auVar258,local_a80,auVar281._0_32_);
    auVar135._8_4_ = 0x3f800000;
    auVar135._0_8_ = &DAT_3f8000003f800000;
    auVar135._12_4_ = 0x3f800000;
    auVar135._16_4_ = 0x3f800000;
    auVar135._20_4_ = 0x3f800000;
    auVar135._24_4_ = 0x3f800000;
    auVar135._28_4_ = 0x3f800000;
    auVar120 = vsubps_avx(auVar135,ZEXT1632(auVar99));
    auVar125._4_4_ = fStack_59c;
    auVar125._0_4_ = local_5a0;
    auVar125._8_4_ = fStack_598;
    auVar125._12_4_ = fStack_594;
    auVar125._16_4_ = fStack_590;
    auVar125._20_4_ = fStack_58c;
    auVar125._24_4_ = fStack_588;
    auVar125._28_4_ = fStack_584;
    fVar259 = auVar99._0_4_;
    auVar131._0_4_ = local_5a0 * fVar259;
    fVar267 = auVar99._4_4_;
    auVar131._4_4_ = fStack_59c * fVar267;
    fVar268 = auVar99._8_4_;
    auVar131._8_4_ = fStack_598 * fVar268;
    fVar270 = auVar99._12_4_;
    auVar131._12_4_ = fStack_594 * fVar270;
    auVar131._16_4_ = fStack_590 * 0.0;
    auVar131._20_4_ = fStack_58c * 0.0;
    auVar131._24_4_ = fStack_588 * 0.0;
    auVar131._28_4_ = 0;
    auVar189._0_4_ = local_5c0._0_4_ * fVar259;
    auVar189._4_4_ = local_5c0._4_4_ * fVar267;
    auVar189._8_4_ = local_5c0._8_4_ * fVar268;
    auVar189._12_4_ = local_5c0._12_4_ * fVar270;
    auVar189._16_4_ = local_5c0._16_4_ * 0.0;
    auVar189._20_4_ = local_5c0._20_4_ * 0.0;
    auVar189._28_36_ = auVar234._28_36_;
    auVar189._24_4_ = local_5c0._24_4_ * 0.0;
    auVar281._0_4_ = local_5e0._0_4_ * fVar259;
    auVar281._4_4_ = local_5e0._4_4_ * fVar267;
    auVar281._8_4_ = local_5e0._8_4_ * fVar268;
    auVar281._12_4_ = local_5e0._12_4_ * fVar270;
    auVar281._16_4_ = local_5e0._16_4_ * 0.0;
    auVar281._20_4_ = local_5e0._20_4_ * 0.0;
    auVar281._28_36_ = auVar241._28_36_;
    auVar281._24_4_ = local_5e0._24_4_ * 0.0;
    auVar234._0_4_ = local_600._0_4_ * fVar259;
    auVar234._4_4_ = local_600._4_4_ * fVar267;
    auVar234._8_4_ = local_600._8_4_ * fVar268;
    auVar234._12_4_ = local_600._12_4_ * fVar270;
    auVar234._16_4_ = local_600._16_4_ * 0.0;
    auVar234._20_4_ = local_600._20_4_ * 0.0;
    auVar234._28_36_ = auVar251._28_36_;
    auVar234._24_4_ = local_600._24_4_ * 0.0;
    auVar126._4_4_ = uStack_51c;
    auVar126._0_4_ = local_520;
    auVar126._8_4_ = uStack_518;
    auVar126._12_4_ = uStack_514;
    auVar126._16_4_ = uStack_510;
    auVar126._20_4_ = uStack_50c;
    auVar126._24_4_ = uStack_508;
    auVar126._28_4_ = uStack_504;
    auVar100 = vfmadd231ps_fma(auVar131,auVar120,auVar126);
    auVar101 = vfmadd231ps_fma(auVar189._0_32_,auVar120,local_540);
    auVar102 = vfmadd231ps_fma(auVar281._0_32_,auVar120,local_560);
    auVar33 = vfmadd231ps_fma(auVar234._0_32_,auVar120,local_580);
    auVar124._4_4_ = uStack_61c;
    auVar124._0_4_ = local_620;
    auVar124._8_4_ = uStack_618;
    auVar124._12_4_ = uStack_614;
    auVar124._16_4_ = uStack_610;
    auVar124._20_4_ = uStack_60c;
    auVar124._24_4_ = uStack_608;
    auVar124._28_4_ = uStack_604;
    auVar109 = vmulps_avx512vl(auVar124,ZEXT1632(auVar99));
    auVar116 = ZEXT1632(auVar99);
    auVar110 = vmulps_avx512vl(local_640,auVar116);
    auVar111 = vmulps_avx512vl(local_660,auVar116);
    auVar112 = vmulps_avx512vl(local_680,auVar116);
    auVar97 = vfmadd231ps_fma(auVar109,auVar120,auVar125);
    auVar103 = vfmadd231ps_fma(auVar110,auVar120,local_5c0);
    auVar104 = vfmadd231ps_fma(auVar111,auVar120,local_5e0);
    auVar105 = vfmadd231ps_fma(auVar112,auVar120,local_600);
    auVar111._4_4_ = fVar267 * (float)local_6a0._4_4_;
    auVar111._0_4_ = fVar259 * (float)local_6a0._0_4_;
    auVar111._8_4_ = fVar268 * fStack_698;
    auVar111._12_4_ = fVar270 * fStack_694;
    auVar111._16_4_ = fStack_690 * 0.0;
    auVar111._20_4_ = fStack_68c * 0.0;
    auVar111._24_4_ = fStack_688 * 0.0;
    auVar111._28_4_ = fStack_584;
    auVar117._4_4_ = fVar267 * (float)local_6c0._4_4_;
    auVar117._0_4_ = fVar259 * (float)local_6c0._0_4_;
    auVar117._8_4_ = fVar268 * fStack_6b8;
    auVar117._12_4_ = fVar270 * fStack_6b4;
    auVar117._16_4_ = fStack_6b0 * 0.0;
    auVar117._20_4_ = fStack_6ac * 0.0;
    auVar117._24_4_ = fStack_6a8 * 0.0;
    auVar117._28_4_ = local_5c0._28_4_;
    auVar118._4_4_ = fVar267 * (float)local_6e0._4_4_;
    auVar118._0_4_ = fVar259 * (float)local_6e0._0_4_;
    auVar118._8_4_ = fVar268 * fStack_6d8;
    auVar118._12_4_ = fVar270 * fStack_6d4;
    auVar118._16_4_ = fStack_6d0 * 0.0;
    auVar118._20_4_ = fStack_6cc * 0.0;
    auVar118._24_4_ = fStack_6c8 * 0.0;
    auVar118._28_4_ = local_5e0._28_4_;
    auVar119._4_4_ = fVar267 * (float)local_700._4_4_;
    auVar119._0_4_ = fVar259 * (float)local_700._0_4_;
    auVar119._8_4_ = fVar268 * fStack_6f8;
    auVar119._12_4_ = fVar270 * fStack_6f4;
    auVar119._16_4_ = fStack_6f0 * 0.0;
    auVar119._20_4_ = fStack_6ec * 0.0;
    auVar119._24_4_ = fStack_6e8 * 0.0;
    auVar119._28_4_ = local_600._28_4_;
    auVar109 = vfmadd231ps_avx512vl(auVar111,auVar120,auVar124);
    auVar110 = vfmadd231ps_avx512vl(auVar117,auVar120,local_640);
    auVar111 = vfmadd231ps_avx512vl(auVar118,auVar120,local_660);
    auVar112 = vfmadd231ps_avx512vl(auVar119,auVar120,local_680);
    auVar113 = vmulps_avx512vl(auVar116,ZEXT1632(auVar97));
    auVar114 = vmulps_avx512vl(auVar116,ZEXT1632(auVar103));
    auVar115 = vmulps_avx512vl(auVar116,ZEXT1632(auVar104));
    auVar116 = vmulps_avx512vl(auVar116,ZEXT1632(auVar105));
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar120,ZEXT1632(auVar100));
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar120,ZEXT1632(auVar101));
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar120,ZEXT1632(auVar102));
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar120,ZEXT1632(auVar33));
    auVar132._0_4_ = auVar109._0_4_ * fVar259;
    auVar132._4_4_ = auVar109._4_4_ * fVar267;
    auVar132._8_4_ = auVar109._8_4_ * fVar268;
    auVar132._12_4_ = auVar109._12_4_ * fVar270;
    auVar132._16_4_ = auVar109._16_4_ * 0.0;
    auVar132._20_4_ = auVar109._20_4_ * 0.0;
    auVar132._24_4_ = auVar109._24_4_ * 0.0;
    auVar132._28_4_ = 0;
    auVar121._4_4_ = auVar110._4_4_ * fVar267;
    auVar121._0_4_ = auVar110._0_4_ * fVar259;
    auVar121._8_4_ = auVar110._8_4_ * fVar268;
    auVar121._12_4_ = auVar110._12_4_ * fVar270;
    auVar121._16_4_ = auVar110._16_4_ * 0.0;
    auVar121._20_4_ = auVar110._20_4_ * 0.0;
    auVar121._24_4_ = auVar110._24_4_ * 0.0;
    auVar121._28_4_ = auVar109._28_4_;
    auVar122._4_4_ = auVar111._4_4_ * fVar267;
    auVar122._0_4_ = auVar111._0_4_ * fVar259;
    auVar122._8_4_ = auVar111._8_4_ * fVar268;
    auVar122._12_4_ = auVar111._12_4_ * fVar270;
    auVar122._16_4_ = auVar111._16_4_ * 0.0;
    auVar122._20_4_ = auVar111._20_4_ * 0.0;
    auVar122._24_4_ = auVar111._24_4_ * 0.0;
    auVar122._28_4_ = auVar110._28_4_;
    auVar123._4_4_ = auVar112._4_4_ * fVar267;
    auVar123._0_4_ = auVar112._0_4_ * fVar259;
    auVar123._8_4_ = auVar112._8_4_ * fVar268;
    auVar123._12_4_ = auVar112._12_4_ * fVar270;
    auVar123._16_4_ = auVar112._16_4_ * 0.0;
    auVar123._20_4_ = auVar112._20_4_ * 0.0;
    auVar123._24_4_ = auVar112._24_4_ * 0.0;
    auVar123._28_4_ = auVar111._28_4_;
    auVar100 = vfmadd231ps_fma(auVar132,auVar120,ZEXT1632(auVar97));
    auVar101 = vfmadd231ps_fma(auVar121,auVar120,ZEXT1632(auVar103));
    auVar102 = vfmadd231ps_fma(auVar122,auVar120,ZEXT1632(auVar104));
    auVar33 = vfmadd231ps_fma(auVar123,auVar120,ZEXT1632(auVar105));
    auVar109 = vmulps_avx512vl(ZEXT1632(auVar99),ZEXT1632(auVar102));
    auVar117 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(fVar270 * auVar100._12_4_,
                                             CONCAT48(fVar268 * auVar100._8_4_,
                                                      CONCAT44(fVar267 * auVar100._4_4_,
                                                               fVar259 * auVar100._0_4_)))),auVar120
                          ,auVar113);
    auVar251 = ZEXT3264(auVar117);
    auVar118 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar101._12_4_ * fVar270,
                                             CONCAT48(auVar101._8_4_ * fVar268,
                                                      CONCAT44(auVar101._4_4_ * fVar267,
                                                               auVar101._0_4_ * fVar259)))),auVar120
                          ,auVar114);
    auVar241 = ZEXT3264(auVar118);
    auVar119 = vfmadd231ps_avx512vl(auVar109,auVar120,auVar115);
    auVar110 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar33._12_4_ * fVar270,
                                             CONCAT48(auVar33._8_4_ * fVar268,
                                                      CONCAT44(auVar33._4_4_ * fVar267,
                                                               auVar33._0_4_ * fVar259)))),auVar116,
                          auVar120);
    auVar120 = vsubps_avx512vl(ZEXT1632(auVar100),auVar113);
    auVar109 = vsubps_avx512vl(ZEXT1632(auVar101),auVar114);
    auVar111 = vsubps_avx512vl(ZEXT1632(auVar102),auVar115);
    auVar112 = vsubps_avx512vl(ZEXT1632(auVar33),auVar116);
    auVar137._0_4_ = fVar282 * auVar120._0_4_ * 3.0;
    auVar137._4_4_ = fVar282 * auVar120._4_4_ * 3.0;
    auVar137._8_4_ = fVar282 * auVar120._8_4_ * 3.0;
    auVar137._12_4_ = fVar282 * auVar120._12_4_ * 3.0;
    auVar137._16_4_ = fVar282 * auVar120._16_4_ * 3.0;
    auVar137._20_4_ = fVar282 * auVar120._20_4_ * 3.0;
    auVar137._24_4_ = fVar282 * auVar120._24_4_ * 3.0;
    auVar137._28_4_ = 0;
    auVar138._0_4_ = fVar282 * auVar109._0_4_ * 3.0;
    auVar138._4_4_ = fVar282 * auVar109._4_4_ * 3.0;
    auVar138._8_4_ = fVar282 * auVar109._8_4_ * 3.0;
    auVar138._12_4_ = fVar282 * auVar109._12_4_ * 3.0;
    auVar138._16_4_ = fVar282 * auVar109._16_4_ * 3.0;
    auVar138._20_4_ = fVar282 * auVar109._20_4_ * 3.0;
    auVar138._24_4_ = fVar282 * auVar109._24_4_ * 3.0;
    auVar138._28_4_ = 0;
    auVar139._0_4_ = auVar111._0_4_ * 3.0 * fVar282;
    auVar139._4_4_ = auVar111._4_4_ * 3.0 * fVar282;
    auVar139._8_4_ = auVar111._8_4_ * 3.0 * fVar282;
    auVar139._12_4_ = auVar111._12_4_ * 3.0 * fVar282;
    auVar139._16_4_ = auVar111._16_4_ * 3.0 * fVar282;
    auVar139._20_4_ = auVar111._20_4_ * 3.0 * fVar282;
    auVar139._24_4_ = auVar111._24_4_ * 3.0 * fVar282;
    auVar139._28_4_ = 0;
    fVar259 = auVar112._0_4_ * 3.0 * fVar282;
    fVar267 = auVar112._4_4_ * 3.0 * fVar282;
    auVar127._4_4_ = fVar267;
    auVar127._0_4_ = fVar259;
    fVar268 = auVar112._8_4_ * 3.0 * fVar282;
    auVar127._8_4_ = fVar268;
    fVar270 = auVar112._12_4_ * 3.0 * fVar282;
    auVar127._12_4_ = fVar270;
    fVar272 = auVar112._16_4_ * 3.0 * fVar282;
    auVar127._16_4_ = fVar272;
    fVar273 = auVar112._20_4_ * 3.0 * fVar282;
    auVar127._20_4_ = fVar273;
    fVar274 = auVar112._24_4_ * 3.0 * fVar282;
    auVar127._24_4_ = fVar274;
    auVar127._28_4_ = fVar282;
    auVar121 = vpermt2ps_avx512vl(auVar117,_DAT_0205fd20,ZEXT1632(auVar98));
    auVar122 = vpermt2ps_avx512vl(auVar118,_DAT_0205fd20,ZEXT1632(auVar98));
    auVar111 = ZEXT1632(auVar98);
    auVar123 = vpermt2ps_avx512vl(auVar119,_DAT_0205fd20,auVar111);
    auVar133._0_4_ = auVar110._0_4_ + fVar259;
    auVar133._4_4_ = auVar110._4_4_ + fVar267;
    auVar133._8_4_ = auVar110._8_4_ + fVar268;
    auVar133._12_4_ = auVar110._12_4_ + fVar270;
    auVar133._16_4_ = auVar110._16_4_ + fVar272;
    auVar133._20_4_ = auVar110._20_4_ + fVar273;
    auVar133._24_4_ = auVar110._24_4_ + fVar274;
    auVar133._28_4_ = auVar110._28_4_ + fVar282;
    auVar120 = vmaxps_avx(auVar110,auVar133);
    auVar109 = vminps_avx(auVar110,auVar133);
    auVar112 = vpermt2ps_avx512vl(auVar110,_DAT_0205fd20,auVar111);
    auVar124 = vpermt2ps_avx512vl(auVar137,_DAT_0205fd20,auVar111);
    auVar125 = vpermt2ps_avx512vl(auVar138,_DAT_0205fd20,auVar111);
    auVar133 = ZEXT1632(auVar98);
    auVar126 = vpermt2ps_avx512vl(auVar139,_DAT_0205fd20,auVar133);
    auVar110 = vpermt2ps_avx512vl(auVar127,_DAT_0205fd20,auVar133);
    auVar113 = vsubps_avx512vl(auVar112,auVar110);
    auVar110 = vsubps_avx(auVar121,auVar117);
    auVar111 = vsubps_avx(auVar122,auVar118);
    auVar127 = vsubps_avx512vl(auVar123,auVar119);
    auVar114 = vmulps_avx512vl(auVar111,auVar139);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar138,auVar127);
    auVar115 = vmulps_avx512vl(auVar127,auVar137);
    auVar115 = vfmsub231ps_avx512vl(auVar115,auVar139,auVar110);
    auVar116 = vmulps_avx512vl(auVar110,auVar138);
    auVar116 = vfmsub231ps_avx512vl(auVar116,auVar137,auVar111);
    auVar116 = vmulps_avx512vl(auVar116,auVar116);
    auVar115 = vfmadd231ps_avx512vl(auVar116,auVar115,auVar115);
    auVar114 = vfmadd231ps_avx512vl(auVar115,auVar114,auVar114);
    auVar115 = vmulps_avx512vl(auVar127,auVar127);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar111,auVar111);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar110,auVar110);
    auVar116 = vrcp14ps_avx512vl(auVar115);
    auVar128 = vfnmadd213ps_avx512vl(auVar116,auVar115,auVar135);
    auVar116 = vfmadd132ps_avx512vl(auVar128,auVar116,auVar116);
    auVar114 = vmulps_avx512vl(auVar114,auVar116);
    auVar128 = vmulps_avx512vl(auVar111,auVar126);
    auVar128 = vfmsub231ps_avx512vl(auVar128,auVar125,auVar127);
    auVar129 = vmulps_avx512vl(auVar127,auVar124);
    auVar129 = vfmsub231ps_avx512vl(auVar129,auVar126,auVar110);
    auVar130 = vmulps_avx512vl(auVar110,auVar125);
    auVar130 = vfmsub231ps_avx512vl(auVar130,auVar124,auVar111);
    auVar130 = vmulps_avx512vl(auVar130,auVar130);
    auVar129 = vfmadd231ps_avx512vl(auVar130,auVar129,auVar129);
    auVar128 = vfmadd231ps_avx512vl(auVar129,auVar128,auVar128);
    auVar116 = vmulps_avx512vl(auVar128,auVar116);
    auVar114 = vmaxps_avx512vl(auVar114,auVar116);
    auVar114 = vsqrtps_avx512vl(auVar114);
    auVar116 = vmaxps_avx512vl(auVar113,auVar112);
    auVar120 = vmaxps_avx512vl(auVar120,auVar116);
    auVar116 = vaddps_avx512vl(auVar114,auVar120);
    auVar120 = vminps_avx512vl(auVar113,auVar112);
    auVar120 = vminps_avx(auVar109,auVar120);
    auVar120 = vsubps_avx512vl(auVar120,auVar114);
    auVar112._8_4_ = 0x3f800002;
    auVar112._0_8_ = 0x3f8000023f800002;
    auVar112._12_4_ = 0x3f800002;
    auVar112._16_4_ = 0x3f800002;
    auVar112._20_4_ = 0x3f800002;
    auVar112._24_4_ = 0x3f800002;
    auVar112._28_4_ = 0x3f800002;
    auVar109 = vmulps_avx512vl(auVar116,auVar112);
    auVar113._8_4_ = 0x3f7ffffc;
    auVar113._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar113._12_4_ = 0x3f7ffffc;
    auVar113._16_4_ = 0x3f7ffffc;
    auVar113._20_4_ = 0x3f7ffffc;
    auVar113._24_4_ = 0x3f7ffffc;
    auVar113._28_4_ = 0x3f7ffffc;
    local_aa0 = vmulps_avx512vl(auVar120,auVar113);
    auVar128._4_4_ = auVar109._4_4_ * auVar109._4_4_;
    auVar128._0_4_ = auVar109._0_4_ * auVar109._0_4_;
    auVar128._8_4_ = auVar109._8_4_ * auVar109._8_4_;
    auVar128._12_4_ = auVar109._12_4_ * auVar109._12_4_;
    auVar128._16_4_ = auVar109._16_4_ * auVar109._16_4_;
    auVar128._20_4_ = auVar109._20_4_ * auVar109._20_4_;
    auVar128._24_4_ = auVar109._24_4_ * auVar109._24_4_;
    auVar128._28_4_ = local_aa0._28_4_;
    auVar120 = vrsqrt14ps_avx512vl(auVar115);
    auVar114._8_4_ = 0xbf000000;
    auVar114._0_8_ = 0xbf000000bf000000;
    auVar114._12_4_ = 0xbf000000;
    auVar114._16_4_ = 0xbf000000;
    auVar114._20_4_ = 0xbf000000;
    auVar114._24_4_ = 0xbf000000;
    auVar114._28_4_ = 0xbf000000;
    auVar109 = vmulps_avx512vl(auVar115,auVar114);
    auVar129._4_4_ = auVar120._4_4_ * auVar109._4_4_;
    auVar129._0_4_ = auVar120._0_4_ * auVar109._0_4_;
    auVar129._8_4_ = auVar120._8_4_ * auVar109._8_4_;
    auVar129._12_4_ = auVar120._12_4_ * auVar109._12_4_;
    auVar129._16_4_ = auVar120._16_4_ * auVar109._16_4_;
    auVar129._20_4_ = auVar120._20_4_ * auVar109._20_4_;
    auVar129._24_4_ = auVar120._24_4_ * auVar109._24_4_;
    auVar129._28_4_ = auVar109._28_4_;
    auVar109 = vmulps_avx512vl(auVar120,auVar120);
    auVar109 = vmulps_avx512vl(auVar109,auVar129);
    auVar115._8_4_ = 0x3fc00000;
    auVar115._0_8_ = 0x3fc000003fc00000;
    auVar115._12_4_ = 0x3fc00000;
    auVar115._16_4_ = 0x3fc00000;
    auVar115._20_4_ = 0x3fc00000;
    auVar115._24_4_ = 0x3fc00000;
    auVar115._28_4_ = 0x3fc00000;
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar120,auVar115);
    auVar130._4_4_ = auVar109._4_4_ * auVar110._4_4_;
    auVar130._0_4_ = auVar109._0_4_ * auVar110._0_4_;
    auVar130._8_4_ = auVar109._8_4_ * auVar110._8_4_;
    auVar130._12_4_ = auVar109._12_4_ * auVar110._12_4_;
    auVar130._16_4_ = auVar109._16_4_ * auVar110._16_4_;
    auVar130._20_4_ = auVar109._20_4_ * auVar110._20_4_;
    auVar130._24_4_ = auVar109._24_4_ * auVar110._24_4_;
    auVar130._28_4_ = auVar120._28_4_;
    auVar120 = vmulps_avx512vl(auVar111,auVar109);
    auVar112 = vmulps_avx512vl(auVar127,auVar109);
    auVar113 = vsubps_avx512vl(auVar133,auVar117);
    auVar114 = vsubps_avx512vl(auVar133,auVar118);
    auVar115 = vsubps_avx512vl(auVar133,auVar119);
    auVar116 = vmulps_avx512vl(auVar287._0_32_,auVar115);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar108,auVar114);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar107,auVar113);
    auVar129 = vmulps_avx512vl(auVar115,auVar115);
    auVar129 = vfmadd231ps_avx512vl(auVar129,auVar114,auVar114);
    auVar129 = vfmadd231ps_avx512vl(auVar129,auVar113,auVar113);
    auVar131 = vmulps_avx512vl(auVar287._0_32_,auVar112);
    auVar131 = vfmadd231ps_avx512vl(auVar131,auVar120,auVar108);
    auVar131 = vfmadd231ps_avx512vl(auVar131,auVar130,auVar107);
    auVar112 = vmulps_avx512vl(auVar115,auVar112);
    auVar120 = vfmadd231ps_avx512vl(auVar112,auVar114,auVar120);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar113,auVar130);
    local_900 = vmulps_avx512vl(auVar131,auVar131);
    auVar112 = vsubps_avx512vl(local_720,local_900);
    auVar130 = vmulps_avx512vl(auVar131,auVar120);
    auVar116 = vsubps_avx512vl(auVar116,auVar130);
    auVar130 = vaddps_avx512vl(auVar116,auVar116);
    auVar116 = vmulps_avx512vl(auVar120,auVar120);
    auVar129 = vsubps_avx512vl(auVar129,auVar116);
    auVar128 = vsubps_avx512vl(auVar129,auVar128);
    local_8e0 = vmulps_avx512vl(auVar130,auVar130);
    auVar116._8_4_ = 0x40800000;
    auVar116._0_8_ = 0x4080000040800000;
    auVar116._12_4_ = 0x40800000;
    auVar116._16_4_ = 0x40800000;
    auVar116._20_4_ = 0x40800000;
    auVar116._24_4_ = 0x40800000;
    auVar116._28_4_ = 0x40800000;
    auVar116 = vmulps_avx512vl(auVar112,auVar116);
    auVar132 = vmulps_avx512vl(auVar116,auVar128);
    auVar132 = vsubps_avx512vl(local_8e0,auVar132);
    uVar91 = vcmpps_avx512vl(auVar132,auVar133,5);
    bVar83 = (byte)uVar91;
    if (bVar83 == 0) {
      auVar134 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar128 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      in_ZMM31 = ZEXT3264(auVar128);
    }
    else {
      auVar132 = vsqrtps_avx512vl(auVar132);
      auVar133 = vaddps_avx512vl(auVar112,auVar112);
      auVar134 = vrcp14ps_avx512vl(auVar133);
      auVar135 = vfnmadd213ps_avx512vl(auVar133,auVar134,auVar135);
      auVar135 = vfmadd132ps_avx512vl(auVar135,auVar134,auVar134);
      auVar140._8_4_ = 0x80000000;
      auVar140._0_8_ = 0x8000000080000000;
      auVar140._12_4_ = 0x80000000;
      auVar140._16_4_ = 0x80000000;
      auVar140._20_4_ = 0x80000000;
      auVar140._24_4_ = 0x80000000;
      auVar140._28_4_ = 0x80000000;
      auVar133 = vxorps_avx512vl(auVar130,auVar140);
      auVar133 = vsubps_avx512vl(auVar133,auVar132);
      auVar133 = vmulps_avx512vl(auVar133,auVar135);
      auVar132 = vsubps_avx512vl(auVar132,auVar130);
      auVar132 = vmulps_avx512vl(auVar132,auVar135);
      auVar135 = vfmadd213ps_avx512vl(auVar131,auVar133,auVar120);
      local_820 = vmulps_avx512vl(auVar109,auVar135);
      auVar135 = vfmadd213ps_avx512vl(auVar131,auVar132,auVar120);
      local_840 = vmulps_avx512vl(auVar109,auVar135);
      auVar178._8_4_ = 0x7f800000;
      auVar178._0_8_ = 0x7f8000007f800000;
      auVar178._12_4_ = 0x7f800000;
      auVar178._16_4_ = 0x7f800000;
      auVar178._20_4_ = 0x7f800000;
      auVar178._24_4_ = 0x7f800000;
      auVar178._28_4_ = 0x7f800000;
      auVar135 = vblendmps_avx512vl(auVar178,auVar133);
      auVar134._0_4_ =
           (uint)(bVar83 & 1) * auVar135._0_4_ | (uint)!(bool)(bVar83 & 1) * local_840._0_4_;
      bVar18 = (bool)((byte)(uVar91 >> 1) & 1);
      auVar134._4_4_ = (uint)bVar18 * auVar135._4_4_ | (uint)!bVar18 * local_840._4_4_;
      bVar18 = (bool)((byte)(uVar91 >> 2) & 1);
      auVar134._8_4_ = (uint)bVar18 * auVar135._8_4_ | (uint)!bVar18 * local_840._8_4_;
      bVar18 = (bool)((byte)(uVar91 >> 3) & 1);
      auVar134._12_4_ = (uint)bVar18 * auVar135._12_4_ | (uint)!bVar18 * local_840._12_4_;
      bVar18 = (bool)((byte)(uVar91 >> 4) & 1);
      auVar134._16_4_ = (uint)bVar18 * auVar135._16_4_ | (uint)!bVar18 * local_840._16_4_;
      bVar18 = (bool)((byte)(uVar91 >> 5) & 1);
      auVar134._20_4_ = (uint)bVar18 * auVar135._20_4_ | (uint)!bVar18 * local_840._20_4_;
      bVar18 = (bool)((byte)(uVar91 >> 6) & 1);
      auVar134._24_4_ = (uint)bVar18 * auVar135._24_4_ | (uint)!bVar18 * local_840._24_4_;
      bVar18 = SUB81(uVar91 >> 7,0);
      auVar134._28_4_ = (uint)bVar18 * auVar135._28_4_ | (uint)!bVar18 * local_840._28_4_;
      auVar179._8_4_ = 0xff800000;
      auVar179._0_8_ = 0xff800000ff800000;
      auVar179._12_4_ = 0xff800000;
      auVar179._16_4_ = 0xff800000;
      auVar179._20_4_ = 0xff800000;
      auVar179._24_4_ = 0xff800000;
      auVar179._28_4_ = 0xff800000;
      auVar135 = vblendmps_avx512vl(auVar179,auVar132);
      auVar136._0_4_ =
           (uint)(bVar83 & 1) * auVar135._0_4_ | (uint)!(bool)(bVar83 & 1) * auVar132._0_4_;
      bVar18 = (bool)((byte)(uVar91 >> 1) & 1);
      auVar136._4_4_ = (uint)bVar18 * auVar135._4_4_ | (uint)!bVar18 * auVar132._4_4_;
      bVar18 = (bool)((byte)(uVar91 >> 2) & 1);
      auVar136._8_4_ = (uint)bVar18 * auVar135._8_4_ | (uint)!bVar18 * auVar132._8_4_;
      bVar18 = (bool)((byte)(uVar91 >> 3) & 1);
      auVar136._12_4_ = (uint)bVar18 * auVar135._12_4_ | (uint)!bVar18 * auVar132._12_4_;
      bVar18 = (bool)((byte)(uVar91 >> 4) & 1);
      auVar136._16_4_ = (uint)bVar18 * auVar135._16_4_ | (uint)!bVar18 * auVar132._16_4_;
      bVar18 = (bool)((byte)(uVar91 >> 5) & 1);
      auVar136._20_4_ = (uint)bVar18 * auVar135._20_4_ | (uint)!bVar18 * auVar132._20_4_;
      bVar18 = (bool)((byte)(uVar91 >> 6) & 1);
      auVar136._24_4_ = (uint)bVar18 * auVar135._24_4_ | (uint)!bVar18 * auVar132._24_4_;
      bVar18 = SUB81(uVar91 >> 7,0);
      auVar136._28_4_ = (uint)bVar18 * auVar135._28_4_ | (uint)!bVar18 * auVar132._28_4_;
      in_ZMM31 = ZEXT3264(auVar136);
      auVar180._8_4_ = 0x7fffffff;
      auVar180._0_8_ = 0x7fffffff7fffffff;
      auVar180._12_4_ = 0x7fffffff;
      auVar180._16_4_ = 0x7fffffff;
      auVar180._20_4_ = 0x7fffffff;
      auVar180._24_4_ = 0x7fffffff;
      auVar180._28_4_ = 0x7fffffff;
      vandps_avx512vl(local_900,auVar180);
      auVar132 = vmaxps_avx512vl(local_7c0,auVar136);
      auVar48._8_4_ = 0x36000000;
      auVar48._0_8_ = 0x3600000036000000;
      auVar48._12_4_ = 0x36000000;
      auVar48._16_4_ = 0x36000000;
      auVar48._20_4_ = 0x36000000;
      auVar48._24_4_ = 0x36000000;
      auVar48._28_4_ = 0x36000000;
      auVar135 = vmulps_avx512vl(auVar132,auVar48);
      auVar132 = vandps_avx(auVar112,auVar180);
      uVar88 = vcmpps_avx512vl(auVar132,auVar135,1);
      uVar91 = uVar91 & uVar88;
      bVar86 = (byte)uVar91;
      if (bVar86 != 0) {
        uVar88 = vcmpps_avx512vl(auVar128,ZEXT832(0) << 0x20,2);
        auVar209._8_4_ = 0xff800000;
        auVar209._0_8_ = 0xff800000ff800000;
        auVar209._12_4_ = 0xff800000;
        auVar209._16_4_ = 0xff800000;
        auVar209._20_4_ = 0xff800000;
        auVar209._24_4_ = 0xff800000;
        auVar209._28_4_ = 0xff800000;
        auVar128 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar132 = vblendmps_avx512vl(auVar128,auVar209);
        bVar81 = (byte)uVar88;
        iVar1 = (uint)(bVar81 & 1) * auVar132._0_4_;
        iVar2 = (uint)((byte)(uVar88 >> 1) & 1) * auVar132._4_4_;
        iVar3 = (uint)((byte)(uVar88 >> 2) & 1) * auVar132._8_4_;
        iVar4 = (uint)((byte)(uVar88 >> 3) & 1) * auVar132._12_4_;
        iVar5 = (uint)((byte)(uVar88 >> 4) & 1) * auVar132._16_4_;
        iVar6 = (uint)((byte)(uVar88 >> 5) & 1) * auVar132._20_4_;
        iVar7 = (uint)((byte)(uVar88 >> 6) & 1) * auVar132._24_4_;
        iVar8 = (uint)(byte)(uVar88 >> 7) * auVar132._28_4_;
        auVar134._0_4_ = (uint)(bVar86 & 1) * iVar1 | !(bool)(bVar86 & 1) * auVar134._0_4_;
        bVar18 = (bool)((byte)(uVar91 >> 1) & 1);
        auVar134._4_4_ = (uint)bVar18 * iVar2 | !bVar18 * auVar134._4_4_;
        bVar18 = (bool)((byte)(uVar91 >> 2) & 1);
        auVar134._8_4_ = (uint)bVar18 * iVar3 | !bVar18 * auVar134._8_4_;
        bVar18 = (bool)((byte)(uVar91 >> 3) & 1);
        auVar134._12_4_ = (uint)bVar18 * iVar4 | !bVar18 * auVar134._12_4_;
        bVar18 = (bool)((byte)(uVar91 >> 4) & 1);
        auVar134._16_4_ = (uint)bVar18 * iVar5 | !bVar18 * auVar134._16_4_;
        bVar18 = (bool)((byte)(uVar91 >> 5) & 1);
        auVar134._20_4_ = (uint)bVar18 * iVar6 | !bVar18 * auVar134._20_4_;
        bVar18 = (bool)((byte)(uVar91 >> 6) & 1);
        auVar134._24_4_ = (uint)bVar18 * iVar7 | !bVar18 * auVar134._24_4_;
        bVar18 = SUB81(uVar91 >> 7,0);
        auVar134._28_4_ = (uint)bVar18 * iVar8 | !bVar18 * auVar134._28_4_;
        auVar128 = vblendmps_avx512vl(auVar209,auVar128);
        bVar18 = (bool)((byte)(uVar88 >> 1) & 1);
        bVar19 = (bool)((byte)(uVar88 >> 2) & 1);
        bVar21 = (bool)((byte)(uVar88 >> 3) & 1);
        bVar23 = (bool)((byte)(uVar88 >> 4) & 1);
        bVar25 = (bool)((byte)(uVar88 >> 5) & 1);
        bVar27 = (bool)((byte)(uVar88 >> 6) & 1);
        bVar29 = SUB81(uVar88 >> 7,0);
        bVar90 = (bool)((byte)(uVar91 >> 1) & 1);
        bVar20 = (bool)((byte)(uVar91 >> 2) & 1);
        bVar22 = (bool)((byte)(uVar91 >> 3) & 1);
        bVar24 = (bool)((byte)(uVar91 >> 4) & 1);
        bVar26 = (bool)((byte)(uVar91 >> 5) & 1);
        bVar28 = (bool)((byte)(uVar91 >> 6) & 1);
        bVar30 = SUB81(uVar91 >> 7,0);
        in_ZMM31 = ZEXT3264(CONCAT428((uint)bVar30 *
                                      ((uint)bVar29 * auVar128._28_4_ | (uint)!bVar29 * iVar8) |
                                      !bVar30 * auVar136._28_4_,
                                      CONCAT424((uint)bVar28 *
                                                ((uint)bVar27 * auVar128._24_4_ |
                                                (uint)!bVar27 * iVar7) | !bVar28 * auVar136._24_4_,
                                                CONCAT420((uint)bVar26 *
                                                          ((uint)bVar25 * auVar128._20_4_ |
                                                          (uint)!bVar25 * iVar6) |
                                                          !bVar26 * auVar136._20_4_,
                                                          CONCAT416((uint)bVar24 *
                                                                    ((uint)bVar23 * auVar128._16_4_
                                                                    | (uint)!bVar23 * iVar5) |
                                                                    !bVar24 * auVar136._16_4_,
                                                                    CONCAT412((uint)bVar22 *
                                                                              ((uint)bVar21 *
                                                                               auVar128._12_4_ |
                                                                              (uint)!bVar21 * iVar4)
                                                                              | !bVar22 * auVar136.
                                                  _12_4_,CONCAT48((uint)bVar20 *
                                                                  ((uint)bVar19 * auVar128._8_4_ |
                                                                  (uint)!bVar19 * iVar3) |
                                                                  !bVar20 * auVar136._8_4_,
                                                                  CONCAT44((uint)bVar90 *
                                                                           ((uint)bVar18 *
                                                                            auVar128._4_4_ |
                                                                           (uint)!bVar18 * iVar2) |
                                                                           !bVar90 * auVar136._4_4_,
                                                                           (uint)(bVar86 & 1) *
                                                                           ((uint)(bVar81 & 1) *
                                                                            auVar128._0_4_ |
                                                                           (uint)!(bool)(bVar81 & 1)
                                                                           * iVar1) |
                                                                           !(bool)(bVar86 & 1) *
                                                                           auVar136._0_4_))))))));
        bVar83 = (~bVar86 | bVar81) & bVar83;
      }
    }
    auVar128 = local_ac0;
    if ((bVar83 & 0x7f) == 0) {
LAB_01c05df5:
      auVar287 = ZEXT3264(local_ac0);
      auVar281 = ZEXT3264(_DAT_02020f20);
      auVar157._0_32_ = auVar128;
      auVar189 = ZEXT3264(CONCAT428(0x7fffffff,
                                    CONCAT424(0x7fffffff,
                                              CONCAT420(0x7fffffff,
                                                        CONCAT416(0x7fffffff,
                                                                  CONCAT412(0x7fffffff,
                                                                            CONCAT48(0x7fffffff,
                                                                                                                                                                          
                                                  0x7fffffff7fffffff)))))));
    }
    else {
      fVar259 = *(float *)(ray + k * 4 + 0x200) - (float)local_a00._0_4_;
      auVar181._4_4_ = fVar259;
      auVar181._0_4_ = fVar259;
      auVar181._8_4_ = fVar259;
      auVar181._12_4_ = fVar259;
      auVar181._16_4_ = fVar259;
      auVar181._20_4_ = fVar259;
      auVar181._24_4_ = fVar259;
      auVar181._28_4_ = fVar259;
      auVar128 = vminps_avx512vl(auVar181,in_ZMM31._0_32_);
      auVar99 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
      in_ZMM31 = ZEXT1664(auVar99);
      auVar77._4_4_ = fStack_73c;
      auVar77._0_4_ = local_740;
      auVar77._8_4_ = fStack_738;
      auVar77._12_4_ = fStack_734;
      auVar77._16_4_ = fStack_730;
      auVar77._20_4_ = fStack_72c;
      auVar77._24_4_ = fStack_728;
      auVar77._28_4_ = fStack_724;
      auVar132 = vmaxps_avx512vl(auVar77,auVar134);
      auVar115 = vmulps_avx512vl(auVar115,auVar139);
      auVar114 = vfmadd213ps_avx512vl(auVar114,auVar138,auVar115);
      auVar113 = vfmadd213ps_avx512vl(auVar113,auVar137,auVar114);
      auVar287 = ZEXT3264(local_ac0);
      auVar114 = vmulps_avx512vl(local_ac0,auVar139);
      auVar114 = vfmadd231ps_avx512vl(auVar114,auVar108,auVar138);
      auVar114 = vfmadd231ps_avx512vl(auVar114,auVar107,auVar137);
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar114,auVar115);
      auVar135 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar34 = vcmpps_avx512vl(auVar115,auVar135,1);
      auVar133 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar113 = vxorps_avx512vl(auVar113,auVar133);
      auVar137 = vrcp14ps_avx512vl(auVar114);
      auVar138 = vxorps_avx512vl(auVar114,auVar133);
      auVar139 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar134 = vfnmadd213ps_avx512vl(auVar137,auVar114,auVar139);
      auVar134 = vfmadd132ps_avx512vl(auVar134,auVar137,auVar137);
      auVar134 = vmulps_avx512vl(auVar134,auVar113);
      uVar35 = vcmpps_avx512vl(auVar114,auVar138,1);
      bVar86 = (byte)uVar34 | (byte)uVar35;
      auVar140 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar113 = vblendmps_avx512vl(auVar134,auVar140);
      auVar141._0_4_ =
           (uint)(bVar86 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar86 & 1) * auVar137._0_4_;
      bVar18 = (bool)(bVar86 >> 1 & 1);
      auVar141._4_4_ = (uint)bVar18 * auVar113._4_4_ | (uint)!bVar18 * auVar137._4_4_;
      bVar18 = (bool)(bVar86 >> 2 & 1);
      auVar141._8_4_ = (uint)bVar18 * auVar113._8_4_ | (uint)!bVar18 * auVar137._8_4_;
      bVar18 = (bool)(bVar86 >> 3 & 1);
      auVar141._12_4_ = (uint)bVar18 * auVar113._12_4_ | (uint)!bVar18 * auVar137._12_4_;
      bVar18 = (bool)(bVar86 >> 4 & 1);
      auVar141._16_4_ = (uint)bVar18 * auVar113._16_4_ | (uint)!bVar18 * auVar137._16_4_;
      bVar18 = (bool)(bVar86 >> 5 & 1);
      auVar141._20_4_ = (uint)bVar18 * auVar113._20_4_ | (uint)!bVar18 * auVar137._20_4_;
      bVar18 = (bool)(bVar86 >> 6 & 1);
      auVar141._24_4_ = (uint)bVar18 * auVar113._24_4_ | (uint)!bVar18 * auVar137._24_4_;
      auVar141._28_4_ =
           (uint)(bVar86 >> 7) * auVar113._28_4_ | (uint)!(bool)(bVar86 >> 7) * auVar137._28_4_;
      auVar113 = vmaxps_avx(auVar132,auVar141);
      uVar35 = vcmpps_avx512vl(auVar114,auVar138,6);
      bVar86 = (byte)uVar34 | (byte)uVar35;
      auVar142._0_4_ = (uint)(bVar86 & 1) * 0x7f800000 | (uint)!(bool)(bVar86 & 1) * auVar134._0_4_;
      bVar18 = (bool)(bVar86 >> 1 & 1);
      auVar142._4_4_ = (uint)bVar18 * 0x7f800000 | (uint)!bVar18 * auVar134._4_4_;
      bVar18 = (bool)(bVar86 >> 2 & 1);
      auVar142._8_4_ = (uint)bVar18 * 0x7f800000 | (uint)!bVar18 * auVar134._8_4_;
      bVar18 = (bool)(bVar86 >> 3 & 1);
      auVar142._12_4_ = (uint)bVar18 * 0x7f800000 | (uint)!bVar18 * auVar134._12_4_;
      bVar18 = (bool)(bVar86 >> 4 & 1);
      auVar142._16_4_ = (uint)bVar18 * 0x7f800000 | (uint)!bVar18 * auVar134._16_4_;
      bVar18 = (bool)(bVar86 >> 5 & 1);
      auVar142._20_4_ = (uint)bVar18 * 0x7f800000 | (uint)!bVar18 * auVar134._20_4_;
      bVar18 = (bool)(bVar86 >> 6 & 1);
      auVar142._24_4_ = (uint)bVar18 * 0x7f800000 | (uint)!bVar18 * auVar134._24_4_;
      auVar142._28_4_ =
           (uint)(bVar86 >> 7) * 0x7f800000 | (uint)!(bool)(bVar86 >> 7) * auVar134._28_4_;
      auVar114 = vminps_avx(auVar128,auVar142);
      auVar121 = vsubps_avx512vl(ZEXT1632(auVar99),auVar121);
      auVar122 = vsubps_avx512vl(ZEXT1632(auVar99),auVar122);
      auVar132 = ZEXT1632(auVar99);
      auVar123 = vsubps_avx512vl(auVar132,auVar123);
      auVar57._4_4_ = auVar123._4_4_ * auVar126._4_4_;
      auVar57._0_4_ = auVar123._0_4_ * auVar126._0_4_;
      auVar57._8_4_ = auVar123._8_4_ * auVar126._8_4_;
      auVar57._12_4_ = auVar123._12_4_ * auVar126._12_4_;
      auVar57._16_4_ = auVar123._16_4_ * auVar126._16_4_;
      auVar57._20_4_ = auVar123._20_4_ * auVar126._20_4_;
      auVar57._24_4_ = auVar123._24_4_ * auVar126._24_4_;
      auVar57._28_4_ = auVar123._28_4_;
      auVar122 = vfnmsub231ps_avx512vl(auVar57,auVar125,auVar122);
      auVar121 = vfnmadd231ps_avx512vl(auVar122,auVar124,auVar121);
      auVar122 = vmulps_avx512vl(local_ac0,auVar126);
      auVar122 = vfnmsub231ps_avx512vl(auVar122,auVar108,auVar125);
      auVar122 = vfnmadd231ps_avx512vl(auVar122,auVar107,auVar124);
      vandps_avx512vl(auVar122,auVar115);
      uVar34 = vcmpps_avx512vl(auVar122,auVar135,1);
      auVar115 = vxorps_avx512vl(auVar121,auVar133);
      auVar121 = vrcp14ps_avx512vl(auVar122);
      auVar123 = vxorps_avx512vl(auVar122,auVar133);
      auVar128 = vfnmadd213ps_avx512vl(auVar121,auVar122,auVar139);
      auVar99 = vfmadd132ps_fma(auVar128,auVar121,auVar121);
      fVar259 = auVar99._0_4_ * auVar115._0_4_;
      fVar267 = auVar99._4_4_ * auVar115._4_4_;
      auVar58._4_4_ = fVar267;
      auVar58._0_4_ = fVar259;
      fVar268 = auVar99._8_4_ * auVar115._8_4_;
      auVar58._8_4_ = fVar268;
      fVar270 = auVar99._12_4_ * auVar115._12_4_;
      auVar58._12_4_ = fVar270;
      fVar282 = auVar115._16_4_ * 0.0;
      auVar58._16_4_ = fVar282;
      fVar272 = auVar115._20_4_ * 0.0;
      auVar58._20_4_ = fVar272;
      fVar273 = auVar115._24_4_ * 0.0;
      auVar58._24_4_ = fVar273;
      auVar58._28_4_ = auVar115._28_4_;
      uVar35 = vcmpps_avx512vl(auVar122,auVar123,1);
      bVar86 = (byte)uVar34 | (byte)uVar35;
      auVar128 = vblendmps_avx512vl(auVar58,auVar140);
      auVar143._0_4_ =
           (uint)(bVar86 & 1) * auVar128._0_4_ | (uint)!(bool)(bVar86 & 1) * auVar121._0_4_;
      bVar18 = (bool)(bVar86 >> 1 & 1);
      auVar143._4_4_ = (uint)bVar18 * auVar128._4_4_ | (uint)!bVar18 * auVar121._4_4_;
      bVar18 = (bool)(bVar86 >> 2 & 1);
      auVar143._8_4_ = (uint)bVar18 * auVar128._8_4_ | (uint)!bVar18 * auVar121._8_4_;
      bVar18 = (bool)(bVar86 >> 3 & 1);
      auVar143._12_4_ = (uint)bVar18 * auVar128._12_4_ | (uint)!bVar18 * auVar121._12_4_;
      bVar18 = (bool)(bVar86 >> 4 & 1);
      auVar143._16_4_ = (uint)bVar18 * auVar128._16_4_ | (uint)!bVar18 * auVar121._16_4_;
      bVar18 = (bool)(bVar86 >> 5 & 1);
      auVar143._20_4_ = (uint)bVar18 * auVar128._20_4_ | (uint)!bVar18 * auVar121._20_4_;
      bVar18 = (bool)(bVar86 >> 6 & 1);
      auVar143._24_4_ = (uint)bVar18 * auVar128._24_4_ | (uint)!bVar18 * auVar121._24_4_;
      auVar143._28_4_ =
           (uint)(bVar86 >> 7) * auVar128._28_4_ | (uint)!(bool)(bVar86 >> 7) * auVar121._28_4_;
      _local_920 = vmaxps_avx(auVar113,auVar143);
      uVar35 = vcmpps_avx512vl(auVar122,auVar123,6);
      bVar86 = (byte)uVar34 | (byte)uVar35;
      auVar144._0_4_ = (uint)(bVar86 & 1) * 0x7f800000 | (uint)!(bool)(bVar86 & 1) * (int)fVar259;
      bVar18 = (bool)(bVar86 >> 1 & 1);
      auVar144._4_4_ = (uint)bVar18 * 0x7f800000 | (uint)!bVar18 * (int)fVar267;
      bVar18 = (bool)(bVar86 >> 2 & 1);
      auVar144._8_4_ = (uint)bVar18 * 0x7f800000 | (uint)!bVar18 * (int)fVar268;
      bVar18 = (bool)(bVar86 >> 3 & 1);
      auVar144._12_4_ = (uint)bVar18 * 0x7f800000 | (uint)!bVar18 * (int)fVar270;
      bVar18 = (bool)(bVar86 >> 4 & 1);
      auVar144._16_4_ = (uint)bVar18 * 0x7f800000 | (uint)!bVar18 * (int)fVar282;
      bVar18 = (bool)(bVar86 >> 5 & 1);
      auVar144._20_4_ = (uint)bVar18 * 0x7f800000 | (uint)!bVar18 * (int)fVar272;
      bVar18 = (bool)(bVar86 >> 6 & 1);
      auVar144._24_4_ = (uint)bVar18 * 0x7f800000 | (uint)!bVar18 * (int)fVar273;
      auVar144._28_4_ =
           (uint)(bVar86 >> 7) * 0x7f800000 | (uint)!(bool)(bVar86 >> 7) * auVar115._28_4_;
      local_780 = vminps_avx(auVar114,auVar144);
      uVar34 = vcmpps_avx512vl(_local_920,local_780,2);
      bVar83 = bVar83 & 0x7f & (byte)uVar34;
      auVar128 = auVar108;
      if (bVar83 == 0) goto LAB_01c05df5;
      auVar114 = vmaxps_avx512vl(auVar132,local_aa0);
      auVar113 = vminps_avx512vl(local_820,auVar139);
      auVar66 = ZEXT412(0);
      auVar115 = ZEXT1232(auVar66) << 0x20;
      auVar113 = vmaxps_avx(auVar113,ZEXT1232(auVar66) << 0x20);
      auVar121 = vminps_avx512vl(local_840,auVar139);
      auVar59._4_4_ = (auVar113._4_4_ + 1.0) * 0.125;
      auVar59._0_4_ = (auVar113._0_4_ + 0.0) * 0.125;
      auVar59._8_4_ = (auVar113._8_4_ + 2.0) * 0.125;
      auVar59._12_4_ = (auVar113._12_4_ + 3.0) * 0.125;
      auVar59._16_4_ = (auVar113._16_4_ + 4.0) * 0.125;
      auVar59._20_4_ = (auVar113._20_4_ + 5.0) * 0.125;
      auVar59._24_4_ = (auVar113._24_4_ + 6.0) * 0.125;
      auVar59._28_4_ = auVar113._28_4_ + 7.0;
      auVar99 = vfmadd213ps_fma(auVar59,local_a80,auVar258);
      local_820 = ZEXT1632(auVar99);
      auVar113 = vmaxps_avx(auVar121,ZEXT1232(auVar66) << 0x20);
      auVar60._4_4_ = (auVar113._4_4_ + 1.0) * 0.125;
      auVar60._0_4_ = (auVar113._0_4_ + 0.0) * 0.125;
      auVar60._8_4_ = (auVar113._8_4_ + 2.0) * 0.125;
      auVar60._12_4_ = (auVar113._12_4_ + 3.0) * 0.125;
      auVar60._16_4_ = (auVar113._16_4_ + 4.0) * 0.125;
      auVar60._20_4_ = (auVar113._20_4_ + 5.0) * 0.125;
      auVar60._24_4_ = (auVar113._24_4_ + 6.0) * 0.125;
      auVar60._28_4_ = auVar113._28_4_ + 7.0;
      auVar99 = vfmadd213ps_fma(auVar60,local_a80,auVar258);
      local_840 = ZEXT1632(auVar99);
      auVar182._0_4_ = auVar114._0_4_ * auVar114._0_4_;
      auVar182._4_4_ = auVar114._4_4_ * auVar114._4_4_;
      auVar182._8_4_ = auVar114._8_4_ * auVar114._8_4_;
      auVar182._12_4_ = auVar114._12_4_ * auVar114._12_4_;
      auVar182._16_4_ = auVar114._16_4_ * auVar114._16_4_;
      auVar182._20_4_ = auVar114._20_4_ * auVar114._20_4_;
      auVar182._24_4_ = auVar114._24_4_ * auVar114._24_4_;
      auVar182._28_4_ = 0;
      auVar113 = vsubps_avx(auVar129,auVar182);
      auVar114 = vmulps_avx512vl(auVar116,auVar113);
      auVar114 = vsubps_avx(local_8e0,auVar114);
      uVar34 = vcmpps_avx512vl(auVar114,ZEXT1232(auVar66) << 0x20,5);
      bVar86 = (byte)uVar34;
      if (bVar86 == 0) {
        auVar120 = ZEXT832(0) << 0x20;
        auVar109 = ZEXT832(0) << 0x20;
        auVar116 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar121 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar114 = ZEXT832(0) << 0x20;
        auVar145._8_4_ = 0x7f800000;
        auVar145._0_8_ = 0x7f8000007f800000;
        auVar145._12_4_ = 0x7f800000;
        auVar145._16_4_ = 0x7f800000;
        auVar145._20_4_ = 0x7f800000;
        auVar145._24_4_ = 0x7f800000;
        auVar145._28_4_ = 0x7f800000;
        auVar146._8_4_ = 0xff800000;
        auVar146._0_8_ = 0xff800000ff800000;
        auVar146._12_4_ = 0xff800000;
        auVar146._16_4_ = 0xff800000;
        auVar146._20_4_ = 0xff800000;
        auVar146._24_4_ = 0xff800000;
        auVar146._28_4_ = 0xff800000;
      }
      else {
        auVar100 = vxorps_avx512vl(auVar125._0_16_,auVar125._0_16_);
        uVar91 = vcmpps_avx512vl(auVar114,auVar132,5);
        auVar114 = vsqrtps_avx(auVar114);
        auVar210._0_4_ = auVar112._0_4_ + auVar112._0_4_;
        auVar210._4_4_ = auVar112._4_4_ + auVar112._4_4_;
        auVar210._8_4_ = auVar112._8_4_ + auVar112._8_4_;
        auVar210._12_4_ = auVar112._12_4_ + auVar112._12_4_;
        auVar210._16_4_ = auVar112._16_4_ + auVar112._16_4_;
        auVar210._20_4_ = auVar112._20_4_ + auVar112._20_4_;
        auVar210._24_4_ = auVar112._24_4_ + auVar112._24_4_;
        auVar210._28_4_ = auVar112._28_4_ + auVar112._28_4_;
        auVar115 = vrcp14ps_avx512vl(auVar210);
        auVar116 = vfnmadd213ps_avx512vl(auVar210,auVar115,auVar139);
        auVar99 = vfmadd132ps_fma(auVar116,auVar115,auVar115);
        auVar49._8_4_ = 0x80000000;
        auVar49._0_8_ = 0x8000000080000000;
        auVar49._12_4_ = 0x80000000;
        auVar49._16_4_ = 0x80000000;
        auVar49._20_4_ = 0x80000000;
        auVar49._24_4_ = 0x80000000;
        auVar49._28_4_ = 0x80000000;
        auVar115 = vxorps_avx512vl(auVar130,auVar49);
        auVar115 = vsubps_avx(auVar115,auVar114);
        auVar61._4_4_ = auVar115._4_4_ * auVar99._4_4_;
        auVar61._0_4_ = auVar115._0_4_ * auVar99._0_4_;
        auVar61._8_4_ = auVar115._8_4_ * auVar99._8_4_;
        auVar61._12_4_ = auVar115._12_4_ * auVar99._12_4_;
        auVar61._16_4_ = auVar115._16_4_ * 0.0;
        auVar61._20_4_ = auVar115._20_4_ * 0.0;
        auVar61._24_4_ = auVar115._24_4_ * 0.0;
        auVar61._28_4_ = 0x3e000000;
        auVar114 = vsubps_avx512vl(auVar114,auVar130);
        auVar62._4_4_ = auVar114._4_4_ * auVar99._4_4_;
        auVar62._0_4_ = auVar114._0_4_ * auVar99._0_4_;
        auVar62._8_4_ = auVar114._8_4_ * auVar99._8_4_;
        auVar62._12_4_ = auVar114._12_4_ * auVar99._12_4_;
        auVar62._16_4_ = auVar114._16_4_ * 0.0;
        auVar62._20_4_ = auVar114._20_4_ * 0.0;
        auVar62._24_4_ = auVar114._24_4_ * 0.0;
        auVar62._28_4_ = fVar193;
        auVar114 = vfmadd213ps_avx512vl(auVar131,auVar61,auVar120);
        auVar63._4_4_ = auVar109._4_4_ * auVar114._4_4_;
        auVar63._0_4_ = auVar109._0_4_ * auVar114._0_4_;
        auVar63._8_4_ = auVar109._8_4_ * auVar114._8_4_;
        auVar63._12_4_ = auVar109._12_4_ * auVar114._12_4_;
        auVar63._16_4_ = auVar109._16_4_ * auVar114._16_4_;
        auVar63._20_4_ = auVar109._20_4_ * auVar114._20_4_;
        auVar63._24_4_ = auVar109._24_4_ * auVar114._24_4_;
        auVar63._28_4_ = auVar115._28_4_;
        auVar114 = vmulps_avx512vl(auVar107,auVar61);
        auVar115 = vmulps_avx512vl(auVar108,auVar61);
        auVar122 = vmulps_avx512vl(local_ac0,auVar61);
        auVar116 = vfmadd213ps_avx512vl(auVar110,auVar63,auVar117);
        auVar116 = vsubps_avx512vl(auVar114,auVar116);
        auVar114 = vfmadd213ps_avx512vl(auVar111,auVar63,auVar118);
        auVar121 = vsubps_avx512vl(auVar115,auVar114);
        auVar99 = vfmadd213ps_fma(auVar63,auVar127,auVar119);
        auVar114 = vsubps_avx(auVar122,ZEXT1632(auVar99));
        auVar120 = vfmadd213ps_avx512vl(auVar131,auVar62,auVar120);
        auVar109 = vmulps_avx512vl(auVar109,auVar120);
        auVar120 = vmulps_avx512vl(auVar107,auVar62);
        auVar122 = vmulps_avx512vl(auVar108,auVar62);
        auVar123 = vmulps_avx512vl(local_ac0,auVar62);
        auVar99 = vfmadd213ps_fma(auVar110,auVar109,auVar117);
        auVar115 = vsubps_avx(auVar120,ZEXT1632(auVar99));
        auVar99 = vfmadd213ps_fma(auVar111,auVar109,auVar118);
        auVar120 = vsubps_avx512vl(auVar122,ZEXT1632(auVar99));
        auVar99 = vfmadd213ps_fma(auVar127,auVar109,auVar119);
        auVar109 = vsubps_avx512vl(auVar123,ZEXT1632(auVar99));
        auVar230._8_4_ = 0x7f800000;
        auVar230._0_8_ = 0x7f8000007f800000;
        auVar230._12_4_ = 0x7f800000;
        auVar230._16_4_ = 0x7f800000;
        auVar230._20_4_ = 0x7f800000;
        auVar230._24_4_ = 0x7f800000;
        auVar230._28_4_ = 0x7f800000;
        auVar110 = vblendmps_avx512vl(auVar230,auVar61);
        bVar18 = (bool)((byte)uVar91 & 1);
        auVar145._0_4_ = (uint)bVar18 * auVar110._0_4_ | (uint)!bVar18 * auVar117._0_4_;
        bVar18 = (bool)((byte)(uVar91 >> 1) & 1);
        auVar145._4_4_ = (uint)bVar18 * auVar110._4_4_ | (uint)!bVar18 * auVar117._4_4_;
        bVar18 = (bool)((byte)(uVar91 >> 2) & 1);
        auVar145._8_4_ = (uint)bVar18 * auVar110._8_4_ | (uint)!bVar18 * auVar117._8_4_;
        bVar18 = (bool)((byte)(uVar91 >> 3) & 1);
        auVar145._12_4_ = (uint)bVar18 * auVar110._12_4_ | (uint)!bVar18 * auVar117._12_4_;
        bVar18 = (bool)((byte)(uVar91 >> 4) & 1);
        auVar145._16_4_ = (uint)bVar18 * auVar110._16_4_ | (uint)!bVar18 * auVar117._16_4_;
        bVar18 = (bool)((byte)(uVar91 >> 5) & 1);
        auVar145._20_4_ = (uint)bVar18 * auVar110._20_4_ | (uint)!bVar18 * auVar117._20_4_;
        bVar18 = (bool)((byte)(uVar91 >> 6) & 1);
        auVar145._24_4_ = (uint)bVar18 * auVar110._24_4_ | (uint)!bVar18 * auVar117._24_4_;
        bVar18 = SUB81(uVar91 >> 7,0);
        auVar145._28_4_ = (uint)bVar18 * auVar110._28_4_ | (uint)!bVar18 * auVar117._28_4_;
        auVar231._8_4_ = 0xff800000;
        auVar231._0_8_ = 0xff800000ff800000;
        auVar231._12_4_ = 0xff800000;
        auVar231._16_4_ = 0xff800000;
        auVar231._20_4_ = 0xff800000;
        auVar231._24_4_ = 0xff800000;
        auVar231._28_4_ = 0xff800000;
        auVar110 = vblendmps_avx512vl(auVar231,auVar62);
        bVar18 = (bool)((byte)uVar91 & 1);
        auVar146._0_4_ = (uint)bVar18 * auVar110._0_4_ | (uint)!bVar18 * -0x800000;
        bVar18 = (bool)((byte)(uVar91 >> 1) & 1);
        auVar146._4_4_ = (uint)bVar18 * auVar110._4_4_ | (uint)!bVar18 * -0x800000;
        bVar18 = (bool)((byte)(uVar91 >> 2) & 1);
        auVar146._8_4_ = (uint)bVar18 * auVar110._8_4_ | (uint)!bVar18 * -0x800000;
        bVar18 = (bool)((byte)(uVar91 >> 3) & 1);
        auVar146._12_4_ = (uint)bVar18 * auVar110._12_4_ | (uint)!bVar18 * -0x800000;
        bVar18 = (bool)((byte)(uVar91 >> 4) & 1);
        auVar146._16_4_ = (uint)bVar18 * auVar110._16_4_ | (uint)!bVar18 * -0x800000;
        bVar18 = (bool)((byte)(uVar91 >> 5) & 1);
        auVar146._20_4_ = (uint)bVar18 * auVar110._20_4_ | (uint)!bVar18 * -0x800000;
        bVar18 = (bool)((byte)(uVar91 >> 6) & 1);
        auVar146._24_4_ = (uint)bVar18 * auVar110._24_4_ | (uint)!bVar18 * -0x800000;
        bVar18 = SUB81(uVar91 >> 7,0);
        auVar146._28_4_ = (uint)bVar18 * auVar110._28_4_ | (uint)!bVar18 * -0x800000;
        auVar277._8_4_ = 0x7fffffff;
        auVar277._0_8_ = 0x7fffffff7fffffff;
        auVar277._12_4_ = 0x7fffffff;
        auVar277._16_4_ = 0x7fffffff;
        auVar277._20_4_ = 0x7fffffff;
        auVar277._24_4_ = 0x7fffffff;
        auVar277._28_4_ = 0x7fffffff;
        auVar110 = vandps_avx(auVar277,local_900);
        auVar110 = vmaxps_avx(local_7c0,auVar110);
        auVar50._8_4_ = 0x36000000;
        auVar50._0_8_ = 0x3600000036000000;
        auVar50._12_4_ = 0x36000000;
        auVar50._16_4_ = 0x36000000;
        auVar50._20_4_ = 0x36000000;
        auVar50._24_4_ = 0x36000000;
        auVar50._28_4_ = 0x36000000;
        auVar111 = vmulps_avx512vl(auVar110,auVar50);
        auVar110 = vandps_avx(auVar112,auVar277);
        uVar88 = vcmpps_avx512vl(auVar110,auVar111,1);
        uVar91 = uVar91 & uVar88;
        bVar81 = (byte)uVar91;
        if (bVar81 != 0) {
          uVar88 = vcmpps_avx512vl(auVar113,ZEXT1632(auVar100),2);
          auVar278._8_4_ = 0xff800000;
          auVar278._0_8_ = 0xff800000ff800000;
          auVar278._12_4_ = 0xff800000;
          auVar278._16_4_ = 0xff800000;
          auVar278._20_4_ = 0xff800000;
          auVar278._24_4_ = 0xff800000;
          auVar278._28_4_ = 0xff800000;
          auVar285._8_4_ = 0x7f800000;
          auVar285._0_8_ = 0x7f8000007f800000;
          auVar285._12_4_ = 0x7f800000;
          auVar285._16_4_ = 0x7f800000;
          auVar285._20_4_ = 0x7f800000;
          auVar285._24_4_ = 0x7f800000;
          auVar285._28_4_ = 0x7f800000;
          auVar110 = vblendmps_avx512vl(auVar285,auVar278);
          bVar85 = (byte)uVar88;
          uVar84 = (uint)(bVar85 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar111._0_4_;
          bVar18 = (bool)((byte)(uVar88 >> 1) & 1);
          uVar158 = (uint)bVar18 * auVar110._4_4_ | (uint)!bVar18 * auVar111._4_4_;
          bVar18 = (bool)((byte)(uVar88 >> 2) & 1);
          uVar159 = (uint)bVar18 * auVar110._8_4_ | (uint)!bVar18 * auVar111._8_4_;
          bVar18 = (bool)((byte)(uVar88 >> 3) & 1);
          uVar160 = (uint)bVar18 * auVar110._12_4_ | (uint)!bVar18 * auVar111._12_4_;
          bVar18 = (bool)((byte)(uVar88 >> 4) & 1);
          uVar161 = (uint)bVar18 * auVar110._16_4_ | (uint)!bVar18 * auVar111._16_4_;
          bVar18 = (bool)((byte)(uVar88 >> 5) & 1);
          uVar162 = (uint)bVar18 * auVar110._20_4_ | (uint)!bVar18 * auVar111._20_4_;
          bVar18 = (bool)((byte)(uVar88 >> 6) & 1);
          uVar163 = (uint)bVar18 * auVar110._24_4_ | (uint)!bVar18 * auVar111._24_4_;
          bVar18 = SUB81(uVar88 >> 7,0);
          uVar164 = (uint)bVar18 * auVar110._28_4_ | (uint)!bVar18 * auVar111._28_4_;
          auVar145._0_4_ = (bVar81 & 1) * uVar84 | !(bool)(bVar81 & 1) * auVar145._0_4_;
          bVar18 = (bool)((byte)(uVar91 >> 1) & 1);
          auVar145._4_4_ = bVar18 * uVar158 | !bVar18 * auVar145._4_4_;
          bVar18 = (bool)((byte)(uVar91 >> 2) & 1);
          auVar145._8_4_ = bVar18 * uVar159 | !bVar18 * auVar145._8_4_;
          bVar18 = (bool)((byte)(uVar91 >> 3) & 1);
          auVar145._12_4_ = bVar18 * uVar160 | !bVar18 * auVar145._12_4_;
          bVar18 = (bool)((byte)(uVar91 >> 4) & 1);
          auVar145._16_4_ = bVar18 * uVar161 | !bVar18 * auVar145._16_4_;
          bVar18 = (bool)((byte)(uVar91 >> 5) & 1);
          auVar145._20_4_ = bVar18 * uVar162 | !bVar18 * auVar145._20_4_;
          bVar18 = (bool)((byte)(uVar91 >> 6) & 1);
          auVar145._24_4_ = bVar18 * uVar163 | !bVar18 * auVar145._24_4_;
          bVar18 = SUB81(uVar91 >> 7,0);
          auVar145._28_4_ = bVar18 * uVar164 | !bVar18 * auVar145._28_4_;
          auVar110 = vblendmps_avx512vl(auVar278,auVar285);
          bVar18 = (bool)((byte)(uVar88 >> 1) & 1);
          bVar19 = (bool)((byte)(uVar88 >> 2) & 1);
          bVar20 = (bool)((byte)(uVar88 >> 3) & 1);
          bVar21 = (bool)((byte)(uVar88 >> 4) & 1);
          bVar22 = (bool)((byte)(uVar88 >> 5) & 1);
          bVar23 = (bool)((byte)(uVar88 >> 6) & 1);
          bVar24 = SUB81(uVar88 >> 7,0);
          auVar146._0_4_ =
               (uint)(bVar81 & 1) *
               ((uint)(bVar85 & 1) * auVar110._0_4_ | !(bool)(bVar85 & 1) * uVar84) |
               !(bool)(bVar81 & 1) * auVar146._0_4_;
          bVar90 = (bool)((byte)(uVar91 >> 1) & 1);
          auVar146._4_4_ =
               (uint)bVar90 * ((uint)bVar18 * auVar110._4_4_ | !bVar18 * uVar158) |
               !bVar90 * auVar146._4_4_;
          bVar18 = (bool)((byte)(uVar91 >> 2) & 1);
          auVar146._8_4_ =
               (uint)bVar18 * ((uint)bVar19 * auVar110._8_4_ | !bVar19 * uVar159) |
               !bVar18 * auVar146._8_4_;
          bVar18 = (bool)((byte)(uVar91 >> 3) & 1);
          auVar146._12_4_ =
               (uint)bVar18 * ((uint)bVar20 * auVar110._12_4_ | !bVar20 * uVar160) |
               !bVar18 * auVar146._12_4_;
          bVar18 = (bool)((byte)(uVar91 >> 4) & 1);
          auVar146._16_4_ =
               (uint)bVar18 * ((uint)bVar21 * auVar110._16_4_ | !bVar21 * uVar161) |
               !bVar18 * auVar146._16_4_;
          bVar18 = (bool)((byte)(uVar91 >> 5) & 1);
          auVar146._20_4_ =
               (uint)bVar18 * ((uint)bVar22 * auVar110._20_4_ | !bVar22 * uVar162) |
               !bVar18 * auVar146._20_4_;
          bVar18 = (bool)((byte)(uVar91 >> 6) & 1);
          auVar146._24_4_ =
               (uint)bVar18 * ((uint)bVar23 * auVar110._24_4_ | !bVar23 * uVar163) |
               !bVar18 * auVar146._24_4_;
          bVar18 = SUB81(uVar91 >> 7,0);
          auVar146._28_4_ =
               (uint)bVar18 * ((uint)bVar24 * auVar110._28_4_ | !bVar24 * uVar164) |
               !bVar18 * auVar146._28_4_;
          bVar86 = (~bVar81 | bVar85) & bVar86;
        }
      }
      auVar284._8_4_ = 0x7fffffff;
      auVar284._0_8_ = 0x7fffffff7fffffff;
      auVar284._12_4_ = 0x7fffffff;
      auVar109 = vmulps_avx512vl(local_ac0,auVar109);
      auVar120 = vfmadd231ps_avx512vl(auVar109,auVar108,auVar120);
      auVar157._0_32_ = vfmadd231ps_avx512vl(auVar120,auVar107,auVar115);
      _local_500 = _local_920;
      local_4e0 = vminps_avx(local_780,auVar145);
      auVar241 = ZEXT3264(local_4e0);
      auVar266._8_4_ = 0x7fffffff;
      auVar266._0_8_ = 0x7fffffff7fffffff;
      auVar266._12_4_ = 0x7fffffff;
      auVar266._16_4_ = 0x7fffffff;
      auVar266._20_4_ = 0x7fffffff;
      auVar266._24_4_ = 0x7fffffff;
      auVar266._28_4_ = 0x7fffffff;
      auVar120 = vandps_avx(auVar157._0_32_,auVar266);
      auVar251 = ZEXT3264(auVar120);
      _local_880 = vmaxps_avx(_local_920,auVar146);
      _local_7a0 = _local_880;
      auVar232._8_4_ = 0x3e99999a;
      auVar232._0_8_ = 0x3e99999a3e99999a;
      auVar232._12_4_ = 0x3e99999a;
      auVar232._16_4_ = 0x3e99999a;
      auVar232._20_4_ = 0x3e99999a;
      auVar232._24_4_ = 0x3e99999a;
      auVar232._28_4_ = 0x3e99999a;
      uVar34 = vcmpps_avx512vl(auVar120,auVar232,1);
      uVar35 = vcmpps_avx512vl(_local_920,local_4e0,2);
      bVar81 = (byte)uVar35 & bVar83;
      uVar36 = vcmpps_avx512vl(_local_880,local_780,2);
      if ((bVar83 & ((byte)uVar36 | (byte)uVar35)) == 0) {
        auVar189 = ZEXT3264(auVar266);
        auVar281 = ZEXT3264(_DAT_02020f20);
      }
      else {
        auVar120 = vmulps_avx512vl(local_ac0,auVar114);
        auVar120 = vfmadd213ps_avx512vl(auVar121,auVar108,auVar120);
        auVar120 = vfmadd213ps_avx512vl(auVar116,auVar107,auVar120);
        auVar120 = vandps_avx(auVar120,auVar266);
        uVar35 = vcmpps_avx512vl(auVar120,auVar232,1);
        bVar85 = (byte)uVar35 | ~bVar86;
        auVar184._8_4_ = 2;
        auVar184._0_8_ = 0x200000002;
        auVar184._12_4_ = 2;
        auVar184._16_4_ = 2;
        auVar184._20_4_ = 2;
        auVar184._24_4_ = 2;
        auVar184._28_4_ = 2;
        auVar51._8_4_ = 3;
        auVar51._0_8_ = 0x300000003;
        auVar51._12_4_ = 3;
        auVar51._16_4_ = 3;
        auVar51._20_4_ = 3;
        auVar51._24_4_ = 3;
        auVar51._28_4_ = 3;
        auVar120 = vpblendmd_avx512vl(auVar184,auVar51);
        local_760._0_4_ = (uint)(bVar85 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar85 & 1) * 2;
        bVar18 = (bool)(bVar85 >> 1 & 1);
        local_760._4_4_ = (uint)bVar18 * auVar120._4_4_ | (uint)!bVar18 * 2;
        bVar18 = (bool)(bVar85 >> 2 & 1);
        local_760._8_4_ = (uint)bVar18 * auVar120._8_4_ | (uint)!bVar18 * 2;
        bVar18 = (bool)(bVar85 >> 3 & 1);
        local_760._12_4_ = (uint)bVar18 * auVar120._12_4_ | (uint)!bVar18 * 2;
        bVar18 = (bool)(bVar85 >> 4 & 1);
        local_760._16_4_ = (uint)bVar18 * auVar120._16_4_ | (uint)!bVar18 * 2;
        bVar18 = (bool)(bVar85 >> 5 & 1);
        local_760._20_4_ = (uint)bVar18 * auVar120._20_4_ | (uint)!bVar18 * 2;
        bVar18 = (bool)(bVar85 >> 6 & 1);
        local_760._24_4_ = (uint)bVar18 * auVar120._24_4_ | (uint)!bVar18 * 2;
        local_760._28_4_ = (uint)(bVar85 >> 7) * auVar120._28_4_ | (uint)!(bool)(bVar85 >> 7) * 2;
        auVar241._0_32_ = vpbroadcastd_avx512vl();
        auVar241._32_32_ = auVar157._32_32_;
        local_7e0 = auVar241._0_32_;
        uVar35 = vpcmpd_avx512vl(auVar241._0_32_,local_760,5);
        bVar85 = (byte)uVar35 & bVar81;
        if (bVar85 != 0) {
          auVar100 = vminps_avx(local_940._0_16_,local_980._0_16_);
          auVar99 = vmaxps_avx(local_940._0_16_,local_980._0_16_);
          auVar101 = vminps_avx(local_960._0_16_,local_9a0._0_16_);
          auVar102 = vminps_avx(auVar100,auVar101);
          auVar100 = vmaxps_avx(local_960._0_16_,local_9a0._0_16_);
          auVar101 = vmaxps_avx(auVar99,auVar100);
          auVar99 = vandps_avx(auVar284,auVar102);
          auVar100 = vandps_avx(auVar284,auVar101);
          auVar99 = vmaxps_avx(auVar99,auVar100);
          auVar100 = vmovshdup_avx(auVar99);
          auVar100 = vmaxss_avx(auVar100,auVar99);
          auVar99 = vshufpd_avx(auVar99,auVar99,1);
          auVar99 = vmaxss_avx(auVar99,auVar100);
          fVar259 = auVar99._0_4_ * 1.9073486e-06;
          local_a10 = vshufps_avx(auVar101,auVar101,0xff);
          local_860 = (float)local_920._0_4_ + (float)local_a40._0_4_;
          fStack_85c = (float)local_920._4_4_ + (float)local_a40._4_4_;
          fStack_858 = fStack_918 + fStack_a38;
          fStack_854 = fStack_914 + fStack_a34;
          fStack_850 = fStack_910 + fStack_a30;
          fStack_84c = fStack_90c + fStack_a2c;
          fStack_848 = fStack_908 + fStack_a28;
          fStack_844 = fStack_904 + fStack_a24;
          do {
            auVar185._8_4_ = 0x7f800000;
            auVar185._0_8_ = 0x7f8000007f800000;
            auVar185._12_4_ = 0x7f800000;
            auVar185._16_4_ = 0x7f800000;
            auVar185._20_4_ = 0x7f800000;
            auVar185._24_4_ = 0x7f800000;
            auVar185._28_4_ = 0x7f800000;
            auVar157._32_32_ = vblendmps_avx512vl(auVar185,_local_920);
            auVar148._0_4_ =
                 (uint)(bVar85 & 1) * auVar157._32_4_ | (uint)!(bool)(bVar85 & 1) * 0x7f800000;
            bVar18 = (bool)(bVar85 >> 1 & 1);
            auVar148._4_4_ = (uint)bVar18 * auVar157._36_4_ | (uint)!bVar18 * 0x7f800000;
            bVar18 = (bool)(bVar85 >> 2 & 1);
            auVar148._8_4_ = (uint)bVar18 * auVar157._40_4_ | (uint)!bVar18 * 0x7f800000;
            bVar18 = (bool)(bVar85 >> 3 & 1);
            auVar148._12_4_ = (uint)bVar18 * auVar157._44_4_ | (uint)!bVar18 * 0x7f800000;
            bVar18 = (bool)(bVar85 >> 4 & 1);
            auVar148._16_4_ = (uint)bVar18 * auVar157._48_4_ | (uint)!bVar18 * 0x7f800000;
            bVar18 = (bool)(bVar85 >> 5 & 1);
            auVar148._20_4_ = (uint)bVar18 * auVar157._52_4_ | (uint)!bVar18 * 0x7f800000;
            auVar148._24_4_ =
                 (uint)(bVar85 >> 6) * auVar157._56_4_ | (uint)!(bool)(bVar85 >> 6) * 0x7f800000;
            auVar148._28_4_ = 0x7f800000;
            auVar241._0_32_ = auVar148;
            auVar157._32_32_ = vshufps_avx(auVar148,auVar148,0xb1);
            auVar157._32_32_ = vminps_avx(auVar148,auVar157._32_32_);
            auVar120 = vshufpd_avx(auVar157._32_32_,auVar157._32_32_,5);
            auVar157._32_32_ = vminps_avx(auVar157._32_32_,auVar120);
            auVar120 = vpermpd_avx2(auVar157._32_32_,0x4e);
            auVar157._32_32_ = vminps_avx(auVar157._32_32_,auVar120);
            uVar35 = vcmpps_avx512vl(auVar148,auVar157._32_32_,0);
            bVar78 = (byte)uVar35 & bVar85;
            bVar79 = bVar85;
            if (bVar78 != 0) {
              bVar79 = bVar78;
            }
            iVar2 = 0;
            for (uVar84 = (uint)bVar79; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
              iVar2 = iVar2 + 1;
            }
            fVar267 = *(float *)(local_820 + (uint)(iVar2 << 2));
            fVar268 = *(float *)(local_500 + (uint)(iVar2 << 2));
            fVar270 = auVar95._0_4_;
            if ((float)local_a60._0_4_ < 0.0) {
              fVar270 = sqrtf((float)local_a60._0_4_);
            }
            lVar89 = 4;
            do {
              auVar170._4_4_ = fVar268;
              auVar170._0_4_ = fVar268;
              auVar170._8_4_ = fVar268;
              auVar170._12_4_ = fVar268;
              auVar100 = vfmadd132ps_fma(auVar170,ZEXT816(0) << 0x40,local_a50);
              fVar282 = 1.0 - fVar267;
              auVar218._0_4_ = local_980._0_4_ * fVar267;
              auVar218._4_4_ = local_980._4_4_ * fVar267;
              auVar218._8_4_ = local_980._8_4_ * fVar267;
              auVar218._12_4_ = local_980._12_4_ * fVar267;
              local_900._0_16_ = ZEXT416((uint)fVar282);
              auVar238._4_4_ = fVar282;
              auVar238._0_4_ = fVar282;
              auVar238._8_4_ = fVar282;
              auVar238._12_4_ = fVar282;
              auVar99 = vfmadd231ps_fma(auVar218,auVar238,local_940._0_16_);
              auVar245._0_4_ = local_960._0_4_ * fVar267;
              auVar245._4_4_ = local_960._4_4_ * fVar267;
              auVar245._8_4_ = local_960._8_4_ * fVar267;
              auVar245._12_4_ = local_960._12_4_ * fVar267;
              auVar101 = vfmadd231ps_fma(auVar245,auVar238,local_980._0_16_);
              auVar256._0_4_ = fVar267 * (float)local_9a0._0_4_;
              auVar256._4_4_ = fVar267 * (float)local_9a0._4_4_;
              auVar256._8_4_ = fVar267 * fStack_998;
              auVar256._12_4_ = fVar267 * fStack_994;
              auVar102 = vfmadd231ps_fma(auVar256,auVar238,local_960._0_16_);
              auVar264._0_4_ = fVar267 * auVar101._0_4_;
              auVar264._4_4_ = fVar267 * auVar101._4_4_;
              auVar264._8_4_ = fVar267 * auVar101._8_4_;
              auVar264._12_4_ = fVar267 * auVar101._12_4_;
              auVar99 = vfmadd231ps_fma(auVar264,auVar238,auVar99);
              auVar219._0_4_ = fVar267 * auVar102._0_4_;
              auVar219._4_4_ = fVar267 * auVar102._4_4_;
              auVar219._8_4_ = fVar267 * auVar102._8_4_;
              auVar219._12_4_ = fVar267 * auVar102._12_4_;
              auVar101 = vfmadd231ps_fma(auVar219,auVar238,auVar101);
              auVar246._0_4_ = fVar267 * auVar101._0_4_;
              auVar246._4_4_ = fVar267 * auVar101._4_4_;
              auVar246._8_4_ = fVar267 * auVar101._8_4_;
              auVar246._12_4_ = fVar267 * auVar101._12_4_;
              auVar102 = vfmadd231ps_fma(auVar246,auVar99,auVar238);
              auVar99 = vsubps_avx(auVar101,auVar99);
              auVar41._8_4_ = 0x40400000;
              auVar41._0_8_ = 0x4040000040400000;
              auVar41._12_4_ = 0x40400000;
              auVar157._32_32_ = auVar241._32_32_;
              auVar101 = vmulps_avx512vl(auVar99,auVar41);
              local_8e0._0_16_ = auVar102;
              auVar99 = vsubps_avx(auVar100,auVar102);
              local_a80._0_16_ = auVar99;
              auVar99 = vdpps_avx(auVar99,auVar99,0x7f);
              local_aa0._0_16_ = auVar99;
              local_be0 = ZEXT416((uint)fVar267);
              if (auVar99._0_4_ < 0.0) {
                auVar251._0_4_ = sqrtf(auVar99._0_4_);
                auVar251._4_60_ = extraout_var;
                auVar99 = auVar251._0_16_;
              }
              else {
                auVar99 = vsqrtss_avx(auVar99,auVar99);
              }
              local_9c0 = vdpps_avx(auVar101,auVar101,0x7f);
              fVar282 = local_9c0._0_4_;
              auVar220._4_12_ = ZEXT812(0) << 0x20;
              auVar220._0_4_ = fVar282;
              auVar100 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar220);
              fVar193 = auVar100._0_4_;
              local_9d0 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar220);
              auVar42._8_4_ = 0x80000000;
              auVar42._0_8_ = 0x8000000080000000;
              auVar42._12_4_ = 0x80000000;
              auVar102 = vxorps_avx512vl(local_9c0,auVar42);
              auVar100 = vfnmadd213ss_fma(local_9d0,local_9c0,ZEXT416(0x40000000));
              uVar84 = auVar99._0_4_;
              if (fVar282 < auVar102._0_4_) {
                auVar287._0_4_ = sqrtf(fVar282);
                auVar287._4_60_ = extraout_var_00;
                auVar99 = ZEXT416(uVar84);
                auVar102 = auVar287._0_16_;
              }
              else {
                auVar102 = vsqrtss_avx512f(local_9c0,local_9c0);
              }
              fVar282 = fVar193 * 1.5 + fVar282 * -0.5 * fVar193 * fVar193 * fVar193;
              auVar171._0_4_ = auVar101._0_4_ * fVar282;
              auVar171._4_4_ = auVar101._4_4_ * fVar282;
              auVar171._8_4_ = auVar101._8_4_ * fVar282;
              auVar171._12_4_ = auVar101._12_4_ * fVar282;
              auVar33 = vdpps_avx(local_a80._0_16_,auVar171,0x7f);
              fVar273 = auVar99._0_4_;
              fVar193 = auVar33._0_4_;
              auVar172._0_4_ = fVar193 * fVar193;
              auVar172._4_4_ = auVar33._4_4_ * auVar33._4_4_;
              auVar172._8_4_ = auVar33._8_4_ * auVar33._8_4_;
              auVar172._12_4_ = auVar33._12_4_ * auVar33._12_4_;
              auVar103 = vsubps_avx512vl(local_aa0._0_16_,auVar172);
              fVar272 = auVar103._0_4_;
              auVar197._4_12_ = ZEXT812(0) << 0x20;
              auVar197._0_4_ = fVar272;
              auVar97 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar197);
              auVar104 = vmulss_avx512f(auVar97,ZEXT416(0x3fc00000));
              auVar105 = vmulss_avx512f(auVar103,ZEXT416(0xbf000000));
              if (fVar272 < 0.0) {
                local_9f0 = fVar282;
                fStack_9ec = fVar282;
                fStack_9e8 = fVar282;
                fStack_9e4 = fVar282;
                local_9e0 = auVar97;
                fVar272 = sqrtf(fVar272);
                auVar105 = ZEXT416(auVar105._0_4_);
                auVar104 = ZEXT416(auVar104._0_4_);
                auVar102 = ZEXT416(auVar102._0_4_);
                auVar99 = ZEXT416(uVar84);
                auVar97 = local_9e0;
                fVar282 = local_9f0;
                fVar274 = fStack_9ec;
                fVar269 = fStack_9e8;
                fVar271 = fStack_9e4;
              }
              else {
                auVar103 = vsqrtss_avx(auVar103,auVar103);
                fVar272 = auVar103._0_4_;
                fVar274 = fVar282;
                fVar269 = fVar282;
                fVar271 = fVar282;
              }
              auVar284._8_4_ = 0x7fffffff;
              auVar284._0_8_ = 0x7fffffff7fffffff;
              auVar284._12_4_ = 0x7fffffff;
              auVar151._32_32_ = auVar157._32_32_;
              auVar151._0_32_ = local_ac0;
              auVar287 = ZEXT3264(local_ac0);
              auVar103 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_be0,local_900._0_16_);
              fVar192 = auVar103._0_4_ * 6.0;
              fVar32 = fVar267 * 6.0;
              auVar221._0_4_ = fVar32 * (float)local_9a0._0_4_;
              auVar221._4_4_ = fVar32 * (float)local_9a0._4_4_;
              auVar221._8_4_ = fVar32 * fStack_998;
              auVar221._12_4_ = fVar32 * fStack_994;
              auVar198._4_4_ = fVar192;
              auVar198._0_4_ = fVar192;
              auVar198._8_4_ = fVar192;
              auVar198._12_4_ = fVar192;
              auVar103 = vfmadd132ps_fma(auVar198,auVar221,local_960._0_16_);
              auVar98 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_900._0_16_,local_be0);
              fVar192 = auVar98._0_4_ * 6.0;
              auVar222._4_4_ = fVar192;
              auVar222._0_4_ = fVar192;
              auVar222._8_4_ = fVar192;
              auVar222._12_4_ = fVar192;
              auVar103 = vfmadd132ps_fma(auVar222,auVar103,local_980._0_16_);
              fVar192 = local_900._0_4_ * 6.0;
              auVar199._4_4_ = fVar192;
              auVar199._0_4_ = fVar192;
              auVar199._8_4_ = fVar192;
              auVar199._12_4_ = fVar192;
              auVar103 = vfmadd132ps_fma(auVar199,auVar103,local_940._0_16_);
              auVar223._0_4_ = auVar103._0_4_ * (float)local_9c0._0_4_;
              auVar223._4_4_ = auVar103._4_4_ * (float)local_9c0._0_4_;
              auVar223._8_4_ = auVar103._8_4_ * (float)local_9c0._0_4_;
              auVar223._12_4_ = auVar103._12_4_ * (float)local_9c0._0_4_;
              auVar103 = vdpps_avx(auVar101,auVar103,0x7f);
              fVar192 = auVar103._0_4_;
              auVar200._0_4_ = auVar101._0_4_ * fVar192;
              auVar200._4_4_ = auVar101._4_4_ * fVar192;
              auVar200._8_4_ = auVar101._8_4_ * fVar192;
              auVar200._12_4_ = auVar101._12_4_ * fVar192;
              auVar103 = vsubps_avx(auVar223,auVar200);
              fVar192 = auVar100._0_4_ * (float)local_9d0._0_4_;
              auVar43._8_4_ = 0x80000000;
              auVar43._0_8_ = 0x8000000080000000;
              auVar43._12_4_ = 0x80000000;
              auVar241._16_48_ = auVar151._16_48_;
              auVar106 = vxorps_avx512vl(auVar101,auVar43);
              auVar247._0_4_ = fVar282 * auVar103._0_4_ * fVar192;
              auVar247._4_4_ = fVar274 * auVar103._4_4_ * fVar192;
              auVar247._8_4_ = fVar269 * auVar103._8_4_ * fVar192;
              auVar247._12_4_ = fVar271 * auVar103._12_4_ * fVar192;
              auVar100 = vdpps_avx(auVar106,auVar171,0x7f);
              auVar103 = vmaxss_avx(ZEXT416((uint)fVar259),
                                    ZEXT416((uint)(fVar268 * fVar270 * 1.9073486e-06)));
              auVar98 = vdivss_avx512f(ZEXT416((uint)fVar259),auVar102);
              auVar102 = vdpps_avx(local_a80._0_16_,auVar247,0x7f);
              auVar99 = vfmadd213ss_fma(auVar99,ZEXT416((uint)fVar259),auVar103);
              auVar98 = vfmadd213ss_fma(ZEXT416((uint)(fVar273 + 1.0)),auVar98,auVar99);
              auVar99 = vdpps_avx(local_a50,auVar171,0x7f);
              fVar282 = auVar100._0_4_ + auVar102._0_4_;
              auVar100 = vdpps_avx(local_a80._0_16_,auVar106,0x7f);
              auVar105 = vmulss_avx512f(auVar105,auVar97);
              auVar97 = vmulss_avx512f(auVar97,auVar97);
              auVar102 = vdpps_avx(local_a80._0_16_,local_a50,0x7f);
              auVar241._0_16_ =
                   vaddss_avx512f(auVar104,ZEXT416((uint)(auVar105._0_4_ * auVar97._0_4_)));
              auVar97 = vfnmadd231ss_fma(auVar100,auVar33,ZEXT416((uint)fVar282));
              auVar104 = vfnmadd231ss_fma(auVar102,auVar33,auVar99);
              auVar100 = vpermilps_avx(local_8e0._0_16_,0xff);
              fVar272 = fVar272 - auVar100._0_4_;
              auVar100 = vshufps_avx(auVar101,auVar101,0xff);
              auVar102 = vfmsub213ss_fma(auVar97,auVar241._0_16_,auVar100);
              fVar273 = auVar104._0_4_ * auVar241._0_4_;
              auVar97 = vfmsub231ss_fma(ZEXT416((uint)(auVar99._0_4_ * auVar102._0_4_)),
                                        ZEXT416((uint)fVar282),ZEXT416((uint)fVar273));
              fVar274 = auVar97._0_4_;
              fVar282 = fVar272 * (fVar282 / fVar274) - fVar193 * (auVar102._0_4_ / fVar274);
              auVar251 = ZEXT464((uint)fVar282);
              fVar267 = fVar267 - (fVar193 * (fVar273 / fVar274) -
                                  fVar272 * (auVar99._0_4_ / fVar274));
              fVar268 = fVar268 - fVar282;
              auVar99 = vandps_avx(auVar33,auVar284);
              if (auVar98._0_4_ <= auVar99._0_4_) {
LAB_01c06807:
                bVar18 = false;
              }
              else {
                auVar102 = vfmadd231ss_fma(ZEXT416((uint)(auVar98._0_4_ + auVar103._0_4_)),local_a10
                                           ,ZEXT416(0x36000000));
                auVar99 = vandps_avx(auVar284,ZEXT416((uint)fVar272));
                if (auVar102._0_4_ <= auVar99._0_4_) goto LAB_01c06807;
                fVar268 = fVar268 + (float)local_a00._0_4_;
                bVar18 = true;
                if (fVar165 <= fVar268) {
                  fVar282 = *(float *)(ray + k * 4 + 0x200);
                  auVar251 = ZEXT464((uint)fVar282);
                  if (((fVar268 <= fVar282) && (0.0 <= fVar267)) && (fVar267 <= 1.0)) {
                    auVar153._16_48_ = auVar241._16_48_;
                    auVar153._0_16_ = ZEXT816(0) << 0x20;
                    auVar152._4_60_ = auVar153._4_60_;
                    auVar152._0_4_ = local_aa0._0_4_;
                    auVar99 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar152._0_16_);
                    fVar193 = auVar99._0_4_;
                    auVar241._0_16_ = vmulss_avx512f(local_aa0._0_16_,ZEXT416(0xbf000000));
                    pGVar12 = (context->scene->geometries).items[uVar82].ptr;
                    if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
LAB_01c06ad6:
                      auVar251 = ZEXT464((uint)fVar282);
                    }
                    else {
                      fVar193 = fVar193 * 1.5 + auVar241._0_4_ * fVar193 * fVar193 * fVar193;
                      auVar201._0_4_ = local_a80._0_4_ * fVar193;
                      auVar201._4_4_ = local_a80._4_4_ * fVar193;
                      auVar201._8_4_ = local_a80._8_4_ * fVar193;
                      auVar201._12_4_ = local_a80._12_4_ * fVar193;
                      auVar102 = vfmadd213ps_fma(auVar100,auVar201,auVar101);
                      auVar99 = vshufps_avx(auVar201,auVar201,0xc9);
                      auVar100 = vshufps_avx(auVar101,auVar101,0xc9);
                      auVar202._0_4_ = auVar201._0_4_ * auVar100._0_4_;
                      auVar202._4_4_ = auVar201._4_4_ * auVar100._4_4_;
                      auVar202._8_4_ = auVar201._8_4_ * auVar100._8_4_;
                      auVar202._12_4_ = auVar201._12_4_ * auVar100._12_4_;
                      auVar101 = vfmsub231ps_fma(auVar202,auVar101,auVar99);
                      auVar99 = vshufps_avx(auVar101,auVar101,0xc9);
                      auVar100 = vshufps_avx(auVar102,auVar102,0xc9);
                      auVar101 = vshufps_avx(auVar101,auVar101,0xd2);
                      auVar173._0_4_ = auVar102._0_4_ * auVar101._0_4_;
                      auVar173._4_4_ = auVar102._4_4_ * auVar101._4_4_;
                      auVar173._8_4_ = auVar102._8_4_ * auVar101._8_4_;
                      auVar173._12_4_ = auVar102._12_4_ * auVar101._12_4_;
                      auVar99 = vfmsub231ps_fma(auVar173,auVar99,auVar100);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x200) = fVar268;
                        uVar283 = vextractps_avx(auVar99,1);
                        *(undefined4 *)(ray + k * 4 + 0x300) = uVar283;
                        uVar283 = vextractps_avx(auVar99,2);
                        *(undefined4 *)(ray + k * 4 + 0x340) = uVar283;
                        *(int *)(ray + k * 4 + 0x380) = auVar99._0_4_;
                        *(float *)(ray + k * 4 + 0x3c0) = fVar267;
                        *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                        *(uint *)(ray + k * 4 + 0x440) = uVar11;
                        *(uint *)(ray + k * 4 + 0x480) = uVar82;
                        *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar16 = context->user;
                        local_340 = vbroadcastss_avx512f(ZEXT416((uint)fVar267));
                        auVar189 = vbroadcastss_avx512f(ZEXT416(1));
                        auVar189 = vpermps_avx512f(auVar189,ZEXT1664(auVar99));
                        auVar281 = vbroadcastss_avx512f(ZEXT416(2));
                        local_3c0 = vpermps_avx512f(auVar281,ZEXT1664(auVar99));
                        local_380 = vbroadcastss_avx512f(auVar99);
                        local_400[0] = (RTCHitN)auVar189[0];
                        local_400[1] = (RTCHitN)auVar189[1];
                        local_400[2] = (RTCHitN)auVar189[2];
                        local_400[3] = (RTCHitN)auVar189[3];
                        local_400[4] = (RTCHitN)auVar189[4];
                        local_400[5] = (RTCHitN)auVar189[5];
                        local_400[6] = (RTCHitN)auVar189[6];
                        local_400[7] = (RTCHitN)auVar189[7];
                        local_400[8] = (RTCHitN)auVar189[8];
                        local_400[9] = (RTCHitN)auVar189[9];
                        local_400[10] = (RTCHitN)auVar189[10];
                        local_400[0xb] = (RTCHitN)auVar189[0xb];
                        local_400[0xc] = (RTCHitN)auVar189[0xc];
                        local_400[0xd] = (RTCHitN)auVar189[0xd];
                        local_400[0xe] = (RTCHitN)auVar189[0xe];
                        local_400[0xf] = (RTCHitN)auVar189[0xf];
                        local_400[0x10] = (RTCHitN)auVar189[0x10];
                        local_400[0x11] = (RTCHitN)auVar189[0x11];
                        local_400[0x12] = (RTCHitN)auVar189[0x12];
                        local_400[0x13] = (RTCHitN)auVar189[0x13];
                        local_400[0x14] = (RTCHitN)auVar189[0x14];
                        local_400[0x15] = (RTCHitN)auVar189[0x15];
                        local_400[0x16] = (RTCHitN)auVar189[0x16];
                        local_400[0x17] = (RTCHitN)auVar189[0x17];
                        local_400[0x18] = (RTCHitN)auVar189[0x18];
                        local_400[0x19] = (RTCHitN)auVar189[0x19];
                        local_400[0x1a] = (RTCHitN)auVar189[0x1a];
                        local_400[0x1b] = (RTCHitN)auVar189[0x1b];
                        local_400[0x1c] = (RTCHitN)auVar189[0x1c];
                        local_400[0x1d] = (RTCHitN)auVar189[0x1d];
                        local_400[0x1e] = (RTCHitN)auVar189[0x1e];
                        local_400[0x1f] = (RTCHitN)auVar189[0x1f];
                        local_400[0x20] = (RTCHitN)auVar189[0x20];
                        local_400[0x21] = (RTCHitN)auVar189[0x21];
                        local_400[0x22] = (RTCHitN)auVar189[0x22];
                        local_400[0x23] = (RTCHitN)auVar189[0x23];
                        local_400[0x24] = (RTCHitN)auVar189[0x24];
                        local_400[0x25] = (RTCHitN)auVar189[0x25];
                        local_400[0x26] = (RTCHitN)auVar189[0x26];
                        local_400[0x27] = (RTCHitN)auVar189[0x27];
                        local_400[0x28] = (RTCHitN)auVar189[0x28];
                        local_400[0x29] = (RTCHitN)auVar189[0x29];
                        local_400[0x2a] = (RTCHitN)auVar189[0x2a];
                        local_400[0x2b] = (RTCHitN)auVar189[0x2b];
                        local_400[0x2c] = (RTCHitN)auVar189[0x2c];
                        local_400[0x2d] = (RTCHitN)auVar189[0x2d];
                        local_400[0x2e] = (RTCHitN)auVar189[0x2e];
                        local_400[0x2f] = (RTCHitN)auVar189[0x2f];
                        local_400[0x30] = (RTCHitN)auVar189[0x30];
                        local_400[0x31] = (RTCHitN)auVar189[0x31];
                        local_400[0x32] = (RTCHitN)auVar189[0x32];
                        local_400[0x33] = (RTCHitN)auVar189[0x33];
                        local_400[0x34] = (RTCHitN)auVar189[0x34];
                        local_400[0x35] = (RTCHitN)auVar189[0x35];
                        local_400[0x36] = (RTCHitN)auVar189[0x36];
                        local_400[0x37] = (RTCHitN)auVar189[0x37];
                        local_400[0x38] = (RTCHitN)auVar189[0x38];
                        local_400[0x39] = (RTCHitN)auVar189[0x39];
                        local_400[0x3a] = (RTCHitN)auVar189[0x3a];
                        local_400[0x3b] = (RTCHitN)auVar189[0x3b];
                        local_400[0x3c] = (RTCHitN)auVar189[0x3c];
                        local_400[0x3d] = (RTCHitN)auVar189[0x3d];
                        local_400[0x3e] = (RTCHitN)auVar189[0x3e];
                        local_400[0x3f] = (RTCHitN)auVar189[0x3f];
                        local_300 = 0;
                        uStack_2f8 = 0;
                        uStack_2f0 = 0;
                        uStack_2e8 = 0;
                        uStack_2e0 = 0;
                        uStack_2d8 = 0;
                        uStack_2d0 = 0;
                        uStack_2c8 = 0;
                        local_2c0 = local_480._0_8_;
                        uStack_2b8 = local_480._8_8_;
                        uStack_2b0 = local_480._16_8_;
                        uStack_2a8 = local_480._24_8_;
                        uStack_2a0 = local_480._32_8_;
                        uStack_298 = local_480._40_8_;
                        uStack_290 = local_480._48_8_;
                        uStack_288 = local_480._56_8_;
                        auVar189 = vmovdqa64_avx512f(local_440);
                        local_280 = vmovdqa64_avx512f(auVar189);
                        auVar157._32_32_ = vpcmpeqd_avx2(auVar189._0_32_,auVar189._0_32_);
                        local_ad8[3] = auVar157._32_32_;
                        local_ad8[2] = auVar157._32_32_;
                        local_ad8[1] = auVar157._32_32_;
                        *local_ad8 = auVar157._32_32_;
                        local_240 = vbroadcastss_avx512f(ZEXT416(pRVar16->instID[0]));
                        local_200 = vbroadcastss_avx512f(ZEXT416(pRVar16->instPrimID[0]));
                        *(float *)(ray + k * 4 + 0x200) = fVar268;
                        local_8c0 = local_4c0;
                        local_b20.valid = (int *)local_8c0;
                        local_b20.geometryUserPtr = pGVar12->userPtr;
                        local_b20.context = context->user;
                        local_b20.hit = local_400;
                        local_b20.N = 0x10;
                        local_b20.ray = (RTCRayN *)ray;
                        if (pGVar12->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar12->intersectionFilterN)(&local_b20);
                          auVar287 = ZEXT3264(local_ac0);
                          auVar284._8_4_ = 0x7fffffff;
                          auVar284._0_8_ = 0x7fffffff7fffffff;
                          auVar284._12_4_ = 0x7fffffff;
                        }
                        auVar241 = vmovdqa64_avx512f(local_8c0);
                        uVar35 = vptestmd_avx512f(auVar241,auVar241);
                        if ((short)uVar35 != 0) {
                          p_Var17 = context->args->filter;
                          if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var17)(&local_b20);
                            auVar287 = ZEXT3264(local_ac0);
                            auVar284._8_4_ = 0x7fffffff;
                            auVar284._0_8_ = 0x7fffffff7fffffff;
                            auVar284._12_4_ = 0x7fffffff;
                          }
                          auVar241 = vmovdqa64_avx512f(local_8c0);
                          uVar91 = vptestmd_avx512f(auVar241,auVar241);
                          if ((short)uVar91 != 0) {
                            iVar3 = *(int *)(local_b20.hit + 4);
                            iVar4 = *(int *)(local_b20.hit + 8);
                            iVar5 = *(int *)(local_b20.hit + 0xc);
                            iVar6 = *(int *)(local_b20.hit + 0x10);
                            iVar7 = *(int *)(local_b20.hit + 0x14);
                            iVar8 = *(int *)(local_b20.hit + 0x18);
                            iVar1 = *(int *)(local_b20.hit + 0x1c);
                            iVar67 = *(int *)(local_b20.hit + 0x20);
                            iVar68 = *(int *)(local_b20.hit + 0x24);
                            iVar69 = *(int *)(local_b20.hit + 0x28);
                            iVar70 = *(int *)(local_b20.hit + 0x2c);
                            iVar71 = *(int *)(local_b20.hit + 0x30);
                            iVar72 = *(int *)(local_b20.hit + 0x34);
                            iVar73 = *(int *)(local_b20.hit + 0x38);
                            iVar74 = *(int *)(local_b20.hit + 0x3c);
                            bVar79 = (byte)uVar91;
                            bVar90 = (bool)((byte)(uVar91 >> 1) & 1);
                            bVar19 = (bool)((byte)(uVar91 >> 2) & 1);
                            bVar20 = (bool)((byte)(uVar91 >> 3) & 1);
                            bVar21 = (bool)((byte)(uVar91 >> 4) & 1);
                            bVar22 = (bool)((byte)(uVar91 >> 5) & 1);
                            bVar23 = (bool)((byte)(uVar91 >> 6) & 1);
                            bVar24 = (bool)((byte)(uVar91 >> 7) & 1);
                            bVar78 = (byte)(uVar91 >> 8);
                            bVar25 = (bool)((byte)(uVar91 >> 9) & 1);
                            bVar26 = (bool)((byte)(uVar91 >> 10) & 1);
                            bVar27 = (bool)((byte)(uVar91 >> 0xb) & 1);
                            bVar28 = (bool)((byte)(uVar91 >> 0xc) & 1);
                            bVar29 = (bool)((byte)(uVar91 >> 0xd) & 1);
                            bVar30 = (bool)((byte)(uVar91 >> 0xe) & 1);
                            bVar31 = SUB81(uVar91 >> 0xf,0);
                            *(uint *)(local_b20.ray + 0x300) =
                                 (uint)(bVar79 & 1) * *(int *)local_b20.hit |
                                 (uint)!(bool)(bVar79 & 1) * *(int *)(local_b20.ray + 0x300);
                            *(uint *)(local_b20.ray + 0x304) =
                                 (uint)bVar90 * iVar3 |
                                 (uint)!bVar90 * *(int *)(local_b20.ray + 0x304);
                            *(uint *)(local_b20.ray + 0x308) =
                                 (uint)bVar19 * iVar4 |
                                 (uint)!bVar19 * *(int *)(local_b20.ray + 0x308);
                            *(uint *)(local_b20.ray + 0x30c) =
                                 (uint)bVar20 * iVar5 |
                                 (uint)!bVar20 * *(int *)(local_b20.ray + 0x30c);
                            *(uint *)(local_b20.ray + 0x310) =
                                 (uint)bVar21 * iVar6 |
                                 (uint)!bVar21 * *(int *)(local_b20.ray + 0x310);
                            *(uint *)(local_b20.ray + 0x314) =
                                 (uint)bVar22 * iVar7 |
                                 (uint)!bVar22 * *(int *)(local_b20.ray + 0x314);
                            *(uint *)(local_b20.ray + 0x318) =
                                 (uint)bVar23 * iVar8 |
                                 (uint)!bVar23 * *(int *)(local_b20.ray + 0x318);
                            *(uint *)(local_b20.ray + 0x31c) =
                                 (uint)bVar24 * iVar1 |
                                 (uint)!bVar24 * *(int *)(local_b20.ray + 0x31c);
                            *(uint *)(local_b20.ray + 800) =
                                 (uint)(bVar78 & 1) * iVar67 |
                                 (uint)!(bool)(bVar78 & 1) * *(int *)(local_b20.ray + 800);
                            *(uint *)(local_b20.ray + 0x324) =
                                 (uint)bVar25 * iVar68 |
                                 (uint)!bVar25 * *(int *)(local_b20.ray + 0x324);
                            *(uint *)(local_b20.ray + 0x328) =
                                 (uint)bVar26 * iVar69 |
                                 (uint)!bVar26 * *(int *)(local_b20.ray + 0x328);
                            *(uint *)(local_b20.ray + 0x32c) =
                                 (uint)bVar27 * iVar70 |
                                 (uint)!bVar27 * *(int *)(local_b20.ray + 0x32c);
                            *(uint *)(local_b20.ray + 0x330) =
                                 (uint)bVar28 * iVar71 |
                                 (uint)!bVar28 * *(int *)(local_b20.ray + 0x330);
                            *(uint *)(local_b20.ray + 0x334) =
                                 (uint)bVar29 * iVar72 |
                                 (uint)!bVar29 * *(int *)(local_b20.ray + 0x334);
                            *(uint *)(local_b20.ray + 0x338) =
                                 (uint)bVar30 * iVar73 |
                                 (uint)!bVar30 * *(int *)(local_b20.ray + 0x338);
                            *(uint *)(local_b20.ray + 0x33c) =
                                 (uint)bVar31 * iVar74 |
                                 (uint)!bVar31 * *(int *)(local_b20.ray + 0x33c);
                            iVar3 = *(int *)(local_b20.hit + 0x44);
                            iVar4 = *(int *)(local_b20.hit + 0x48);
                            iVar5 = *(int *)(local_b20.hit + 0x4c);
                            iVar6 = *(int *)(local_b20.hit + 0x50);
                            iVar7 = *(int *)(local_b20.hit + 0x54);
                            iVar8 = *(int *)(local_b20.hit + 0x58);
                            iVar1 = *(int *)(local_b20.hit + 0x5c);
                            iVar67 = *(int *)(local_b20.hit + 0x60);
                            iVar68 = *(int *)(local_b20.hit + 100);
                            iVar69 = *(int *)(local_b20.hit + 0x68);
                            iVar70 = *(int *)(local_b20.hit + 0x6c);
                            iVar71 = *(int *)(local_b20.hit + 0x70);
                            iVar72 = *(int *)(local_b20.hit + 0x74);
                            iVar73 = *(int *)(local_b20.hit + 0x78);
                            iVar74 = *(int *)(local_b20.hit + 0x7c);
                            bVar90 = (bool)((byte)(uVar91 >> 1) & 1);
                            bVar19 = (bool)((byte)(uVar91 >> 2) & 1);
                            bVar20 = (bool)((byte)(uVar91 >> 3) & 1);
                            bVar21 = (bool)((byte)(uVar91 >> 4) & 1);
                            bVar22 = (bool)((byte)(uVar91 >> 5) & 1);
                            bVar23 = (bool)((byte)(uVar91 >> 6) & 1);
                            bVar24 = (bool)((byte)(uVar91 >> 7) & 1);
                            bVar25 = (bool)((byte)(uVar91 >> 9) & 1);
                            bVar26 = (bool)((byte)(uVar91 >> 10) & 1);
                            bVar27 = (bool)((byte)(uVar91 >> 0xb) & 1);
                            bVar28 = (bool)((byte)(uVar91 >> 0xc) & 1);
                            bVar29 = (bool)((byte)(uVar91 >> 0xd) & 1);
                            bVar30 = (bool)((byte)(uVar91 >> 0xe) & 1);
                            bVar31 = SUB81(uVar91 >> 0xf,0);
                            *(uint *)(local_b20.ray + 0x340) =
                                 (uint)(bVar79 & 1) * *(int *)(local_b20.hit + 0x40) |
                                 (uint)!(bool)(bVar79 & 1) * *(int *)(local_b20.ray + 0x340);
                            *(uint *)(local_b20.ray + 0x344) =
                                 (uint)bVar90 * iVar3 |
                                 (uint)!bVar90 * *(int *)(local_b20.ray + 0x344);
                            *(uint *)(local_b20.ray + 0x348) =
                                 (uint)bVar19 * iVar4 |
                                 (uint)!bVar19 * *(int *)(local_b20.ray + 0x348);
                            *(uint *)(local_b20.ray + 0x34c) =
                                 (uint)bVar20 * iVar5 |
                                 (uint)!bVar20 * *(int *)(local_b20.ray + 0x34c);
                            *(uint *)(local_b20.ray + 0x350) =
                                 (uint)bVar21 * iVar6 |
                                 (uint)!bVar21 * *(int *)(local_b20.ray + 0x350);
                            *(uint *)(local_b20.ray + 0x354) =
                                 (uint)bVar22 * iVar7 |
                                 (uint)!bVar22 * *(int *)(local_b20.ray + 0x354);
                            *(uint *)(local_b20.ray + 0x358) =
                                 (uint)bVar23 * iVar8 |
                                 (uint)!bVar23 * *(int *)(local_b20.ray + 0x358);
                            *(uint *)(local_b20.ray + 0x35c) =
                                 (uint)bVar24 * iVar1 |
                                 (uint)!bVar24 * *(int *)(local_b20.ray + 0x35c);
                            *(uint *)(local_b20.ray + 0x360) =
                                 (uint)(bVar78 & 1) * iVar67 |
                                 (uint)!(bool)(bVar78 & 1) * *(int *)(local_b20.ray + 0x360);
                            *(uint *)(local_b20.ray + 0x364) =
                                 (uint)bVar25 * iVar68 |
                                 (uint)!bVar25 * *(int *)(local_b20.ray + 0x364);
                            *(uint *)(local_b20.ray + 0x368) =
                                 (uint)bVar26 * iVar69 |
                                 (uint)!bVar26 * *(int *)(local_b20.ray + 0x368);
                            *(uint *)(local_b20.ray + 0x36c) =
                                 (uint)bVar27 * iVar70 |
                                 (uint)!bVar27 * *(int *)(local_b20.ray + 0x36c);
                            *(uint *)(local_b20.ray + 0x370) =
                                 (uint)bVar28 * iVar71 |
                                 (uint)!bVar28 * *(int *)(local_b20.ray + 0x370);
                            *(uint *)(local_b20.ray + 0x374) =
                                 (uint)bVar29 * iVar72 |
                                 (uint)!bVar29 * *(int *)(local_b20.ray + 0x374);
                            *(uint *)(local_b20.ray + 0x378) =
                                 (uint)bVar30 * iVar73 |
                                 (uint)!bVar30 * *(int *)(local_b20.ray + 0x378);
                            *(uint *)(local_b20.ray + 0x37c) =
                                 (uint)bVar31 * iVar74 |
                                 (uint)!bVar31 * *(int *)(local_b20.ray + 0x37c);
                            iVar3 = *(int *)(local_b20.hit + 0x84);
                            iVar4 = *(int *)(local_b20.hit + 0x88);
                            iVar5 = *(int *)(local_b20.hit + 0x8c);
                            iVar6 = *(int *)(local_b20.hit + 0x90);
                            iVar7 = *(int *)(local_b20.hit + 0x94);
                            iVar8 = *(int *)(local_b20.hit + 0x98);
                            iVar1 = *(int *)(local_b20.hit + 0x9c);
                            iVar67 = *(int *)(local_b20.hit + 0xa0);
                            iVar68 = *(int *)(local_b20.hit + 0xa4);
                            iVar69 = *(int *)(local_b20.hit + 0xa8);
                            iVar70 = *(int *)(local_b20.hit + 0xac);
                            iVar71 = *(int *)(local_b20.hit + 0xb0);
                            iVar72 = *(int *)(local_b20.hit + 0xb4);
                            iVar73 = *(int *)(local_b20.hit + 0xb8);
                            iVar74 = *(int *)(local_b20.hit + 0xbc);
                            bVar90 = (bool)((byte)(uVar91 >> 1) & 1);
                            bVar19 = (bool)((byte)(uVar91 >> 2) & 1);
                            bVar20 = (bool)((byte)(uVar91 >> 3) & 1);
                            bVar21 = (bool)((byte)(uVar91 >> 4) & 1);
                            bVar22 = (bool)((byte)(uVar91 >> 5) & 1);
                            bVar23 = (bool)((byte)(uVar91 >> 6) & 1);
                            bVar24 = (bool)((byte)(uVar91 >> 7) & 1);
                            bVar25 = (bool)((byte)(uVar91 >> 9) & 1);
                            bVar26 = (bool)((byte)(uVar91 >> 10) & 1);
                            bVar27 = (bool)((byte)(uVar91 >> 0xb) & 1);
                            bVar28 = (bool)((byte)(uVar91 >> 0xc) & 1);
                            bVar29 = (bool)((byte)(uVar91 >> 0xd) & 1);
                            bVar30 = (bool)((byte)(uVar91 >> 0xe) & 1);
                            bVar31 = SUB81(uVar91 >> 0xf,0);
                            *(uint *)(local_b20.ray + 0x380) =
                                 (uint)(bVar79 & 1) * *(int *)(local_b20.hit + 0x80) |
                                 (uint)!(bool)(bVar79 & 1) * *(int *)(local_b20.ray + 0x380);
                            *(uint *)(local_b20.ray + 900) =
                                 (uint)bVar90 * iVar3 |
                                 (uint)!bVar90 * *(int *)(local_b20.ray + 900);
                            *(uint *)(local_b20.ray + 0x388) =
                                 (uint)bVar19 * iVar4 |
                                 (uint)!bVar19 * *(int *)(local_b20.ray + 0x388);
                            *(uint *)(local_b20.ray + 0x38c) =
                                 (uint)bVar20 * iVar5 |
                                 (uint)!bVar20 * *(int *)(local_b20.ray + 0x38c);
                            *(uint *)(local_b20.ray + 0x390) =
                                 (uint)bVar21 * iVar6 |
                                 (uint)!bVar21 * *(int *)(local_b20.ray + 0x390);
                            *(uint *)(local_b20.ray + 0x394) =
                                 (uint)bVar22 * iVar7 |
                                 (uint)!bVar22 * *(int *)(local_b20.ray + 0x394);
                            *(uint *)(local_b20.ray + 0x398) =
                                 (uint)bVar23 * iVar8 |
                                 (uint)!bVar23 * *(int *)(local_b20.ray + 0x398);
                            *(uint *)(local_b20.ray + 0x39c) =
                                 (uint)bVar24 * iVar1 |
                                 (uint)!bVar24 * *(int *)(local_b20.ray + 0x39c);
                            *(uint *)(local_b20.ray + 0x3a0) =
                                 (uint)(bVar78 & 1) * iVar67 |
                                 (uint)!(bool)(bVar78 & 1) * *(int *)(local_b20.ray + 0x3a0);
                            *(uint *)(local_b20.ray + 0x3a4) =
                                 (uint)bVar25 * iVar68 |
                                 (uint)!bVar25 * *(int *)(local_b20.ray + 0x3a4);
                            *(uint *)(local_b20.ray + 0x3a8) =
                                 (uint)bVar26 * iVar69 |
                                 (uint)!bVar26 * *(int *)(local_b20.ray + 0x3a8);
                            *(uint *)(local_b20.ray + 0x3ac) =
                                 (uint)bVar27 * iVar70 |
                                 (uint)!bVar27 * *(int *)(local_b20.ray + 0x3ac);
                            *(uint *)(local_b20.ray + 0x3b0) =
                                 (uint)bVar28 * iVar71 |
                                 (uint)!bVar28 * *(int *)(local_b20.ray + 0x3b0);
                            *(uint *)(local_b20.ray + 0x3b4) =
                                 (uint)bVar29 * iVar72 |
                                 (uint)!bVar29 * *(int *)(local_b20.ray + 0x3b4);
                            *(uint *)(local_b20.ray + 0x3b8) =
                                 (uint)bVar30 * iVar73 |
                                 (uint)!bVar30 * *(int *)(local_b20.ray + 0x3b8);
                            *(uint *)(local_b20.ray + 0x3bc) =
                                 (uint)bVar31 * iVar74 |
                                 (uint)!bVar31 * *(int *)(local_b20.ray + 0x3bc);
                            iVar3 = *(int *)(local_b20.hit + 0xc4);
                            iVar4 = *(int *)(local_b20.hit + 200);
                            iVar5 = *(int *)(local_b20.hit + 0xcc);
                            iVar6 = *(int *)(local_b20.hit + 0xd0);
                            iVar7 = *(int *)(local_b20.hit + 0xd4);
                            iVar8 = *(int *)(local_b20.hit + 0xd8);
                            iVar1 = *(int *)(local_b20.hit + 0xdc);
                            iVar67 = *(int *)(local_b20.hit + 0xe0);
                            iVar68 = *(int *)(local_b20.hit + 0xe4);
                            iVar69 = *(int *)(local_b20.hit + 0xe8);
                            iVar70 = *(int *)(local_b20.hit + 0xec);
                            iVar71 = *(int *)(local_b20.hit + 0xf0);
                            iVar72 = *(int *)(local_b20.hit + 0xf4);
                            iVar73 = *(int *)(local_b20.hit + 0xf8);
                            iVar74 = *(int *)(local_b20.hit + 0xfc);
                            bVar90 = (bool)((byte)(uVar91 >> 1) & 1);
                            bVar19 = (bool)((byte)(uVar91 >> 2) & 1);
                            bVar20 = (bool)((byte)(uVar91 >> 3) & 1);
                            bVar21 = (bool)((byte)(uVar91 >> 4) & 1);
                            bVar22 = (bool)((byte)(uVar91 >> 5) & 1);
                            bVar23 = (bool)((byte)(uVar91 >> 6) & 1);
                            bVar24 = (bool)((byte)(uVar91 >> 7) & 1);
                            bVar25 = (bool)((byte)(uVar91 >> 9) & 1);
                            bVar26 = (bool)((byte)(uVar91 >> 10) & 1);
                            bVar27 = (bool)((byte)(uVar91 >> 0xb) & 1);
                            bVar28 = (bool)((byte)(uVar91 >> 0xc) & 1);
                            bVar29 = (bool)((byte)(uVar91 >> 0xd) & 1);
                            bVar30 = (bool)((byte)(uVar91 >> 0xe) & 1);
                            bVar31 = SUB81(uVar91 >> 0xf,0);
                            *(uint *)(local_b20.ray + 0x3c0) =
                                 (uint)(bVar79 & 1) * *(int *)(local_b20.hit + 0xc0) |
                                 (uint)!(bool)(bVar79 & 1) * *(int *)(local_b20.ray + 0x3c0);
                            *(uint *)(local_b20.ray + 0x3c4) =
                                 (uint)bVar90 * iVar3 |
                                 (uint)!bVar90 * *(int *)(local_b20.ray + 0x3c4);
                            *(uint *)(local_b20.ray + 0x3c8) =
                                 (uint)bVar19 * iVar4 |
                                 (uint)!bVar19 * *(int *)(local_b20.ray + 0x3c8);
                            *(uint *)(local_b20.ray + 0x3cc) =
                                 (uint)bVar20 * iVar5 |
                                 (uint)!bVar20 * *(int *)(local_b20.ray + 0x3cc);
                            *(uint *)(local_b20.ray + 0x3d0) =
                                 (uint)bVar21 * iVar6 |
                                 (uint)!bVar21 * *(int *)(local_b20.ray + 0x3d0);
                            *(uint *)(local_b20.ray + 0x3d4) =
                                 (uint)bVar22 * iVar7 |
                                 (uint)!bVar22 * *(int *)(local_b20.ray + 0x3d4);
                            *(uint *)(local_b20.ray + 0x3d8) =
                                 (uint)bVar23 * iVar8 |
                                 (uint)!bVar23 * *(int *)(local_b20.ray + 0x3d8);
                            *(uint *)(local_b20.ray + 0x3dc) =
                                 (uint)bVar24 * iVar1 |
                                 (uint)!bVar24 * *(int *)(local_b20.ray + 0x3dc);
                            *(uint *)(local_b20.ray + 0x3e0) =
                                 (uint)(bVar78 & 1) * iVar67 |
                                 (uint)!(bool)(bVar78 & 1) * *(int *)(local_b20.ray + 0x3e0);
                            *(uint *)(local_b20.ray + 0x3e4) =
                                 (uint)bVar25 * iVar68 |
                                 (uint)!bVar25 * *(int *)(local_b20.ray + 0x3e4);
                            *(uint *)(local_b20.ray + 1000) =
                                 (uint)bVar26 * iVar69 |
                                 (uint)!bVar26 * *(int *)(local_b20.ray + 1000);
                            *(uint *)(local_b20.ray + 0x3ec) =
                                 (uint)bVar27 * iVar70 |
                                 (uint)!bVar27 * *(int *)(local_b20.ray + 0x3ec);
                            *(uint *)(local_b20.ray + 0x3f0) =
                                 (uint)bVar28 * iVar71 |
                                 (uint)!bVar28 * *(int *)(local_b20.ray + 0x3f0);
                            *(uint *)(local_b20.ray + 0x3f4) =
                                 (uint)bVar29 * iVar72 |
                                 (uint)!bVar29 * *(int *)(local_b20.ray + 0x3f4);
                            *(uint *)(local_b20.ray + 0x3f8) =
                                 (uint)bVar30 * iVar73 |
                                 (uint)!bVar30 * *(int *)(local_b20.ray + 0x3f8);
                            *(uint *)(local_b20.ray + 0x3fc) =
                                 (uint)bVar31 * iVar74 |
                                 (uint)!bVar31 * *(int *)(local_b20.ray + 0x3fc);
                            iVar3 = *(int *)(local_b20.hit + 0x104);
                            iVar4 = *(int *)(local_b20.hit + 0x108);
                            iVar5 = *(int *)(local_b20.hit + 0x10c);
                            iVar6 = *(int *)(local_b20.hit + 0x110);
                            iVar7 = *(int *)(local_b20.hit + 0x114);
                            iVar8 = *(int *)(local_b20.hit + 0x118);
                            iVar1 = *(int *)(local_b20.hit + 0x11c);
                            iVar67 = *(int *)(local_b20.hit + 0x120);
                            iVar68 = *(int *)(local_b20.hit + 0x124);
                            iVar69 = *(int *)(local_b20.hit + 0x128);
                            iVar70 = *(int *)(local_b20.hit + 300);
                            iVar71 = *(int *)(local_b20.hit + 0x130);
                            iVar72 = *(int *)(local_b20.hit + 0x134);
                            iVar73 = *(int *)(local_b20.hit + 0x138);
                            iVar74 = *(int *)(local_b20.hit + 0x13c);
                            bVar90 = (bool)((byte)(uVar91 >> 1) & 1);
                            bVar19 = (bool)((byte)(uVar91 >> 2) & 1);
                            bVar20 = (bool)((byte)(uVar91 >> 3) & 1);
                            bVar21 = (bool)((byte)(uVar91 >> 4) & 1);
                            bVar22 = (bool)((byte)(uVar91 >> 5) & 1);
                            bVar23 = (bool)((byte)(uVar91 >> 6) & 1);
                            bVar24 = (bool)((byte)(uVar91 >> 7) & 1);
                            bVar25 = (bool)((byte)(uVar91 >> 9) & 1);
                            bVar26 = (bool)((byte)(uVar91 >> 10) & 1);
                            bVar27 = (bool)((byte)(uVar91 >> 0xb) & 1);
                            bVar28 = (bool)((byte)(uVar91 >> 0xc) & 1);
                            bVar29 = (bool)((byte)(uVar91 >> 0xd) & 1);
                            bVar30 = (bool)((byte)(uVar91 >> 0xe) & 1);
                            bVar31 = SUB81(uVar91 >> 0xf,0);
                            *(uint *)(local_b20.ray + 0x400) =
                                 (uint)(bVar79 & 1) * *(int *)(local_b20.hit + 0x100) |
                                 (uint)!(bool)(bVar79 & 1) * *(int *)(local_b20.ray + 0x400);
                            *(uint *)(local_b20.ray + 0x404) =
                                 (uint)bVar90 * iVar3 |
                                 (uint)!bVar90 * *(int *)(local_b20.ray + 0x404);
                            *(uint *)(local_b20.ray + 0x408) =
                                 (uint)bVar19 * iVar4 |
                                 (uint)!bVar19 * *(int *)(local_b20.ray + 0x408);
                            *(uint *)(local_b20.ray + 0x40c) =
                                 (uint)bVar20 * iVar5 |
                                 (uint)!bVar20 * *(int *)(local_b20.ray + 0x40c);
                            *(uint *)(local_b20.ray + 0x410) =
                                 (uint)bVar21 * iVar6 |
                                 (uint)!bVar21 * *(int *)(local_b20.ray + 0x410);
                            *(uint *)(local_b20.ray + 0x414) =
                                 (uint)bVar22 * iVar7 |
                                 (uint)!bVar22 * *(int *)(local_b20.ray + 0x414);
                            *(uint *)(local_b20.ray + 0x418) =
                                 (uint)bVar23 * iVar8 |
                                 (uint)!bVar23 * *(int *)(local_b20.ray + 0x418);
                            *(uint *)(local_b20.ray + 0x41c) =
                                 (uint)bVar24 * iVar1 |
                                 (uint)!bVar24 * *(int *)(local_b20.ray + 0x41c);
                            *(uint *)(local_b20.ray + 0x420) =
                                 (uint)(bVar78 & 1) * iVar67 |
                                 (uint)!(bool)(bVar78 & 1) * *(int *)(local_b20.ray + 0x420);
                            *(uint *)(local_b20.ray + 0x424) =
                                 (uint)bVar25 * iVar68 |
                                 (uint)!bVar25 * *(int *)(local_b20.ray + 0x424);
                            *(uint *)(local_b20.ray + 0x428) =
                                 (uint)bVar26 * iVar69 |
                                 (uint)!bVar26 * *(int *)(local_b20.ray + 0x428);
                            *(uint *)(local_b20.ray + 0x42c) =
                                 (uint)bVar27 * iVar70 |
                                 (uint)!bVar27 * *(int *)(local_b20.ray + 0x42c);
                            *(uint *)(local_b20.ray + 0x430) =
                                 (uint)bVar28 * iVar71 |
                                 (uint)!bVar28 * *(int *)(local_b20.ray + 0x430);
                            *(uint *)(local_b20.ray + 0x434) =
                                 (uint)bVar29 * iVar72 |
                                 (uint)!bVar29 * *(int *)(local_b20.ray + 0x434);
                            *(uint *)(local_b20.ray + 0x438) =
                                 (uint)bVar30 * iVar73 |
                                 (uint)!bVar30 * *(int *)(local_b20.ray + 0x438);
                            *(uint *)(local_b20.ray + 0x43c) =
                                 (uint)bVar31 * iVar74 |
                                 (uint)!bVar31 * *(int *)(local_b20.ray + 0x43c);
                            auVar189 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b20.hit + 0x140));
                            auVar189 = vmovdqu32_avx512f(auVar189);
                            *(undefined1 (*) [64])(local_b20.ray + 0x440) = auVar189;
                            auVar189 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b20.hit + 0x180));
                            auVar189 = vmovdqu32_avx512f(auVar189);
                            *(undefined1 (*) [64])(local_b20.ray + 0x480) = auVar189;
                            auVar281 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b20.hit + 0x1c0));
                            auVar189 = vmovdqa32_avx512f(auVar281);
                            *(undefined1 (*) [64])(local_b20.ray + 0x4c0) = auVar189;
                            auVar189 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b20.hit + 0x200));
                            bVar90 = (bool)((byte)(uVar91 >> 1) & 1);
                            auVar64._4_56_ = auVar189._8_56_;
                            auVar64._0_4_ =
                                 (uint)bVar90 * auVar189._4_4_ | (uint)!bVar90 * auVar281._4_4_;
                            auVar241._0_8_ = auVar64._0_8_ << 0x20;
                            bVar90 = (bool)((byte)(uVar91 >> 2) & 1);
                            auVar241._8_4_ =
                                 (uint)bVar90 * auVar189._8_4_ | (uint)!bVar90 * auVar281._8_4_;
                            bVar90 = (bool)((byte)(uVar91 >> 3) & 1);
                            auVar241._12_4_ =
                                 (uint)bVar90 * auVar189._12_4_ | (uint)!bVar90 * auVar281._12_4_;
                            bVar90 = (bool)((byte)(uVar91 >> 4) & 1);
                            auVar241._16_4_ =
                                 (uint)bVar90 * auVar189._16_4_ | (uint)!bVar90 * auVar281._16_4_;
                            bVar90 = (bool)((byte)(uVar91 >> 5) & 1);
                            auVar241._20_4_ =
                                 (uint)bVar90 * auVar189._20_4_ | (uint)!bVar90 * auVar281._20_4_;
                            bVar90 = (bool)((byte)(uVar91 >> 6) & 1);
                            auVar241._24_4_ =
                                 (uint)bVar90 * auVar189._24_4_ | (uint)!bVar90 * auVar281._24_4_;
                            bVar90 = (bool)((byte)(uVar91 >> 7) & 1);
                            auVar241._28_4_ =
                                 (uint)bVar90 * auVar189._28_4_ | (uint)!bVar90 * auVar281._28_4_;
                            auVar241._32_4_ =
                                 (uint)(bVar78 & 1) * auVar189._32_4_ |
                                 (uint)!(bool)(bVar78 & 1) * auVar281._32_4_;
                            bVar90 = (bool)((byte)(uVar91 >> 9) & 1);
                            auVar241._36_4_ =
                                 (uint)bVar90 * auVar189._36_4_ | (uint)!bVar90 * auVar281._36_4_;
                            bVar90 = (bool)((byte)(uVar91 >> 10) & 1);
                            auVar241._40_4_ =
                                 (uint)bVar90 * auVar189._40_4_ | (uint)!bVar90 * auVar281._40_4_;
                            bVar90 = (bool)((byte)(uVar91 >> 0xb) & 1);
                            auVar241._44_4_ =
                                 (uint)bVar90 * auVar189._44_4_ | (uint)!bVar90 * auVar281._44_4_;
                            bVar90 = (bool)((byte)(uVar91 >> 0xc) & 1);
                            auVar241._48_4_ =
                                 (uint)bVar90 * auVar189._48_4_ | (uint)!bVar90 * auVar281._48_4_;
                            bVar90 = (bool)((byte)(uVar91 >> 0xd) & 1);
                            auVar241._52_4_ =
                                 (uint)bVar90 * auVar189._52_4_ | (uint)!bVar90 * auVar281._52_4_;
                            bVar90 = (bool)((byte)(uVar91 >> 0xe) & 1);
                            auVar241._56_4_ =
                                 (uint)bVar90 * auVar189._56_4_ | (uint)!bVar90 * auVar281._56_4_;
                            bVar90 = SUB81(uVar91 >> 0xf,0);
                            auVar241._60_4_ =
                                 (uint)bVar90 * auVar189._60_4_ | (uint)!bVar90 * auVar281._60_4_;
                            auVar189 = vmovdqa32_avx512f(auVar189);
                            *(undefined1 (*) [64])(local_b20.ray + 0x500) = auVar189;
                            goto LAB_01c06ad6;
                          }
                        }
                        auVar251 = ZEXT464((uint)fVar282);
                        *(float *)(ray + k * 4 + 0x200) = fVar282;
                      }
                    }
                  }
                }
              }
              auVar157._32_32_ = auVar241._32_32_;
              bVar90 = lVar89 != 0;
              lVar89 = lVar89 + -1;
            } while ((!bVar18) && (bVar90));
            auVar75._4_4_ = fStack_85c;
            auVar75._0_4_ = local_860;
            auVar75._8_4_ = fStack_858;
            auVar75._12_4_ = fStack_854;
            auVar75._16_4_ = fStack_850;
            auVar75._20_4_ = fStack_84c;
            auVar75._24_4_ = fStack_848;
            auVar75._28_4_ = fStack_844;
            uVar283 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar52._4_4_ = uVar283;
            auVar52._0_4_ = uVar283;
            auVar52._8_4_ = uVar283;
            auVar52._12_4_ = uVar283;
            auVar52._16_4_ = uVar283;
            auVar52._20_4_ = uVar283;
            auVar52._24_4_ = uVar283;
            auVar52._28_4_ = uVar283;
            uVar35 = vcmpps_avx512vl(auVar75,auVar52,2);
            bVar85 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar85 & (byte)uVar35;
          } while (bVar85 != 0);
        }
        auVar186._0_4_ = (float)local_880._0_4_ + (float)local_a40._0_4_;
        auVar186._4_4_ = (float)local_880._4_4_ + (float)local_a40._4_4_;
        auVar186._8_4_ = fStack_878 + fStack_a38;
        auVar186._12_4_ = fStack_874 + fStack_a34;
        auVar186._16_4_ = fStack_870 + fStack_a30;
        auVar186._20_4_ = fStack_86c + fStack_a2c;
        auVar186._24_4_ = fStack_868 + fStack_a28;
        auVar186._28_4_ = fStack_864 + fStack_a24;
        uVar283 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar53._4_4_ = uVar283;
        auVar53._0_4_ = uVar283;
        auVar53._8_4_ = uVar283;
        auVar53._12_4_ = uVar283;
        auVar53._16_4_ = uVar283;
        auVar53._20_4_ = uVar283;
        auVar53._24_4_ = uVar283;
        auVar53._28_4_ = uVar283;
        uVar35 = vcmpps_avx512vl(auVar186,auVar53,2);
        bVar86 = (byte)uVar34 | ~bVar86;
        bVar83 = (byte)uVar36 & bVar83 & (byte)uVar35;
        auVar187._8_4_ = 2;
        auVar187._0_8_ = 0x200000002;
        auVar187._12_4_ = 2;
        auVar187._16_4_ = 2;
        auVar187._20_4_ = 2;
        auVar187._24_4_ = 2;
        auVar187._28_4_ = 2;
        auVar54._8_4_ = 3;
        auVar54._0_8_ = 0x300000003;
        auVar54._12_4_ = 3;
        auVar54._16_4_ = 3;
        auVar54._20_4_ = 3;
        auVar54._24_4_ = 3;
        auVar54._28_4_ = 3;
        auVar120 = vpblendmd_avx512vl(auVar187,auVar54);
        local_880._0_4_ = (uint)(bVar86 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar86 & 1) * 2;
        bVar18 = (bool)(bVar86 >> 1 & 1);
        local_880._4_4_ = (uint)bVar18 * auVar120._4_4_ | (uint)!bVar18 * 2;
        bVar18 = (bool)(bVar86 >> 2 & 1);
        fStack_878 = (float)((uint)bVar18 * auVar120._8_4_ | (uint)!bVar18 * 2);
        bVar18 = (bool)(bVar86 >> 3 & 1);
        fStack_874 = (float)((uint)bVar18 * auVar120._12_4_ | (uint)!bVar18 * 2);
        bVar18 = (bool)(bVar86 >> 4 & 1);
        fStack_870 = (float)((uint)bVar18 * auVar120._16_4_ | (uint)!bVar18 * 2);
        bVar18 = (bool)(bVar86 >> 5 & 1);
        fStack_86c = (float)((uint)bVar18 * auVar120._20_4_ | (uint)!bVar18 * 2);
        bVar18 = (bool)(bVar86 >> 6 & 1);
        fStack_868 = (float)((uint)bVar18 * auVar120._24_4_ | (uint)!bVar18 * 2);
        fStack_864 = (float)((uint)(bVar86 >> 7) * auVar120._28_4_ | (uint)!(bool)(bVar86 >> 7) * 2)
        ;
        auVar157._0_32_ = _local_880;
        uVar34 = vpcmpd_avx512vl(_local_880,local_7e0,2);
        bVar86 = (byte)uVar34 & bVar83;
        if (bVar86 != 0) {
          auVar100 = vminps_avx(local_940._0_16_,local_980._0_16_);
          auVar99 = vmaxps_avx(local_940._0_16_,local_980._0_16_);
          auVar101 = vminps_avx(local_960._0_16_,local_9a0._0_16_);
          auVar102 = vminps_avx(auVar100,auVar101);
          auVar100 = vmaxps_avx(local_960._0_16_,local_9a0._0_16_);
          auVar101 = vmaxps_avx(auVar99,auVar100);
          auVar99 = vandps_avx(auVar284,auVar102);
          auVar100 = vandps_avx(auVar284,auVar101);
          auVar99 = vmaxps_avx(auVar99,auVar100);
          auVar100 = vmovshdup_avx(auVar99);
          auVar100 = vmaxss_avx(auVar100,auVar99);
          auVar99 = vshufpd_avx(auVar99,auVar99,1);
          auVar99 = vmaxss_avx(auVar99,auVar100);
          fVar259 = auVar99._0_4_ * 1.9073486e-06;
          local_a10 = vshufps_avx(auVar101,auVar101,0xff);
          _local_920 = _local_7a0;
          local_860 = (float)local_7a0._0_4_ + (float)local_a40._0_4_;
          fStack_85c = (float)local_7a0._4_4_ + (float)local_a40._4_4_;
          fStack_858 = fStack_798 + fStack_a38;
          fStack_854 = fStack_794 + fStack_a34;
          fStack_850 = fStack_790 + fStack_a30;
          fStack_84c = fStack_78c + fStack_a2c;
          fStack_848 = fStack_788 + fStack_a28;
          fStack_844 = fStack_784 + fStack_a24;
          do {
            auVar188._8_4_ = 0x7f800000;
            auVar188._0_8_ = 0x7f8000007f800000;
            auVar188._12_4_ = 0x7f800000;
            auVar188._16_4_ = 0x7f800000;
            auVar188._20_4_ = 0x7f800000;
            auVar188._24_4_ = 0x7f800000;
            auVar188._28_4_ = 0x7f800000;
            auVar120 = vblendmps_avx512vl(auVar188,_local_920);
            auVar149._0_4_ =
                 (uint)(bVar86 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar86 & 1) * 0x7f800000;
            bVar18 = (bool)(bVar86 >> 1 & 1);
            auVar149._4_4_ = (uint)bVar18 * auVar120._4_4_ | (uint)!bVar18 * 0x7f800000;
            bVar18 = (bool)(bVar86 >> 2 & 1);
            auVar149._8_4_ = (uint)bVar18 * auVar120._8_4_ | (uint)!bVar18 * 0x7f800000;
            bVar18 = (bool)(bVar86 >> 3 & 1);
            auVar149._12_4_ = (uint)bVar18 * auVar120._12_4_ | (uint)!bVar18 * 0x7f800000;
            bVar18 = (bool)(bVar86 >> 4 & 1);
            auVar149._16_4_ = (uint)bVar18 * auVar120._16_4_ | (uint)!bVar18 * 0x7f800000;
            bVar18 = (bool)(bVar86 >> 5 & 1);
            auVar149._20_4_ = (uint)bVar18 * auVar120._20_4_ | (uint)!bVar18 * 0x7f800000;
            auVar149._24_4_ =
                 (uint)(bVar86 >> 6) * auVar120._24_4_ | (uint)!(bool)(bVar86 >> 6) * 0x7f800000;
            auVar149._28_4_ = 0x7f800000;
            auVar157._0_32_ = auVar149;
            auVar120 = vshufps_avx(auVar149,auVar149,0xb1);
            auVar120 = vminps_avx(auVar149,auVar120);
            auVar109 = vshufpd_avx(auVar120,auVar120,5);
            auVar120 = vminps_avx(auVar120,auVar109);
            auVar109 = vpermpd_avx2(auVar120,0x4e);
            auVar120 = vminps_avx(auVar120,auVar109);
            uVar34 = vcmpps_avx512vl(auVar149,auVar120,0);
            bVar79 = (byte)uVar34 & bVar86;
            bVar85 = bVar86;
            if (bVar79 != 0) {
              bVar85 = bVar79;
            }
            iVar2 = 0;
            for (uVar84 = (uint)bVar85; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
              iVar2 = iVar2 + 1;
            }
            fVar267 = *(float *)(local_840 + (uint)(iVar2 << 2));
            fVar268 = *(float *)(local_780 + (uint)(iVar2 << 2));
            fVar270 = auVar96._0_4_;
            if ((float)local_a60._0_4_ < 0.0) {
              fVar270 = sqrtf((float)local_a60._0_4_);
            }
            lVar89 = 4;
            do {
              auVar174._4_4_ = fVar268;
              auVar174._0_4_ = fVar268;
              auVar174._8_4_ = fVar268;
              auVar174._12_4_ = fVar268;
              auVar100 = vfmadd132ps_fma(auVar174,ZEXT816(0) << 0x40,local_a50);
              fVar282 = 1.0 - fVar267;
              auVar224._0_4_ = local_980._0_4_ * fVar267;
              auVar224._4_4_ = local_980._4_4_ * fVar267;
              auVar224._8_4_ = local_980._8_4_ * fVar267;
              auVar224._12_4_ = local_980._12_4_ * fVar267;
              local_900._0_16_ = ZEXT416((uint)fVar282);
              auVar239._4_4_ = fVar282;
              auVar239._0_4_ = fVar282;
              auVar239._8_4_ = fVar282;
              auVar239._12_4_ = fVar282;
              auVar99 = vfmadd231ps_fma(auVar224,auVar239,local_940._0_16_);
              auVar248._0_4_ = local_960._0_4_ * fVar267;
              auVar248._4_4_ = local_960._4_4_ * fVar267;
              auVar248._8_4_ = local_960._8_4_ * fVar267;
              auVar248._12_4_ = local_960._12_4_ * fVar267;
              auVar101 = vfmadd231ps_fma(auVar248,auVar239,local_980._0_16_);
              auVar257._0_4_ = fVar267 * (float)local_9a0._0_4_;
              auVar257._4_4_ = fVar267 * (float)local_9a0._4_4_;
              auVar257._8_4_ = fVar267 * fStack_998;
              auVar257._12_4_ = fVar267 * fStack_994;
              auVar102 = vfmadd231ps_fma(auVar257,auVar239,local_960._0_16_);
              auVar265._0_4_ = fVar267 * auVar101._0_4_;
              auVar265._4_4_ = fVar267 * auVar101._4_4_;
              auVar265._8_4_ = fVar267 * auVar101._8_4_;
              auVar265._12_4_ = fVar267 * auVar101._12_4_;
              auVar99 = vfmadd231ps_fma(auVar265,auVar239,auVar99);
              auVar225._0_4_ = fVar267 * auVar102._0_4_;
              auVar225._4_4_ = fVar267 * auVar102._4_4_;
              auVar225._8_4_ = fVar267 * auVar102._8_4_;
              auVar225._12_4_ = fVar267 * auVar102._12_4_;
              auVar101 = vfmadd231ps_fma(auVar225,auVar239,auVar101);
              auVar249._0_4_ = fVar267 * auVar101._0_4_;
              auVar249._4_4_ = fVar267 * auVar101._4_4_;
              auVar249._8_4_ = fVar267 * auVar101._8_4_;
              auVar249._12_4_ = fVar267 * auVar101._12_4_;
              auVar102 = vfmadd231ps_fma(auVar249,auVar99,auVar239);
              auVar99 = vsubps_avx(auVar101,auVar99);
              auVar44._8_4_ = 0x40400000;
              auVar44._0_8_ = 0x4040000040400000;
              auVar44._12_4_ = 0x40400000;
              auVar101 = vmulps_avx512vl(auVar99,auVar44);
              local_8e0._0_16_ = auVar102;
              auVar99 = vsubps_avx(auVar100,auVar102);
              local_a80._0_16_ = auVar99;
              auVar99 = vdpps_avx(auVar99,auVar99,0x7f);
              local_aa0._0_16_ = auVar99;
              local_be0 = ZEXT416((uint)fVar267);
              if (auVar99._0_4_ < 0.0) {
                auVar190._0_4_ = sqrtf(auVar99._0_4_);
                auVar190._4_60_ = extraout_var_01;
                auVar99 = auVar190._0_16_;
              }
              else {
                auVar99 = vsqrtss_avx(auVar99,auVar99);
              }
              local_9c0 = vdpps_avx(auVar101,auVar101,0x7f);
              fVar282 = local_9c0._0_4_;
              auVar226._4_12_ = ZEXT812(0) << 0x20;
              auVar226._0_4_ = fVar282;
              auVar100 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar226);
              fVar193 = auVar100._0_4_;
              local_9d0 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar226);
              auVar45._8_4_ = 0x80000000;
              auVar45._0_8_ = 0x8000000080000000;
              auVar45._12_4_ = 0x80000000;
              auVar102 = vxorps_avx512vl(local_9c0,auVar45);
              auVar100 = vfnmadd213ss_fma(local_9d0,local_9c0,ZEXT416(0x40000000));
              uVar84 = auVar99._0_4_;
              if (fVar282 < auVar102._0_4_) {
                auVar191._0_4_ = sqrtf(fVar282);
                auVar191._4_60_ = extraout_var_02;
                auVar99 = ZEXT416(uVar84);
                auVar102 = auVar191._0_16_;
              }
              else {
                auVar102 = vsqrtss_avx512f(local_9c0,local_9c0);
              }
              fVar282 = fVar193 * 1.5 + fVar282 * -0.5 * fVar193 * fVar193 * fVar193;
              auVar175._0_4_ = auVar101._0_4_ * fVar282;
              auVar175._4_4_ = auVar101._4_4_ * fVar282;
              auVar175._8_4_ = auVar101._8_4_ * fVar282;
              auVar175._12_4_ = auVar101._12_4_ * fVar282;
              auVar33 = vdpps_avx(local_a80._0_16_,auVar175,0x7f);
              fVar273 = auVar99._0_4_;
              fVar193 = auVar33._0_4_;
              auVar176._0_4_ = fVar193 * fVar193;
              auVar176._4_4_ = auVar33._4_4_ * auVar33._4_4_;
              auVar176._8_4_ = auVar33._8_4_ * auVar33._8_4_;
              auVar176._12_4_ = auVar33._12_4_ * auVar33._12_4_;
              auVar103 = vsubps_avx512vl(local_aa0._0_16_,auVar176);
              fVar272 = auVar103._0_4_;
              auVar203._4_12_ = ZEXT812(0) << 0x20;
              auVar203._0_4_ = fVar272;
              auVar97 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar203);
              auVar104 = vmulss_avx512f(auVar97,ZEXT416(0x3fc00000));
              auVar105 = vmulss_avx512f(auVar103,ZEXT416(0xbf000000));
              if (fVar272 < 0.0) {
                local_9f0 = fVar282;
                fStack_9ec = fVar282;
                fStack_9e8 = fVar282;
                fStack_9e4 = fVar282;
                local_9e0 = auVar97;
                fVar272 = sqrtf(fVar272);
                auVar105 = ZEXT416(auVar105._0_4_);
                auVar104 = ZEXT416(auVar104._0_4_);
                auVar102 = ZEXT416(auVar102._0_4_);
                auVar99 = ZEXT416(uVar84);
                auVar97 = local_9e0;
                fVar282 = local_9f0;
                fVar274 = fStack_9ec;
                fVar269 = fStack_9e8;
                fVar271 = fStack_9e4;
              }
              else {
                auVar103 = vsqrtss_avx(auVar103,auVar103);
                fVar272 = auVar103._0_4_;
                fVar274 = fVar282;
                fVar269 = fVar282;
                fVar271 = fVar282;
              }
              auVar280._8_4_ = 0x7fffffff;
              auVar280._0_8_ = 0x7fffffff7fffffff;
              auVar280._12_4_ = 0x7fffffff;
              auVar154._32_32_ = auVar157._32_32_;
              auVar154._0_32_ = local_ac0;
              auVar287 = ZEXT3264(local_ac0);
              auVar103 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_be0,local_900._0_16_);
              fVar192 = auVar103._0_4_ * 6.0;
              fVar32 = fVar267 * 6.0;
              auVar227._0_4_ = fVar32 * (float)local_9a0._0_4_;
              auVar227._4_4_ = fVar32 * (float)local_9a0._4_4_;
              auVar227._8_4_ = fVar32 * fStack_998;
              auVar227._12_4_ = fVar32 * fStack_994;
              auVar204._4_4_ = fVar192;
              auVar204._0_4_ = fVar192;
              auVar204._8_4_ = fVar192;
              auVar204._12_4_ = fVar192;
              auVar103 = vfmadd132ps_fma(auVar204,auVar227,local_960._0_16_);
              auVar98 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_900._0_16_,local_be0);
              fVar192 = auVar98._0_4_ * 6.0;
              auVar228._4_4_ = fVar192;
              auVar228._0_4_ = fVar192;
              auVar228._8_4_ = fVar192;
              auVar228._12_4_ = fVar192;
              auVar103 = vfmadd132ps_fma(auVar228,auVar103,local_980._0_16_);
              fVar192 = local_900._0_4_ * 6.0;
              auVar205._4_4_ = fVar192;
              auVar205._0_4_ = fVar192;
              auVar205._8_4_ = fVar192;
              auVar205._12_4_ = fVar192;
              auVar103 = vfmadd132ps_fma(auVar205,auVar103,local_940._0_16_);
              auVar229._0_4_ = auVar103._0_4_ * (float)local_9c0._0_4_;
              auVar229._4_4_ = auVar103._4_4_ * (float)local_9c0._0_4_;
              auVar229._8_4_ = auVar103._8_4_ * (float)local_9c0._0_4_;
              auVar229._12_4_ = auVar103._12_4_ * (float)local_9c0._0_4_;
              auVar103 = vdpps_avx(auVar101,auVar103,0x7f);
              fVar192 = auVar103._0_4_;
              auVar206._0_4_ = auVar101._0_4_ * fVar192;
              auVar206._4_4_ = auVar101._4_4_ * fVar192;
              auVar206._8_4_ = auVar101._8_4_ * fVar192;
              auVar206._12_4_ = auVar101._12_4_ * fVar192;
              auVar103 = vsubps_avx(auVar229,auVar206);
              fVar192 = auVar100._0_4_ * (float)local_9d0._0_4_;
              auVar46._8_4_ = 0x80000000;
              auVar46._0_8_ = 0x8000000080000000;
              auVar46._12_4_ = 0x80000000;
              auVar157._16_48_ = auVar154._16_48_;
              auVar106 = vxorps_avx512vl(auVar101,auVar46);
              auVar250._0_4_ = fVar282 * auVar103._0_4_ * fVar192;
              auVar250._4_4_ = fVar274 * auVar103._4_4_ * fVar192;
              auVar250._8_4_ = fVar269 * auVar103._8_4_ * fVar192;
              auVar250._12_4_ = fVar271 * auVar103._12_4_ * fVar192;
              auVar100 = vdpps_avx(auVar106,auVar175,0x7f);
              auVar103 = vmaxss_avx(ZEXT416((uint)fVar259),
                                    ZEXT416((uint)(fVar268 * fVar270 * 1.9073486e-06)));
              auVar98 = vdivss_avx512f(ZEXT416((uint)fVar259),auVar102);
              auVar102 = vdpps_avx(local_a80._0_16_,auVar250,0x7f);
              auVar99 = vfmadd213ss_fma(auVar99,ZEXT416((uint)fVar259),auVar103);
              auVar98 = vfmadd213ss_fma(ZEXT416((uint)(fVar273 + 1.0)),auVar98,auVar99);
              auVar99 = vdpps_avx(local_a50,auVar175,0x7f);
              fVar282 = auVar100._0_4_ + auVar102._0_4_;
              auVar100 = vdpps_avx(local_a80._0_16_,auVar106,0x7f);
              auVar105 = vmulss_avx512f(auVar105,auVar97);
              auVar97 = vmulss_avx512f(auVar97,auVar97);
              auVar102 = vdpps_avx(local_a80._0_16_,local_a50,0x7f);
              auVar157._0_16_ =
                   vaddss_avx512f(auVar104,ZEXT416((uint)(auVar105._0_4_ * auVar97._0_4_)));
              auVar97 = vfnmadd231ss_fma(auVar100,auVar33,ZEXT416((uint)fVar282));
              auVar104 = vfnmadd231ss_fma(auVar102,auVar33,auVar99);
              auVar100 = vpermilps_avx(local_8e0._0_16_,0xff);
              fVar272 = fVar272 - auVar100._0_4_;
              auVar100 = vshufps_avx(auVar101,auVar101,0xff);
              auVar102 = vfmsub213ss_fma(auVar97,auVar157._0_16_,auVar100);
              fVar273 = auVar104._0_4_ * auVar157._0_4_;
              auVar97 = vfmsub231ss_fma(ZEXT416((uint)(auVar99._0_4_ * auVar102._0_4_)),
                                        ZEXT416((uint)fVar282),ZEXT416((uint)fVar273));
              fVar274 = auVar97._0_4_;
              fVar282 = fVar272 * (fVar282 / fVar274) - fVar193 * (auVar102._0_4_ / fVar274);
              auVar251 = ZEXT464((uint)fVar282);
              fVar267 = fVar267 - (fVar193 * (fVar273 / fVar274) -
                                  fVar272 * (auVar99._0_4_ / fVar274));
              fVar268 = fVar268 - fVar282;
              auVar99 = vandps_avx(auVar33,auVar280);
              if (auVar98._0_4_ <= auVar99._0_4_) {
LAB_01c07337:
                bVar18 = false;
              }
              else {
                auVar102 = vfmadd231ss_fma(ZEXT416((uint)(auVar98._0_4_ + auVar103._0_4_)),local_a10
                                           ,ZEXT416(0x36000000));
                auVar99 = vandps_avx(auVar280,ZEXT416((uint)fVar272));
                if (auVar102._0_4_ <= auVar99._0_4_) goto LAB_01c07337;
                fVar268 = fVar268 + (float)local_a00._0_4_;
                bVar18 = true;
                if (fVar165 <= fVar268) {
                  fVar282 = *(float *)(ray + k * 4 + 0x200);
                  auVar251 = ZEXT464((uint)fVar282);
                  if (((fVar268 <= fVar282) && (0.0 <= fVar267)) && (fVar267 <= 1.0)) {
                    auVar156._16_48_ = auVar157._16_48_;
                    auVar156._0_16_ = ZEXT816(0) << 0x20;
                    auVar155._4_60_ = auVar156._4_60_;
                    auVar155._0_4_ = local_aa0._0_4_;
                    auVar99 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar155._0_16_);
                    fVar193 = auVar99._0_4_;
                    auVar157._0_16_ = vmulss_avx512f(local_aa0._0_16_,ZEXT416(0xbf000000));
                    pGVar12 = (context->scene->geometries).items[uVar82].ptr;
                    if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
LAB_01c075f4:
                      auVar251 = ZEXT464((uint)fVar282);
                    }
                    else {
                      fVar193 = fVar193 * 1.5 + auVar157._0_4_ * fVar193 * fVar193 * fVar193;
                      auVar207._0_4_ = local_a80._0_4_ * fVar193;
                      auVar207._4_4_ = local_a80._4_4_ * fVar193;
                      auVar207._8_4_ = local_a80._8_4_ * fVar193;
                      auVar207._12_4_ = local_a80._12_4_ * fVar193;
                      auVar102 = vfmadd213ps_fma(auVar100,auVar207,auVar101);
                      auVar99 = vshufps_avx(auVar207,auVar207,0xc9);
                      auVar100 = vshufps_avx(auVar101,auVar101,0xc9);
                      auVar208._0_4_ = auVar207._0_4_ * auVar100._0_4_;
                      auVar208._4_4_ = auVar207._4_4_ * auVar100._4_4_;
                      auVar208._8_4_ = auVar207._8_4_ * auVar100._8_4_;
                      auVar208._12_4_ = auVar207._12_4_ * auVar100._12_4_;
                      auVar101 = vfmsub231ps_fma(auVar208,auVar101,auVar99);
                      auVar99 = vshufps_avx(auVar101,auVar101,0xc9);
                      auVar100 = vshufps_avx(auVar102,auVar102,0xc9);
                      auVar101 = vshufps_avx(auVar101,auVar101,0xd2);
                      auVar177._0_4_ = auVar102._0_4_ * auVar101._0_4_;
                      auVar177._4_4_ = auVar102._4_4_ * auVar101._4_4_;
                      auVar177._8_4_ = auVar102._8_4_ * auVar101._8_4_;
                      auVar177._12_4_ = auVar102._12_4_ * auVar101._12_4_;
                      auVar99 = vfmsub231ps_fma(auVar177,auVar99,auVar100);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x200) = fVar268;
                        uVar283 = vextractps_avx(auVar99,1);
                        *(undefined4 *)(ray + k * 4 + 0x300) = uVar283;
                        uVar283 = vextractps_avx(auVar99,2);
                        *(undefined4 *)(ray + k * 4 + 0x340) = uVar283;
                        *(int *)(ray + k * 4 + 0x380) = auVar99._0_4_;
                        *(float *)(ray + k * 4 + 0x3c0) = fVar267;
                        *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                        *(uint *)(ray + k * 4 + 0x440) = uVar11;
                        *(uint *)(ray + k * 4 + 0x480) = uVar82;
                        *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar16 = context->user;
                        local_340 = vbroadcastss_avx512f(ZEXT416((uint)fVar267));
                        auVar189 = vbroadcastss_avx512f(ZEXT416(1));
                        auVar189 = vpermps_avx512f(auVar189,ZEXT1664(auVar99));
                        auVar281 = vbroadcastss_avx512f(ZEXT416(2));
                        local_3c0 = vpermps_avx512f(auVar281,ZEXT1664(auVar99));
                        local_380 = vbroadcastss_avx512f(auVar99);
                        local_400[0] = (RTCHitN)auVar189[0];
                        local_400[1] = (RTCHitN)auVar189[1];
                        local_400[2] = (RTCHitN)auVar189[2];
                        local_400[3] = (RTCHitN)auVar189[3];
                        local_400[4] = (RTCHitN)auVar189[4];
                        local_400[5] = (RTCHitN)auVar189[5];
                        local_400[6] = (RTCHitN)auVar189[6];
                        local_400[7] = (RTCHitN)auVar189[7];
                        local_400[8] = (RTCHitN)auVar189[8];
                        local_400[9] = (RTCHitN)auVar189[9];
                        local_400[10] = (RTCHitN)auVar189[10];
                        local_400[0xb] = (RTCHitN)auVar189[0xb];
                        local_400[0xc] = (RTCHitN)auVar189[0xc];
                        local_400[0xd] = (RTCHitN)auVar189[0xd];
                        local_400[0xe] = (RTCHitN)auVar189[0xe];
                        local_400[0xf] = (RTCHitN)auVar189[0xf];
                        local_400[0x10] = (RTCHitN)auVar189[0x10];
                        local_400[0x11] = (RTCHitN)auVar189[0x11];
                        local_400[0x12] = (RTCHitN)auVar189[0x12];
                        local_400[0x13] = (RTCHitN)auVar189[0x13];
                        local_400[0x14] = (RTCHitN)auVar189[0x14];
                        local_400[0x15] = (RTCHitN)auVar189[0x15];
                        local_400[0x16] = (RTCHitN)auVar189[0x16];
                        local_400[0x17] = (RTCHitN)auVar189[0x17];
                        local_400[0x18] = (RTCHitN)auVar189[0x18];
                        local_400[0x19] = (RTCHitN)auVar189[0x19];
                        local_400[0x1a] = (RTCHitN)auVar189[0x1a];
                        local_400[0x1b] = (RTCHitN)auVar189[0x1b];
                        local_400[0x1c] = (RTCHitN)auVar189[0x1c];
                        local_400[0x1d] = (RTCHitN)auVar189[0x1d];
                        local_400[0x1e] = (RTCHitN)auVar189[0x1e];
                        local_400[0x1f] = (RTCHitN)auVar189[0x1f];
                        local_400[0x20] = (RTCHitN)auVar189[0x20];
                        local_400[0x21] = (RTCHitN)auVar189[0x21];
                        local_400[0x22] = (RTCHitN)auVar189[0x22];
                        local_400[0x23] = (RTCHitN)auVar189[0x23];
                        local_400[0x24] = (RTCHitN)auVar189[0x24];
                        local_400[0x25] = (RTCHitN)auVar189[0x25];
                        local_400[0x26] = (RTCHitN)auVar189[0x26];
                        local_400[0x27] = (RTCHitN)auVar189[0x27];
                        local_400[0x28] = (RTCHitN)auVar189[0x28];
                        local_400[0x29] = (RTCHitN)auVar189[0x29];
                        local_400[0x2a] = (RTCHitN)auVar189[0x2a];
                        local_400[0x2b] = (RTCHitN)auVar189[0x2b];
                        local_400[0x2c] = (RTCHitN)auVar189[0x2c];
                        local_400[0x2d] = (RTCHitN)auVar189[0x2d];
                        local_400[0x2e] = (RTCHitN)auVar189[0x2e];
                        local_400[0x2f] = (RTCHitN)auVar189[0x2f];
                        local_400[0x30] = (RTCHitN)auVar189[0x30];
                        local_400[0x31] = (RTCHitN)auVar189[0x31];
                        local_400[0x32] = (RTCHitN)auVar189[0x32];
                        local_400[0x33] = (RTCHitN)auVar189[0x33];
                        local_400[0x34] = (RTCHitN)auVar189[0x34];
                        local_400[0x35] = (RTCHitN)auVar189[0x35];
                        local_400[0x36] = (RTCHitN)auVar189[0x36];
                        local_400[0x37] = (RTCHitN)auVar189[0x37];
                        local_400[0x38] = (RTCHitN)auVar189[0x38];
                        local_400[0x39] = (RTCHitN)auVar189[0x39];
                        local_400[0x3a] = (RTCHitN)auVar189[0x3a];
                        local_400[0x3b] = (RTCHitN)auVar189[0x3b];
                        local_400[0x3c] = (RTCHitN)auVar189[0x3c];
                        local_400[0x3d] = (RTCHitN)auVar189[0x3d];
                        local_400[0x3e] = (RTCHitN)auVar189[0x3e];
                        local_400[0x3f] = (RTCHitN)auVar189[0x3f];
                        local_300 = 0;
                        uStack_2f8 = 0;
                        uStack_2f0 = 0;
                        uStack_2e8 = 0;
                        uStack_2e0 = 0;
                        uStack_2d8 = 0;
                        uStack_2d0 = 0;
                        uStack_2c8 = 0;
                        local_2c0 = local_480._0_8_;
                        uStack_2b8 = local_480._8_8_;
                        uStack_2b0 = local_480._16_8_;
                        uStack_2a8 = local_480._24_8_;
                        uStack_2a0 = local_480._32_8_;
                        uStack_298 = local_480._40_8_;
                        uStack_290 = local_480._48_8_;
                        uStack_288 = local_480._56_8_;
                        auVar189 = vmovdqa64_avx512f(local_440);
                        local_280 = vmovdqa64_avx512f(auVar189);
                        auVar157._32_32_ = vpcmpeqd_avx2(auVar189._0_32_,auVar189._0_32_);
                        local_ad8[3] = auVar157._32_32_;
                        local_ad8[2] = auVar157._32_32_;
                        local_ad8[1] = auVar157._32_32_;
                        *local_ad8 = auVar157._32_32_;
                        local_240 = vbroadcastss_avx512f(ZEXT416(pRVar16->instID[0]));
                        local_200 = vbroadcastss_avx512f(ZEXT416(pRVar16->instPrimID[0]));
                        *(float *)(ray + k * 4 + 0x200) = fVar268;
                        local_8c0 = local_4c0;
                        local_b20.valid = (int *)local_8c0;
                        local_b20.geometryUserPtr = pGVar12->userPtr;
                        local_b20.context = context->user;
                        local_b20.hit = local_400;
                        local_b20.N = 0x10;
                        local_b20.ray = (RTCRayN *)ray;
                        if (pGVar12->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar12->intersectionFilterN)(&local_b20);
                          auVar287 = ZEXT3264(local_ac0);
                        }
                        auVar157 = vmovdqa64_avx512f(local_8c0);
                        uVar34 = vptestmd_avx512f(auVar157,auVar157);
                        if ((short)uVar34 != 0) {
                          p_Var17 = context->args->filter;
                          if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var17)(&local_b20);
                            auVar287 = ZEXT3264(local_ac0);
                          }
                          auVar157 = vmovdqa64_avx512f(local_8c0);
                          uVar91 = vptestmd_avx512f(auVar157,auVar157);
                          if ((short)uVar91 != 0) {
                            iVar3 = *(int *)(local_b20.hit + 4);
                            iVar4 = *(int *)(local_b20.hit + 8);
                            iVar5 = *(int *)(local_b20.hit + 0xc);
                            iVar6 = *(int *)(local_b20.hit + 0x10);
                            iVar7 = *(int *)(local_b20.hit + 0x14);
                            iVar8 = *(int *)(local_b20.hit + 0x18);
                            iVar1 = *(int *)(local_b20.hit + 0x1c);
                            iVar67 = *(int *)(local_b20.hit + 0x20);
                            iVar68 = *(int *)(local_b20.hit + 0x24);
                            iVar69 = *(int *)(local_b20.hit + 0x28);
                            iVar70 = *(int *)(local_b20.hit + 0x2c);
                            iVar71 = *(int *)(local_b20.hit + 0x30);
                            iVar72 = *(int *)(local_b20.hit + 0x34);
                            iVar73 = *(int *)(local_b20.hit + 0x38);
                            iVar74 = *(int *)(local_b20.hit + 0x3c);
                            bVar85 = (byte)uVar91;
                            bVar90 = (bool)((byte)(uVar91 >> 1) & 1);
                            bVar19 = (bool)((byte)(uVar91 >> 2) & 1);
                            bVar20 = (bool)((byte)(uVar91 >> 3) & 1);
                            bVar21 = (bool)((byte)(uVar91 >> 4) & 1);
                            bVar22 = (bool)((byte)(uVar91 >> 5) & 1);
                            bVar23 = (bool)((byte)(uVar91 >> 6) & 1);
                            bVar24 = (bool)((byte)(uVar91 >> 7) & 1);
                            bVar79 = (byte)(uVar91 >> 8);
                            bVar25 = (bool)((byte)(uVar91 >> 9) & 1);
                            bVar26 = (bool)((byte)(uVar91 >> 10) & 1);
                            bVar27 = (bool)((byte)(uVar91 >> 0xb) & 1);
                            bVar28 = (bool)((byte)(uVar91 >> 0xc) & 1);
                            bVar29 = (bool)((byte)(uVar91 >> 0xd) & 1);
                            bVar30 = (bool)((byte)(uVar91 >> 0xe) & 1);
                            bVar31 = SUB81(uVar91 >> 0xf,0);
                            *(uint *)(local_b20.ray + 0x300) =
                                 (uint)(bVar85 & 1) * *(int *)local_b20.hit |
                                 (uint)!(bool)(bVar85 & 1) * *(int *)(local_b20.ray + 0x300);
                            *(uint *)(local_b20.ray + 0x304) =
                                 (uint)bVar90 * iVar3 |
                                 (uint)!bVar90 * *(int *)(local_b20.ray + 0x304);
                            *(uint *)(local_b20.ray + 0x308) =
                                 (uint)bVar19 * iVar4 |
                                 (uint)!bVar19 * *(int *)(local_b20.ray + 0x308);
                            *(uint *)(local_b20.ray + 0x30c) =
                                 (uint)bVar20 * iVar5 |
                                 (uint)!bVar20 * *(int *)(local_b20.ray + 0x30c);
                            *(uint *)(local_b20.ray + 0x310) =
                                 (uint)bVar21 * iVar6 |
                                 (uint)!bVar21 * *(int *)(local_b20.ray + 0x310);
                            *(uint *)(local_b20.ray + 0x314) =
                                 (uint)bVar22 * iVar7 |
                                 (uint)!bVar22 * *(int *)(local_b20.ray + 0x314);
                            *(uint *)(local_b20.ray + 0x318) =
                                 (uint)bVar23 * iVar8 |
                                 (uint)!bVar23 * *(int *)(local_b20.ray + 0x318);
                            *(uint *)(local_b20.ray + 0x31c) =
                                 (uint)bVar24 * iVar1 |
                                 (uint)!bVar24 * *(int *)(local_b20.ray + 0x31c);
                            *(uint *)(local_b20.ray + 800) =
                                 (uint)(bVar79 & 1) * iVar67 |
                                 (uint)!(bool)(bVar79 & 1) * *(int *)(local_b20.ray + 800);
                            *(uint *)(local_b20.ray + 0x324) =
                                 (uint)bVar25 * iVar68 |
                                 (uint)!bVar25 * *(int *)(local_b20.ray + 0x324);
                            *(uint *)(local_b20.ray + 0x328) =
                                 (uint)bVar26 * iVar69 |
                                 (uint)!bVar26 * *(int *)(local_b20.ray + 0x328);
                            *(uint *)(local_b20.ray + 0x32c) =
                                 (uint)bVar27 * iVar70 |
                                 (uint)!bVar27 * *(int *)(local_b20.ray + 0x32c);
                            *(uint *)(local_b20.ray + 0x330) =
                                 (uint)bVar28 * iVar71 |
                                 (uint)!bVar28 * *(int *)(local_b20.ray + 0x330);
                            *(uint *)(local_b20.ray + 0x334) =
                                 (uint)bVar29 * iVar72 |
                                 (uint)!bVar29 * *(int *)(local_b20.ray + 0x334);
                            *(uint *)(local_b20.ray + 0x338) =
                                 (uint)bVar30 * iVar73 |
                                 (uint)!bVar30 * *(int *)(local_b20.ray + 0x338);
                            *(uint *)(local_b20.ray + 0x33c) =
                                 (uint)bVar31 * iVar74 |
                                 (uint)!bVar31 * *(int *)(local_b20.ray + 0x33c);
                            iVar3 = *(int *)(local_b20.hit + 0x44);
                            iVar4 = *(int *)(local_b20.hit + 0x48);
                            iVar5 = *(int *)(local_b20.hit + 0x4c);
                            iVar6 = *(int *)(local_b20.hit + 0x50);
                            iVar7 = *(int *)(local_b20.hit + 0x54);
                            iVar8 = *(int *)(local_b20.hit + 0x58);
                            iVar1 = *(int *)(local_b20.hit + 0x5c);
                            iVar67 = *(int *)(local_b20.hit + 0x60);
                            iVar68 = *(int *)(local_b20.hit + 100);
                            iVar69 = *(int *)(local_b20.hit + 0x68);
                            iVar70 = *(int *)(local_b20.hit + 0x6c);
                            iVar71 = *(int *)(local_b20.hit + 0x70);
                            iVar72 = *(int *)(local_b20.hit + 0x74);
                            iVar73 = *(int *)(local_b20.hit + 0x78);
                            iVar74 = *(int *)(local_b20.hit + 0x7c);
                            bVar90 = (bool)((byte)(uVar91 >> 1) & 1);
                            bVar19 = (bool)((byte)(uVar91 >> 2) & 1);
                            bVar20 = (bool)((byte)(uVar91 >> 3) & 1);
                            bVar21 = (bool)((byte)(uVar91 >> 4) & 1);
                            bVar22 = (bool)((byte)(uVar91 >> 5) & 1);
                            bVar23 = (bool)((byte)(uVar91 >> 6) & 1);
                            bVar24 = (bool)((byte)(uVar91 >> 7) & 1);
                            bVar25 = (bool)((byte)(uVar91 >> 9) & 1);
                            bVar26 = (bool)((byte)(uVar91 >> 10) & 1);
                            bVar27 = (bool)((byte)(uVar91 >> 0xb) & 1);
                            bVar28 = (bool)((byte)(uVar91 >> 0xc) & 1);
                            bVar29 = (bool)((byte)(uVar91 >> 0xd) & 1);
                            bVar30 = (bool)((byte)(uVar91 >> 0xe) & 1);
                            bVar31 = SUB81(uVar91 >> 0xf,0);
                            *(uint *)(local_b20.ray + 0x340) =
                                 (uint)(bVar85 & 1) * *(int *)(local_b20.hit + 0x40) |
                                 (uint)!(bool)(bVar85 & 1) * *(int *)(local_b20.ray + 0x340);
                            *(uint *)(local_b20.ray + 0x344) =
                                 (uint)bVar90 * iVar3 |
                                 (uint)!bVar90 * *(int *)(local_b20.ray + 0x344);
                            *(uint *)(local_b20.ray + 0x348) =
                                 (uint)bVar19 * iVar4 |
                                 (uint)!bVar19 * *(int *)(local_b20.ray + 0x348);
                            *(uint *)(local_b20.ray + 0x34c) =
                                 (uint)bVar20 * iVar5 |
                                 (uint)!bVar20 * *(int *)(local_b20.ray + 0x34c);
                            *(uint *)(local_b20.ray + 0x350) =
                                 (uint)bVar21 * iVar6 |
                                 (uint)!bVar21 * *(int *)(local_b20.ray + 0x350);
                            *(uint *)(local_b20.ray + 0x354) =
                                 (uint)bVar22 * iVar7 |
                                 (uint)!bVar22 * *(int *)(local_b20.ray + 0x354);
                            *(uint *)(local_b20.ray + 0x358) =
                                 (uint)bVar23 * iVar8 |
                                 (uint)!bVar23 * *(int *)(local_b20.ray + 0x358);
                            *(uint *)(local_b20.ray + 0x35c) =
                                 (uint)bVar24 * iVar1 |
                                 (uint)!bVar24 * *(int *)(local_b20.ray + 0x35c);
                            *(uint *)(local_b20.ray + 0x360) =
                                 (uint)(bVar79 & 1) * iVar67 |
                                 (uint)!(bool)(bVar79 & 1) * *(int *)(local_b20.ray + 0x360);
                            *(uint *)(local_b20.ray + 0x364) =
                                 (uint)bVar25 * iVar68 |
                                 (uint)!bVar25 * *(int *)(local_b20.ray + 0x364);
                            *(uint *)(local_b20.ray + 0x368) =
                                 (uint)bVar26 * iVar69 |
                                 (uint)!bVar26 * *(int *)(local_b20.ray + 0x368);
                            *(uint *)(local_b20.ray + 0x36c) =
                                 (uint)bVar27 * iVar70 |
                                 (uint)!bVar27 * *(int *)(local_b20.ray + 0x36c);
                            *(uint *)(local_b20.ray + 0x370) =
                                 (uint)bVar28 * iVar71 |
                                 (uint)!bVar28 * *(int *)(local_b20.ray + 0x370);
                            *(uint *)(local_b20.ray + 0x374) =
                                 (uint)bVar29 * iVar72 |
                                 (uint)!bVar29 * *(int *)(local_b20.ray + 0x374);
                            *(uint *)(local_b20.ray + 0x378) =
                                 (uint)bVar30 * iVar73 |
                                 (uint)!bVar30 * *(int *)(local_b20.ray + 0x378);
                            *(uint *)(local_b20.ray + 0x37c) =
                                 (uint)bVar31 * iVar74 |
                                 (uint)!bVar31 * *(int *)(local_b20.ray + 0x37c);
                            iVar3 = *(int *)(local_b20.hit + 0x84);
                            iVar4 = *(int *)(local_b20.hit + 0x88);
                            iVar5 = *(int *)(local_b20.hit + 0x8c);
                            iVar6 = *(int *)(local_b20.hit + 0x90);
                            iVar7 = *(int *)(local_b20.hit + 0x94);
                            iVar8 = *(int *)(local_b20.hit + 0x98);
                            iVar1 = *(int *)(local_b20.hit + 0x9c);
                            iVar67 = *(int *)(local_b20.hit + 0xa0);
                            iVar68 = *(int *)(local_b20.hit + 0xa4);
                            iVar69 = *(int *)(local_b20.hit + 0xa8);
                            iVar70 = *(int *)(local_b20.hit + 0xac);
                            iVar71 = *(int *)(local_b20.hit + 0xb0);
                            iVar72 = *(int *)(local_b20.hit + 0xb4);
                            iVar73 = *(int *)(local_b20.hit + 0xb8);
                            iVar74 = *(int *)(local_b20.hit + 0xbc);
                            bVar90 = (bool)((byte)(uVar91 >> 1) & 1);
                            bVar19 = (bool)((byte)(uVar91 >> 2) & 1);
                            bVar20 = (bool)((byte)(uVar91 >> 3) & 1);
                            bVar21 = (bool)((byte)(uVar91 >> 4) & 1);
                            bVar22 = (bool)((byte)(uVar91 >> 5) & 1);
                            bVar23 = (bool)((byte)(uVar91 >> 6) & 1);
                            bVar24 = (bool)((byte)(uVar91 >> 7) & 1);
                            bVar25 = (bool)((byte)(uVar91 >> 9) & 1);
                            bVar26 = (bool)((byte)(uVar91 >> 10) & 1);
                            bVar27 = (bool)((byte)(uVar91 >> 0xb) & 1);
                            bVar28 = (bool)((byte)(uVar91 >> 0xc) & 1);
                            bVar29 = (bool)((byte)(uVar91 >> 0xd) & 1);
                            bVar30 = (bool)((byte)(uVar91 >> 0xe) & 1);
                            bVar31 = SUB81(uVar91 >> 0xf,0);
                            *(uint *)(local_b20.ray + 0x380) =
                                 (uint)(bVar85 & 1) * *(int *)(local_b20.hit + 0x80) |
                                 (uint)!(bool)(bVar85 & 1) * *(int *)(local_b20.ray + 0x380);
                            *(uint *)(local_b20.ray + 900) =
                                 (uint)bVar90 * iVar3 |
                                 (uint)!bVar90 * *(int *)(local_b20.ray + 900);
                            *(uint *)(local_b20.ray + 0x388) =
                                 (uint)bVar19 * iVar4 |
                                 (uint)!bVar19 * *(int *)(local_b20.ray + 0x388);
                            *(uint *)(local_b20.ray + 0x38c) =
                                 (uint)bVar20 * iVar5 |
                                 (uint)!bVar20 * *(int *)(local_b20.ray + 0x38c);
                            *(uint *)(local_b20.ray + 0x390) =
                                 (uint)bVar21 * iVar6 |
                                 (uint)!bVar21 * *(int *)(local_b20.ray + 0x390);
                            *(uint *)(local_b20.ray + 0x394) =
                                 (uint)bVar22 * iVar7 |
                                 (uint)!bVar22 * *(int *)(local_b20.ray + 0x394);
                            *(uint *)(local_b20.ray + 0x398) =
                                 (uint)bVar23 * iVar8 |
                                 (uint)!bVar23 * *(int *)(local_b20.ray + 0x398);
                            *(uint *)(local_b20.ray + 0x39c) =
                                 (uint)bVar24 * iVar1 |
                                 (uint)!bVar24 * *(int *)(local_b20.ray + 0x39c);
                            *(uint *)(local_b20.ray + 0x3a0) =
                                 (uint)(bVar79 & 1) * iVar67 |
                                 (uint)!(bool)(bVar79 & 1) * *(int *)(local_b20.ray + 0x3a0);
                            *(uint *)(local_b20.ray + 0x3a4) =
                                 (uint)bVar25 * iVar68 |
                                 (uint)!bVar25 * *(int *)(local_b20.ray + 0x3a4);
                            *(uint *)(local_b20.ray + 0x3a8) =
                                 (uint)bVar26 * iVar69 |
                                 (uint)!bVar26 * *(int *)(local_b20.ray + 0x3a8);
                            *(uint *)(local_b20.ray + 0x3ac) =
                                 (uint)bVar27 * iVar70 |
                                 (uint)!bVar27 * *(int *)(local_b20.ray + 0x3ac);
                            *(uint *)(local_b20.ray + 0x3b0) =
                                 (uint)bVar28 * iVar71 |
                                 (uint)!bVar28 * *(int *)(local_b20.ray + 0x3b0);
                            *(uint *)(local_b20.ray + 0x3b4) =
                                 (uint)bVar29 * iVar72 |
                                 (uint)!bVar29 * *(int *)(local_b20.ray + 0x3b4);
                            *(uint *)(local_b20.ray + 0x3b8) =
                                 (uint)bVar30 * iVar73 |
                                 (uint)!bVar30 * *(int *)(local_b20.ray + 0x3b8);
                            *(uint *)(local_b20.ray + 0x3bc) =
                                 (uint)bVar31 * iVar74 |
                                 (uint)!bVar31 * *(int *)(local_b20.ray + 0x3bc);
                            iVar3 = *(int *)(local_b20.hit + 0xc4);
                            iVar4 = *(int *)(local_b20.hit + 200);
                            iVar5 = *(int *)(local_b20.hit + 0xcc);
                            iVar6 = *(int *)(local_b20.hit + 0xd0);
                            iVar7 = *(int *)(local_b20.hit + 0xd4);
                            iVar8 = *(int *)(local_b20.hit + 0xd8);
                            iVar1 = *(int *)(local_b20.hit + 0xdc);
                            iVar67 = *(int *)(local_b20.hit + 0xe0);
                            iVar68 = *(int *)(local_b20.hit + 0xe4);
                            iVar69 = *(int *)(local_b20.hit + 0xe8);
                            iVar70 = *(int *)(local_b20.hit + 0xec);
                            iVar71 = *(int *)(local_b20.hit + 0xf0);
                            iVar72 = *(int *)(local_b20.hit + 0xf4);
                            iVar73 = *(int *)(local_b20.hit + 0xf8);
                            iVar74 = *(int *)(local_b20.hit + 0xfc);
                            bVar90 = (bool)((byte)(uVar91 >> 1) & 1);
                            bVar19 = (bool)((byte)(uVar91 >> 2) & 1);
                            bVar20 = (bool)((byte)(uVar91 >> 3) & 1);
                            bVar21 = (bool)((byte)(uVar91 >> 4) & 1);
                            bVar22 = (bool)((byte)(uVar91 >> 5) & 1);
                            bVar23 = (bool)((byte)(uVar91 >> 6) & 1);
                            bVar24 = (bool)((byte)(uVar91 >> 7) & 1);
                            bVar25 = (bool)((byte)(uVar91 >> 9) & 1);
                            bVar26 = (bool)((byte)(uVar91 >> 10) & 1);
                            bVar27 = (bool)((byte)(uVar91 >> 0xb) & 1);
                            bVar28 = (bool)((byte)(uVar91 >> 0xc) & 1);
                            bVar29 = (bool)((byte)(uVar91 >> 0xd) & 1);
                            bVar30 = (bool)((byte)(uVar91 >> 0xe) & 1);
                            bVar31 = SUB81(uVar91 >> 0xf,0);
                            *(uint *)(local_b20.ray + 0x3c0) =
                                 (uint)(bVar85 & 1) * *(int *)(local_b20.hit + 0xc0) |
                                 (uint)!(bool)(bVar85 & 1) * *(int *)(local_b20.ray + 0x3c0);
                            *(uint *)(local_b20.ray + 0x3c4) =
                                 (uint)bVar90 * iVar3 |
                                 (uint)!bVar90 * *(int *)(local_b20.ray + 0x3c4);
                            *(uint *)(local_b20.ray + 0x3c8) =
                                 (uint)bVar19 * iVar4 |
                                 (uint)!bVar19 * *(int *)(local_b20.ray + 0x3c8);
                            *(uint *)(local_b20.ray + 0x3cc) =
                                 (uint)bVar20 * iVar5 |
                                 (uint)!bVar20 * *(int *)(local_b20.ray + 0x3cc);
                            *(uint *)(local_b20.ray + 0x3d0) =
                                 (uint)bVar21 * iVar6 |
                                 (uint)!bVar21 * *(int *)(local_b20.ray + 0x3d0);
                            *(uint *)(local_b20.ray + 0x3d4) =
                                 (uint)bVar22 * iVar7 |
                                 (uint)!bVar22 * *(int *)(local_b20.ray + 0x3d4);
                            *(uint *)(local_b20.ray + 0x3d8) =
                                 (uint)bVar23 * iVar8 |
                                 (uint)!bVar23 * *(int *)(local_b20.ray + 0x3d8);
                            *(uint *)(local_b20.ray + 0x3dc) =
                                 (uint)bVar24 * iVar1 |
                                 (uint)!bVar24 * *(int *)(local_b20.ray + 0x3dc);
                            *(uint *)(local_b20.ray + 0x3e0) =
                                 (uint)(bVar79 & 1) * iVar67 |
                                 (uint)!(bool)(bVar79 & 1) * *(int *)(local_b20.ray + 0x3e0);
                            *(uint *)(local_b20.ray + 0x3e4) =
                                 (uint)bVar25 * iVar68 |
                                 (uint)!bVar25 * *(int *)(local_b20.ray + 0x3e4);
                            *(uint *)(local_b20.ray + 1000) =
                                 (uint)bVar26 * iVar69 |
                                 (uint)!bVar26 * *(int *)(local_b20.ray + 1000);
                            *(uint *)(local_b20.ray + 0x3ec) =
                                 (uint)bVar27 * iVar70 |
                                 (uint)!bVar27 * *(int *)(local_b20.ray + 0x3ec);
                            *(uint *)(local_b20.ray + 0x3f0) =
                                 (uint)bVar28 * iVar71 |
                                 (uint)!bVar28 * *(int *)(local_b20.ray + 0x3f0);
                            *(uint *)(local_b20.ray + 0x3f4) =
                                 (uint)bVar29 * iVar72 |
                                 (uint)!bVar29 * *(int *)(local_b20.ray + 0x3f4);
                            *(uint *)(local_b20.ray + 0x3f8) =
                                 (uint)bVar30 * iVar73 |
                                 (uint)!bVar30 * *(int *)(local_b20.ray + 0x3f8);
                            *(uint *)(local_b20.ray + 0x3fc) =
                                 (uint)bVar31 * iVar74 |
                                 (uint)!bVar31 * *(int *)(local_b20.ray + 0x3fc);
                            iVar3 = *(int *)(local_b20.hit + 0x104);
                            iVar4 = *(int *)(local_b20.hit + 0x108);
                            iVar5 = *(int *)(local_b20.hit + 0x10c);
                            iVar6 = *(int *)(local_b20.hit + 0x110);
                            iVar7 = *(int *)(local_b20.hit + 0x114);
                            iVar8 = *(int *)(local_b20.hit + 0x118);
                            iVar1 = *(int *)(local_b20.hit + 0x11c);
                            iVar67 = *(int *)(local_b20.hit + 0x120);
                            iVar68 = *(int *)(local_b20.hit + 0x124);
                            iVar69 = *(int *)(local_b20.hit + 0x128);
                            iVar70 = *(int *)(local_b20.hit + 300);
                            iVar71 = *(int *)(local_b20.hit + 0x130);
                            iVar72 = *(int *)(local_b20.hit + 0x134);
                            iVar73 = *(int *)(local_b20.hit + 0x138);
                            iVar74 = *(int *)(local_b20.hit + 0x13c);
                            bVar90 = (bool)((byte)(uVar91 >> 1) & 1);
                            bVar19 = (bool)((byte)(uVar91 >> 2) & 1);
                            bVar20 = (bool)((byte)(uVar91 >> 3) & 1);
                            bVar21 = (bool)((byte)(uVar91 >> 4) & 1);
                            bVar22 = (bool)((byte)(uVar91 >> 5) & 1);
                            bVar23 = (bool)((byte)(uVar91 >> 6) & 1);
                            bVar24 = (bool)((byte)(uVar91 >> 7) & 1);
                            bVar25 = (bool)((byte)(uVar91 >> 9) & 1);
                            bVar26 = (bool)((byte)(uVar91 >> 10) & 1);
                            bVar27 = (bool)((byte)(uVar91 >> 0xb) & 1);
                            bVar28 = (bool)((byte)(uVar91 >> 0xc) & 1);
                            bVar29 = (bool)((byte)(uVar91 >> 0xd) & 1);
                            bVar30 = (bool)((byte)(uVar91 >> 0xe) & 1);
                            bVar31 = SUB81(uVar91 >> 0xf,0);
                            *(uint *)(local_b20.ray + 0x400) =
                                 (uint)(bVar85 & 1) * *(int *)(local_b20.hit + 0x100) |
                                 (uint)!(bool)(bVar85 & 1) * *(int *)(local_b20.ray + 0x400);
                            *(uint *)(local_b20.ray + 0x404) =
                                 (uint)bVar90 * iVar3 |
                                 (uint)!bVar90 * *(int *)(local_b20.ray + 0x404);
                            *(uint *)(local_b20.ray + 0x408) =
                                 (uint)bVar19 * iVar4 |
                                 (uint)!bVar19 * *(int *)(local_b20.ray + 0x408);
                            *(uint *)(local_b20.ray + 0x40c) =
                                 (uint)bVar20 * iVar5 |
                                 (uint)!bVar20 * *(int *)(local_b20.ray + 0x40c);
                            *(uint *)(local_b20.ray + 0x410) =
                                 (uint)bVar21 * iVar6 |
                                 (uint)!bVar21 * *(int *)(local_b20.ray + 0x410);
                            *(uint *)(local_b20.ray + 0x414) =
                                 (uint)bVar22 * iVar7 |
                                 (uint)!bVar22 * *(int *)(local_b20.ray + 0x414);
                            *(uint *)(local_b20.ray + 0x418) =
                                 (uint)bVar23 * iVar8 |
                                 (uint)!bVar23 * *(int *)(local_b20.ray + 0x418);
                            *(uint *)(local_b20.ray + 0x41c) =
                                 (uint)bVar24 * iVar1 |
                                 (uint)!bVar24 * *(int *)(local_b20.ray + 0x41c);
                            *(uint *)(local_b20.ray + 0x420) =
                                 (uint)(bVar79 & 1) * iVar67 |
                                 (uint)!(bool)(bVar79 & 1) * *(int *)(local_b20.ray + 0x420);
                            *(uint *)(local_b20.ray + 0x424) =
                                 (uint)bVar25 * iVar68 |
                                 (uint)!bVar25 * *(int *)(local_b20.ray + 0x424);
                            *(uint *)(local_b20.ray + 0x428) =
                                 (uint)bVar26 * iVar69 |
                                 (uint)!bVar26 * *(int *)(local_b20.ray + 0x428);
                            *(uint *)(local_b20.ray + 0x42c) =
                                 (uint)bVar27 * iVar70 |
                                 (uint)!bVar27 * *(int *)(local_b20.ray + 0x42c);
                            *(uint *)(local_b20.ray + 0x430) =
                                 (uint)bVar28 * iVar71 |
                                 (uint)!bVar28 * *(int *)(local_b20.ray + 0x430);
                            *(uint *)(local_b20.ray + 0x434) =
                                 (uint)bVar29 * iVar72 |
                                 (uint)!bVar29 * *(int *)(local_b20.ray + 0x434);
                            *(uint *)(local_b20.ray + 0x438) =
                                 (uint)bVar30 * iVar73 |
                                 (uint)!bVar30 * *(int *)(local_b20.ray + 0x438);
                            *(uint *)(local_b20.ray + 0x43c) =
                                 (uint)bVar31 * iVar74 |
                                 (uint)!bVar31 * *(int *)(local_b20.ray + 0x43c);
                            auVar189 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b20.hit + 0x140));
                            auVar189 = vmovdqu32_avx512f(auVar189);
                            *(undefined1 (*) [64])(local_b20.ray + 0x440) = auVar189;
                            auVar189 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b20.hit + 0x180));
                            auVar189 = vmovdqu32_avx512f(auVar189);
                            *(undefined1 (*) [64])(local_b20.ray + 0x480) = auVar189;
                            auVar281 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b20.hit + 0x1c0));
                            auVar189 = vmovdqa32_avx512f(auVar281);
                            *(undefined1 (*) [64])(local_b20.ray + 0x4c0) = auVar189;
                            auVar189 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                          (local_b20.hit + 0x200));
                            bVar90 = (bool)((byte)(uVar91 >> 1) & 1);
                            auVar65._4_56_ = auVar189._8_56_;
                            auVar65._0_4_ =
                                 (uint)bVar90 * auVar189._4_4_ | (uint)!bVar90 * auVar281._4_4_;
                            auVar157._0_8_ = auVar65._0_8_ << 0x20;
                            bVar90 = (bool)((byte)(uVar91 >> 2) & 1);
                            auVar157._8_4_ =
                                 (uint)bVar90 * auVar189._8_4_ | (uint)!bVar90 * auVar281._8_4_;
                            bVar90 = (bool)((byte)(uVar91 >> 3) & 1);
                            auVar157._12_4_ =
                                 (uint)bVar90 * auVar189._12_4_ | (uint)!bVar90 * auVar281._12_4_;
                            bVar90 = (bool)((byte)(uVar91 >> 4) & 1);
                            auVar157._16_4_ =
                                 (uint)bVar90 * auVar189._16_4_ | (uint)!bVar90 * auVar281._16_4_;
                            bVar90 = (bool)((byte)(uVar91 >> 5) & 1);
                            auVar157._20_4_ =
                                 (uint)bVar90 * auVar189._20_4_ | (uint)!bVar90 * auVar281._20_4_;
                            bVar90 = (bool)((byte)(uVar91 >> 6) & 1);
                            auVar157._24_4_ =
                                 (uint)bVar90 * auVar189._24_4_ | (uint)!bVar90 * auVar281._24_4_;
                            bVar90 = (bool)((byte)(uVar91 >> 7) & 1);
                            auVar157._28_4_ =
                                 (uint)bVar90 * auVar189._28_4_ | (uint)!bVar90 * auVar281._28_4_;
                            auVar157._32_4_ =
                                 (uint)(bVar79 & 1) * auVar189._32_4_ |
                                 (uint)!(bool)(bVar79 & 1) * auVar281._32_4_;
                            bVar90 = (bool)((byte)(uVar91 >> 9) & 1);
                            auVar157._36_4_ =
                                 (uint)bVar90 * auVar189._36_4_ | (uint)!bVar90 * auVar281._36_4_;
                            bVar90 = (bool)((byte)(uVar91 >> 10) & 1);
                            auVar157._40_4_ =
                                 (uint)bVar90 * auVar189._40_4_ | (uint)!bVar90 * auVar281._40_4_;
                            bVar90 = (bool)((byte)(uVar91 >> 0xb) & 1);
                            auVar157._44_4_ =
                                 (uint)bVar90 * auVar189._44_4_ | (uint)!bVar90 * auVar281._44_4_;
                            bVar90 = (bool)((byte)(uVar91 >> 0xc) & 1);
                            auVar157._48_4_ =
                                 (uint)bVar90 * auVar189._48_4_ | (uint)!bVar90 * auVar281._48_4_;
                            bVar90 = (bool)((byte)(uVar91 >> 0xd) & 1);
                            auVar157._52_4_ =
                                 (uint)bVar90 * auVar189._52_4_ | (uint)!bVar90 * auVar281._52_4_;
                            bVar90 = (bool)((byte)(uVar91 >> 0xe) & 1);
                            auVar157._56_4_ =
                                 (uint)bVar90 * auVar189._56_4_ | (uint)!bVar90 * auVar281._56_4_;
                            bVar90 = SUB81(uVar91 >> 0xf,0);
                            auVar157._60_4_ =
                                 (uint)bVar90 * auVar189._60_4_ | (uint)!bVar90 * auVar281._60_4_;
                            auVar189 = vmovdqa32_avx512f(auVar189);
                            *(undefined1 (*) [64])(local_b20.ray + 0x500) = auVar189;
                            goto LAB_01c075f4;
                          }
                        }
                        auVar251 = ZEXT464((uint)fVar282);
                        *(float *)(ray + k * 4 + 0x200) = fVar282;
                      }
                    }
                  }
                }
              }
              bVar90 = lVar89 != 0;
              lVar89 = lVar89 + -1;
            } while ((!bVar18) && (bVar90));
            auVar76._4_4_ = fStack_85c;
            auVar76._0_4_ = local_860;
            auVar76._8_4_ = fStack_858;
            auVar76._12_4_ = fStack_854;
            auVar76._16_4_ = fStack_850;
            auVar76._20_4_ = fStack_84c;
            auVar76._24_4_ = fStack_848;
            auVar76._28_4_ = fStack_844;
            uVar283 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar55._4_4_ = uVar283;
            auVar55._0_4_ = uVar283;
            auVar55._8_4_ = uVar283;
            auVar55._12_4_ = uVar283;
            auVar55._16_4_ = uVar283;
            auVar55._20_4_ = uVar283;
            auVar55._24_4_ = uVar283;
            auVar55._28_4_ = uVar283;
            uVar34 = vcmpps_avx512vl(auVar76,auVar55,2);
            bVar86 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar86 & (byte)uVar34;
          } while (bVar86 != 0);
        }
        uVar35 = vpcmpd_avx512vl(local_7e0,_local_880,1);
        uVar36 = vpcmpd_avx512vl(local_7e0,local_760,1);
        auVar214._0_4_ = (float)local_a40._0_4_ + (float)local_500._0_4_;
        auVar214._4_4_ = (float)local_a40._4_4_ + (float)local_500._4_4_;
        auVar214._8_4_ = fStack_a38 + fStack_4f8;
        auVar214._12_4_ = fStack_a34 + fStack_4f4;
        auVar214._16_4_ = fStack_a30 + fStack_4f0;
        auVar214._20_4_ = fStack_a2c + fStack_4ec;
        auVar214._24_4_ = fStack_a28 + fStack_4e8;
        auVar214._28_4_ = fStack_a24 + fStack_4e4;
        uVar283 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar233._4_4_ = uVar283;
        auVar233._0_4_ = uVar283;
        auVar233._8_4_ = uVar283;
        auVar233._12_4_ = uVar283;
        auVar233._16_4_ = uVar283;
        auVar233._20_4_ = uVar283;
        auVar233._24_4_ = uVar283;
        auVar233._28_4_ = uVar283;
        uVar34 = vcmpps_avx512vl(auVar214,auVar233,2);
        bVar81 = bVar81 & (byte)uVar36 & (byte)uVar34;
        auVar240._0_4_ = (float)local_a40._0_4_ + local_7a0._0_4_;
        auVar240._4_4_ = (float)local_a40._4_4_ + local_7a0._4_4_;
        auVar240._8_4_ = fStack_a38 + local_7a0._8_4_;
        auVar240._12_4_ = fStack_a34 + local_7a0._12_4_;
        auVar240._16_4_ = fStack_a30 + local_7a0._16_4_;
        auVar240._20_4_ = fStack_a2c + local_7a0._20_4_;
        auVar240._24_4_ = fStack_a28 + local_7a0._24_4_;
        auVar240._28_4_ = fStack_a24 + local_7a0._28_4_;
        auVar241 = ZEXT3264(auVar240);
        uVar34 = vcmpps_avx512vl(auVar240,auVar233,2);
        bVar83 = bVar83 & (byte)uVar35 & (byte)uVar34 | bVar81;
        prim = local_ad0;
        if (bVar83 == 0) {
          auVar189 = ZEXT3264(CONCAT428(0x7fffffff,
                                        CONCAT424(0x7fffffff,
                                                  CONCAT420(0x7fffffff,
                                                            CONCAT416(0x7fffffff,
                                                                      CONCAT412(0x7fffffff,
                                                                                CONCAT48(0x7fffffff,
                                                                                                                                                                                  
                                                  0x7fffffff7fffffff)))))));
          auVar281 = ZEXT3264(_DAT_02020f20);
        }
        else {
          abStack_1a0[uVar80 * 0x60] = bVar83;
          auVar150._0_4_ =
               (uint)(bVar81 & 1) * local_500._0_4_ |
               (uint)!(bool)(bVar81 & 1) * (int)local_7a0._0_4_;
          bVar18 = (bool)(bVar81 >> 1 & 1);
          auVar150._4_4_ = (uint)bVar18 * local_500._4_4_ | (uint)!bVar18 * (int)local_7a0._4_4_;
          bVar18 = (bool)(bVar81 >> 2 & 1);
          auVar150._8_4_ = (uint)bVar18 * (int)fStack_4f8 | (uint)!bVar18 * (int)local_7a0._8_4_;
          bVar18 = (bool)(bVar81 >> 3 & 1);
          auVar150._12_4_ = (uint)bVar18 * (int)fStack_4f4 | (uint)!bVar18 * (int)local_7a0._12_4_;
          bVar18 = (bool)(bVar81 >> 4 & 1);
          auVar150._16_4_ = (uint)bVar18 * (int)fStack_4f0 | (uint)!bVar18 * (int)local_7a0._16_4_;
          bVar18 = (bool)(bVar81 >> 5 & 1);
          auVar150._20_4_ = (uint)bVar18 * (int)fStack_4ec | (uint)!bVar18 * (int)local_7a0._20_4_;
          auVar150._24_4_ =
               (uint)(bVar81 >> 6) * (int)fStack_4e8 |
               (uint)!(bool)(bVar81 >> 6) * (int)local_7a0._24_4_;
          auVar150._28_4_ = local_7a0._28_4_;
          auVar157._0_32_ = auVar150;
          *(undefined1 (*) [32])(auStack_180 + uVar80 * 0x60) = auVar150;
          uVar34 = vmovlps_avx(local_af0);
          *(undefined8 *)(afStack_160 + uVar80 * 0x18) = uVar34;
          auStack_158[uVar80 * 0x18] = (int)local_ac8 + 1;
          uVar80 = (ulong)((int)uVar80 + 1);
          auVar189 = ZEXT3264(CONCAT428(0x7fffffff,
                                        CONCAT424(0x7fffffff,
                                                  CONCAT420(0x7fffffff,
                                                            CONCAT416(0x7fffffff,
                                                                      CONCAT412(0x7fffffff,
                                                                                CONCAT48(0x7fffffff,
                                                                                                                                                                                  
                                                  0x7fffffff7fffffff)))))));
          auVar281 = ZEXT3264(_DAT_02020f20);
        }
      }
    }
    auVar234 = ZEXT1664(local_af0);
    do {
      if ((int)uVar80 == 0) {
        uVar283 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar47._4_4_ = uVar283;
        auVar47._0_4_ = uVar283;
        auVar47._8_4_ = uVar283;
        auVar47._12_4_ = uVar283;
        uVar34 = vcmpps_avx512vl(local_7f0,auVar47,2);
        uVar82 = (uint)uVar34 & (uint)local_9a8 - 1 & (uint)local_9a8;
        local_9a8 = (ulong)uVar82;
        if (uVar82 == 0) {
          return;
        }
        goto LAB_01c05058;
      }
      uVar91 = (ulong)((int)uVar80 - 1);
      lVar89 = uVar91 * 0x60;
      auVar120 = *(undefined1 (*) [32])(auStack_180 + lVar89);
      auVar211._0_4_ = (float)local_a40._0_4_ + auVar120._0_4_;
      auVar211._4_4_ = (float)local_a40._4_4_ + auVar120._4_4_;
      auVar211._8_4_ = fStack_a38 + auVar120._8_4_;
      auVar211._12_4_ = fStack_a34 + auVar120._12_4_;
      auVar211._16_4_ = fStack_a30 + auVar120._16_4_;
      auVar211._20_4_ = fStack_a2c + auVar120._20_4_;
      auVar211._24_4_ = fStack_a28 + auVar120._24_4_;
      auVar211._28_4_ = fStack_a24 + auVar120._28_4_;
      uVar283 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar56._4_4_ = uVar283;
      auVar56._0_4_ = uVar283;
      auVar56._8_4_ = uVar283;
      auVar56._12_4_ = uVar283;
      auVar56._16_4_ = uVar283;
      auVar56._20_4_ = uVar283;
      auVar56._24_4_ = uVar283;
      auVar56._28_4_ = uVar283;
      uVar34 = vcmpps_avx512vl(auVar211,auVar56,2);
      uVar84 = (uint)uVar34 & (uint)abStack_1a0[lVar89];
      bVar83 = (byte)uVar84;
      if (uVar84 != 0) {
        auVar212._8_4_ = 0x7f800000;
        auVar212._0_8_ = 0x7f8000007f800000;
        auVar212._12_4_ = 0x7f800000;
        auVar212._16_4_ = 0x7f800000;
        auVar212._20_4_ = 0x7f800000;
        auVar212._24_4_ = 0x7f800000;
        auVar212._28_4_ = 0x7f800000;
        auVar109 = vblendmps_avx512vl(auVar212,auVar120);
        auVar147._0_4_ =
             (uint)(bVar83 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar83 & 1) * (int)auVar120._0_4_;
        bVar18 = (bool)((byte)(uVar84 >> 1) & 1);
        auVar147._4_4_ = (uint)bVar18 * auVar109._4_4_ | (uint)!bVar18 * (int)auVar120._4_4_;
        bVar18 = (bool)((byte)(uVar84 >> 2) & 1);
        auVar147._8_4_ = (uint)bVar18 * auVar109._8_4_ | (uint)!bVar18 * (int)auVar120._8_4_;
        bVar18 = (bool)((byte)(uVar84 >> 3) & 1);
        auVar147._12_4_ = (uint)bVar18 * auVar109._12_4_ | (uint)!bVar18 * (int)auVar120._12_4_;
        bVar18 = (bool)((byte)(uVar84 >> 4) & 1);
        auVar147._16_4_ = (uint)bVar18 * auVar109._16_4_ | (uint)!bVar18 * (int)auVar120._16_4_;
        bVar18 = (bool)((byte)(uVar84 >> 5) & 1);
        auVar147._20_4_ = (uint)bVar18 * auVar109._20_4_ | (uint)!bVar18 * (int)auVar120._20_4_;
        bVar18 = (bool)((byte)(uVar84 >> 6) & 1);
        auVar147._24_4_ = (uint)bVar18 * auVar109._24_4_ | (uint)!bVar18 * (int)auVar120._24_4_;
        auVar147._28_4_ =
             (uVar84 >> 7) * auVar109._28_4_ | (uint)!SUB41(uVar84 >> 7,0) * (int)auVar120._28_4_;
        auVar157._0_32_ = auVar147;
        auVar120 = vshufps_avx(auVar147,auVar147,0xb1);
        auVar120 = vminps_avx(auVar147,auVar120);
        auVar109 = vshufpd_avx(auVar120,auVar120,5);
        auVar120 = vminps_avx(auVar120,auVar109);
        auVar109 = vpermpd_avx2(auVar120,0x4e);
        auVar120 = vminps_avx(auVar120,auVar109);
        uVar34 = vcmpps_avx512vl(auVar147,auVar120,0);
        bVar86 = (byte)uVar34 & bVar83;
        if (bVar86 != 0) {
          uVar84 = (uint)bVar86;
        }
        fVar259 = afStack_160[uVar91 * 0x18 + 1];
        uVar158 = 0;
        for (; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
          uVar158 = uVar158 + 1;
        }
        local_ac8 = (ulong)auStack_158[uVar91 * 0x18];
        bVar86 = ~('\x01' << ((byte)uVar158 & 0x1f)) & bVar83;
        abStack_1a0[lVar89] = bVar86;
        uVar88 = uVar91;
        if (bVar86 != 0) {
          uVar88 = uVar80;
        }
        fVar267 = afStack_160[uVar91 * 0x18];
        auVar213._4_4_ = fVar267;
        auVar213._0_4_ = fVar267;
        auVar213._8_4_ = fVar267;
        auVar213._12_4_ = fVar267;
        auVar213._16_4_ = fVar267;
        auVar213._20_4_ = fVar267;
        auVar213._24_4_ = fVar267;
        auVar213._28_4_ = fVar267;
        fVar259 = fVar259 - fVar267;
        auVar183._4_4_ = fVar259;
        auVar183._0_4_ = fVar259;
        auVar183._8_4_ = fVar259;
        auVar183._12_4_ = fVar259;
        auVar183._16_4_ = fVar259;
        auVar183._20_4_ = fVar259;
        auVar183._24_4_ = fVar259;
        auVar183._28_4_ = fVar259;
        auVar99 = vfmadd132ps_fma(auVar183,auVar213,auVar281._0_32_);
        auVar120 = ZEXT1632(auVar99);
        local_400[0] = (RTCHitN)auVar120[0];
        local_400[1] = (RTCHitN)auVar120[1];
        local_400[2] = (RTCHitN)auVar120[2];
        local_400[3] = (RTCHitN)auVar120[3];
        local_400[4] = (RTCHitN)auVar120[4];
        local_400[5] = (RTCHitN)auVar120[5];
        local_400[6] = (RTCHitN)auVar120[6];
        local_400[7] = (RTCHitN)auVar120[7];
        local_400[8] = (RTCHitN)auVar120[8];
        local_400[9] = (RTCHitN)auVar120[9];
        local_400[10] = (RTCHitN)auVar120[10];
        local_400[0xb] = (RTCHitN)auVar120[0xb];
        local_400[0xc] = (RTCHitN)auVar120[0xc];
        local_400[0xd] = (RTCHitN)auVar120[0xd];
        local_400[0xe] = (RTCHitN)auVar120[0xe];
        local_400[0xf] = (RTCHitN)auVar120[0xf];
        local_400[0x10] = (RTCHitN)auVar120[0x10];
        local_400[0x11] = (RTCHitN)auVar120[0x11];
        local_400[0x12] = (RTCHitN)auVar120[0x12];
        local_400[0x13] = (RTCHitN)auVar120[0x13];
        local_400[0x14] = (RTCHitN)auVar120[0x14];
        local_400[0x15] = (RTCHitN)auVar120[0x15];
        local_400[0x16] = (RTCHitN)auVar120[0x16];
        local_400[0x17] = (RTCHitN)auVar120[0x17];
        local_400[0x18] = (RTCHitN)auVar120[0x18];
        local_400[0x19] = (RTCHitN)auVar120[0x19];
        local_400[0x1a] = (RTCHitN)auVar120[0x1a];
        local_400[0x1b] = (RTCHitN)auVar120[0x1b];
        local_400[0x1c] = (RTCHitN)auVar120[0x1c];
        local_400[0x1d] = (RTCHitN)auVar120[0x1d];
        local_400[0x1e] = (RTCHitN)auVar120[0x1e];
        local_400[0x1f] = (RTCHitN)auVar120[0x1f];
        auVar234 = ZEXT864(*(ulong *)(local_400 + (ulong)uVar158 * 4));
        uVar91 = uVar88;
      }
      uVar80 = uVar91;
    } while (bVar83 == 0);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }